

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Primitive PVar27;
  Geometry *pGVar28;
  __int_type_conflict _Var29;
  long lVar30;
  RTCFilterFunctionN p_Var31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  bool bVar84;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  bool bVar97;
  undefined1 auVar98 [12];
  bool bVar99;
  bool bVar100;
  bool bVar101;
  bool bVar102;
  bool bVar103;
  bool bVar104;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  uint uVar116;
  uint uVar117;
  uint uVar118;
  ulong uVar119;
  ulong uVar120;
  long lVar121;
  uint uVar122;
  long lVar123;
  long lVar124;
  ulong uVar125;
  byte unaff_R13B;
  float fVar126;
  float fVar154;
  float fVar155;
  __m128 a;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar127;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar156;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar157;
  float fVar193;
  float fVar194;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar158;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar197;
  float fVar199;
  float fVar200;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar195;
  float fVar196;
  undefined1 auVar179 [32];
  float fVar198;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar167 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar175 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar209 [16];
  float fVar201;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar226;
  float fVar228;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar227;
  float fVar229;
  float fVar233;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar208 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar214 [16];
  undefined1 auVar225 [32];
  float fVar234;
  float fVar251;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [28];
  float fVar249;
  float fVar250;
  float fVar252;
  float fVar253;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar254;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar255;
  float fVar270;
  float fVar272;
  float fVar274;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar271;
  float fVar273;
  float fVar278;
  undefined1 auVar265 [28];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar268 [32];
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar269 [64];
  float fVar279;
  float fVar280;
  float fVar292;
  float fVar294;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar298;
  float fVar300;
  float fVar302;
  undefined1 auVar284 [32];
  float fVar296;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar293;
  float fVar295;
  float fVar297;
  float fVar299;
  float fVar301;
  float fVar303;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  float fVar304;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar309 [16];
  float fVar316;
  float fVar317;
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar308 [16];
  float fVar318;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar323 [16];
  float fVar322;
  float fVar335;
  float fVar336;
  float fVar340;
  float fVar342;
  float fVar344;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  float fVar338;
  float fVar346;
  undefined1 auVar329 [32];
  float fVar337;
  float fVar339;
  float fVar341;
  float fVar343;
  float fVar345;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar352 [32];
  undefined1 auVar351 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [64];
  undefined1 auVar355 [64];
  float s;
  float fVar356;
  float fVar357;
  float fVar363;
  float fVar365;
  float fVar367;
  float fVar369;
  float fVar371;
  float fVar373;
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  float fVar364;
  float fVar366;
  float fVar368;
  float fVar370;
  float fVar372;
  float fVar374;
  float fVar375;
  float fVar376;
  undefined1 auVar362 [32];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  float fVar386;
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [64];
  float t;
  float fVar387;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar401;
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  float fVar402;
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [64];
  undefined1 auVar405 [16];
  float fVar403;
  float fVar404;
  float fVar411;
  float fVar413;
  float fVar419;
  float fVar421;
  float fVar423;
  float in_register_0000151c;
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  float fVar412;
  float fVar414;
  float fVar415;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar420;
  float fVar422;
  float fVar424;
  undefined1 auVar410 [32];
  float fVar425;
  undefined1 auVar428 [16];
  float fVar426;
  float fVar435;
  float fVar438;
  float fVar443;
  float fVar445;
  float fVar447;
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  float fVar436;
  float fVar439;
  float fVar440;
  float fVar441;
  float fVar442;
  float fVar444;
  float fVar446;
  float fVar448;
  undefined1 auVar431 [32];
  float fVar427;
  float fVar437;
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar451 [16];
  float fVar449;
  float fVar450;
  float fVar456;
  float fVar458;
  float fVar462;
  float fVar464;
  float fVar466;
  float in_register_0000159c;
  undefined1 auVar452 [32];
  float fVar457;
  float fVar459;
  float fVar460;
  float fVar461;
  float fVar463;
  float fVar465;
  float fVar467;
  float fVar468;
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  float fVar469;
  float fVar471;
  float fVar472;
  float fVar473;
  float fVar474;
  float fVar475;
  float fVar476;
  float in_register_000015dc;
  undefined1 auVar470 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_bd1;
  float local_bc0;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined8 local_b00;
  undefined8 uStack_af8;
  float local_ae8;
  float local_ae4;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a30 [8];
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  undefined1 local_a10 [8];
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 auStack_9d0 [16];
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 *local_960;
  ulong local_958;
  RTCFilterFunctionNArguments local_950;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [16];
  undefined1 local_870 [8];
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  Primitive *local_810;
  ulong local_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  RTCHitN local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  uint local_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  uint uStack_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  ulong local_5e0;
  undefined1 auStack_5d8 [24];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 auStack_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0 [4];
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar27 = prim[1];
  uVar125 = (ulong)(byte)PVar27;
  lVar121 = uVar125 * 0x25;
  fVar234 = *(float *)(prim + lVar121 + 0x12);
  auVar305 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar305 = vinsertps_avx(auVar305,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar305 = vsubps_avx(auVar305,*(undefined1 (*) [16])(prim + lVar121 + 6));
  auVar159._0_4_ = fVar234 * auVar305._0_4_;
  auVar159._4_4_ = fVar234 * auVar305._4_4_;
  auVar159._8_4_ = fVar234 * auVar305._8_4_;
  auVar159._12_4_ = fVar234 * auVar305._12_4_;
  auVar281._0_4_ = fVar234 * auVar38._0_4_;
  auVar281._4_4_ = fVar234 * auVar38._4_4_;
  auVar281._8_4_ = fVar234 * auVar38._8_4_;
  auVar281._12_4_ = fVar234 * auVar38._12_4_;
  auVar305 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 4 + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 4 + 10)));
  auVar149._16_16_ = auVar38;
  auVar149._0_16_ = auVar305;
  lVar30 = uVar125 * 5;
  auVar305 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar30 + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar30 + 10)));
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar215._16_16_ = auVar38;
  auVar215._0_16_ = auVar305;
  auVar32 = vcvtdq2ps_avx(auVar215);
  auVar305 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 6 + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 6 + 10)));
  auVar242._16_16_ = auVar38;
  auVar242._0_16_ = auVar305;
  auVar305 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0xf + 6)));
  auVar33 = vcvtdq2ps_avx(auVar242);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0xf + 10)));
  auVar243._16_16_ = auVar38;
  auVar243._0_16_ = auVar305;
  lVar123 = (ulong)(byte)PVar27 * 0x10;
  auVar305 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + 6)));
  auVar315 = vcvtdq2ps_avx(auVar243);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + 10)));
  auVar310._16_16_ = auVar38;
  auVar310._0_16_ = auVar305;
  auVar34 = vcvtdq2ps_avx(auVar310);
  auVar305 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + uVar125 + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + uVar125 + 10)));
  auVar324._16_16_ = auVar38;
  auVar324._0_16_ = auVar305;
  auVar434 = vcvtdq2ps_avx(auVar324);
  auVar305 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1a + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1a + 10)));
  auVar347._16_16_ = auVar38;
  auVar347._0_16_ = auVar305;
  auVar305 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1b + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1b + 10)));
  auVar35 = vcvtdq2ps_avx(auVar347);
  auVar358._16_16_ = auVar38;
  auVar358._0_16_ = auVar305;
  auVar36 = vcvtdq2ps_avx(auVar358);
  auVar305 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1c + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1c + 10)));
  auVar379._16_16_ = auVar38;
  auVar379._0_16_ = auVar305;
  auVar37 = vcvtdq2ps_avx(auVar379);
  auVar305 = vshufps_avx(auVar281,auVar281,0);
  auVar38 = vshufps_avx(auVar281,auVar281,0x55);
  auVar172 = vshufps_avx(auVar281,auVar281,0xaa);
  fVar234 = auVar172._0_4_;
  fVar158 = auVar172._4_4_;
  fVar249 = auVar172._8_4_;
  fVar195 = auVar172._12_4_;
  fVar250 = auVar38._0_4_;
  fVar197 = auVar38._4_4_;
  fVar251 = auVar38._8_4_;
  fVar227 = auVar38._12_4_;
  fVar252 = auVar305._0_4_;
  fVar253 = auVar305._4_4_;
  fVar254 = auVar305._8_4_;
  fVar255 = auVar305._12_4_;
  auVar406._0_4_ = fVar252 * auVar149._0_4_ + fVar250 * auVar32._0_4_ + fVar234 * auVar33._0_4_;
  auVar406._4_4_ = fVar253 * auVar149._4_4_ + fVar197 * auVar32._4_4_ + fVar158 * auVar33._4_4_;
  auVar406._8_4_ = fVar254 * auVar149._8_4_ + fVar251 * auVar32._8_4_ + fVar249 * auVar33._8_4_;
  auVar406._12_4_ = fVar255 * auVar149._12_4_ + fVar227 * auVar32._12_4_ + fVar195 * auVar33._12_4_;
  auVar406._16_4_ = fVar252 * auVar149._16_4_ + fVar250 * auVar32._16_4_ + fVar234 * auVar33._16_4_;
  auVar406._20_4_ = fVar253 * auVar149._20_4_ + fVar197 * auVar32._20_4_ + fVar158 * auVar33._20_4_;
  auVar406._24_4_ = fVar254 * auVar149._24_4_ + fVar251 * auVar32._24_4_ + fVar249 * auVar33._24_4_;
  auVar406._28_4_ = fVar227 + in_register_000015dc + in_register_0000151c;
  auVar388._0_4_ = fVar252 * auVar315._0_4_ + fVar250 * auVar34._0_4_ + fVar234 * auVar434._0_4_;
  auVar388._4_4_ = fVar253 * auVar315._4_4_ + fVar197 * auVar34._4_4_ + fVar158 * auVar434._4_4_;
  auVar388._8_4_ = fVar254 * auVar315._8_4_ + fVar251 * auVar34._8_4_ + fVar249 * auVar434._8_4_;
  auVar388._12_4_ = fVar255 * auVar315._12_4_ + fVar227 * auVar34._12_4_ + fVar195 * auVar434._12_4_
  ;
  auVar388._16_4_ = fVar252 * auVar315._16_4_ + fVar250 * auVar34._16_4_ + fVar234 * auVar434._16_4_
  ;
  auVar388._20_4_ = fVar253 * auVar315._20_4_ + fVar197 * auVar34._20_4_ + fVar158 * auVar434._20_4_
  ;
  auVar388._24_4_ = fVar254 * auVar315._24_4_ + fVar251 * auVar34._24_4_ + fVar249 * auVar434._24_4_
  ;
  auVar388._28_4_ = fVar227 + in_register_000015dc + in_register_0000159c;
  auVar284._0_4_ = fVar252 * auVar35._0_4_ + fVar250 * auVar36._0_4_ + auVar37._0_4_ * fVar234;
  auVar284._4_4_ = fVar253 * auVar35._4_4_ + fVar197 * auVar36._4_4_ + auVar37._4_4_ * fVar158;
  auVar284._8_4_ = fVar254 * auVar35._8_4_ + fVar251 * auVar36._8_4_ + auVar37._8_4_ * fVar249;
  auVar284._12_4_ = fVar255 * auVar35._12_4_ + fVar227 * auVar36._12_4_ + auVar37._12_4_ * fVar195;
  auVar284._16_4_ = fVar252 * auVar35._16_4_ + fVar250 * auVar36._16_4_ + auVar37._16_4_ * fVar234;
  auVar284._20_4_ = fVar253 * auVar35._20_4_ + fVar197 * auVar36._20_4_ + auVar37._20_4_ * fVar158;
  auVar284._24_4_ = fVar254 * auVar35._24_4_ + fVar251 * auVar36._24_4_ + auVar37._24_4_ * fVar249;
  auVar284._28_4_ = fVar255 + fVar227 + fVar195;
  auVar305 = vshufps_avx(auVar159,auVar159,0);
  auVar38 = vshufps_avx(auVar159,auVar159,0x55);
  auVar172 = vshufps_avx(auVar159,auVar159,0xaa);
  fVar158 = auVar172._0_4_;
  fVar249 = auVar172._4_4_;
  fVar195 = auVar172._8_4_;
  fVar250 = auVar172._12_4_;
  fVar253 = auVar38._0_4_;
  fVar254 = auVar38._4_4_;
  fVar255 = auVar38._8_4_;
  fVar270 = auVar38._12_4_;
  fVar197 = auVar305._0_4_;
  fVar251 = auVar305._4_4_;
  fVar227 = auVar305._8_4_;
  fVar252 = auVar305._12_4_;
  fVar234 = auVar149._28_4_;
  auVar216._0_4_ = fVar197 * auVar149._0_4_ + fVar253 * auVar32._0_4_ + fVar158 * auVar33._0_4_;
  auVar216._4_4_ = fVar251 * auVar149._4_4_ + fVar254 * auVar32._4_4_ + fVar249 * auVar33._4_4_;
  auVar216._8_4_ = fVar227 * auVar149._8_4_ + fVar255 * auVar32._8_4_ + fVar195 * auVar33._8_4_;
  auVar216._12_4_ = fVar252 * auVar149._12_4_ + fVar270 * auVar32._12_4_ + fVar250 * auVar33._12_4_;
  auVar216._16_4_ = fVar197 * auVar149._16_4_ + fVar253 * auVar32._16_4_ + fVar158 * auVar33._16_4_;
  auVar216._20_4_ = fVar251 * auVar149._20_4_ + fVar254 * auVar32._20_4_ + fVar249 * auVar33._20_4_;
  auVar216._24_4_ = fVar227 * auVar149._24_4_ + fVar255 * auVar32._24_4_ + fVar195 * auVar33._24_4_;
  auVar216._28_4_ = fVar234 + auVar32._28_4_ + auVar33._28_4_;
  auVar176._0_4_ = fVar197 * auVar315._0_4_ + fVar253 * auVar34._0_4_ + fVar158 * auVar434._0_4_;
  auVar176._4_4_ = fVar251 * auVar315._4_4_ + fVar254 * auVar34._4_4_ + fVar249 * auVar434._4_4_;
  auVar176._8_4_ = fVar227 * auVar315._8_4_ + fVar255 * auVar34._8_4_ + fVar195 * auVar434._8_4_;
  auVar176._12_4_ = fVar252 * auVar315._12_4_ + fVar270 * auVar34._12_4_ + fVar250 * auVar434._12_4_
  ;
  auVar176._16_4_ = fVar197 * auVar315._16_4_ + fVar253 * auVar34._16_4_ + fVar158 * auVar434._16_4_
  ;
  auVar176._20_4_ = fVar251 * auVar315._20_4_ + fVar254 * auVar34._20_4_ + fVar249 * auVar434._20_4_
  ;
  auVar176._24_4_ = fVar227 * auVar315._24_4_ + fVar255 * auVar34._24_4_ + fVar195 * auVar434._24_4_
  ;
  auVar176._28_4_ = fVar234 + auVar33._28_4_ + auVar434._28_4_;
  auVar139._0_4_ = fVar197 * auVar35._0_4_ + fVar253 * auVar36._0_4_ + auVar37._0_4_ * fVar158;
  auVar139._4_4_ = fVar251 * auVar35._4_4_ + fVar254 * auVar36._4_4_ + auVar37._4_4_ * fVar249;
  auVar139._8_4_ = fVar227 * auVar35._8_4_ + fVar255 * auVar36._8_4_ + auVar37._8_4_ * fVar195;
  auVar139._12_4_ = fVar252 * auVar35._12_4_ + fVar270 * auVar36._12_4_ + auVar37._12_4_ * fVar250;
  auVar139._16_4_ = fVar197 * auVar35._16_4_ + fVar253 * auVar36._16_4_ + auVar37._16_4_ * fVar158;
  auVar139._20_4_ = fVar251 * auVar35._20_4_ + fVar254 * auVar36._20_4_ + auVar37._20_4_ * fVar249;
  auVar139._24_4_ = fVar227 * auVar35._24_4_ + fVar255 * auVar36._24_4_ + auVar37._24_4_ * fVar195;
  auVar139._28_4_ = fVar234 + auVar34._28_4_ + fVar250;
  auVar311._8_4_ = 0x7fffffff;
  auVar311._0_8_ = 0x7fffffff7fffffff;
  auVar311._12_4_ = 0x7fffffff;
  auVar311._16_4_ = 0x7fffffff;
  auVar311._20_4_ = 0x7fffffff;
  auVar311._24_4_ = 0x7fffffff;
  auVar311._28_4_ = 0x7fffffff;
  auVar325._8_4_ = 0x219392ef;
  auVar325._0_8_ = 0x219392ef219392ef;
  auVar325._12_4_ = 0x219392ef;
  auVar325._16_4_ = 0x219392ef;
  auVar325._20_4_ = 0x219392ef;
  auVar325._24_4_ = 0x219392ef;
  auVar325._28_4_ = 0x219392ef;
  auVar149 = vandps_avx(auVar406,auVar311);
  auVar149 = vcmpps_avx(auVar149,auVar325,1);
  auVar32 = vblendvps_avx(auVar406,auVar325,auVar149);
  auVar149 = vandps_avx(auVar388,auVar311);
  auVar149 = vcmpps_avx(auVar149,auVar325,1);
  auVar33 = vblendvps_avx(auVar388,auVar325,auVar149);
  auVar149 = vandps_avx(auVar284,auVar311);
  auVar149 = vcmpps_avx(auVar149,auVar325,1);
  auVar149 = vblendvps_avx(auVar284,auVar325,auVar149);
  auVar315 = vrcpps_avx(auVar32);
  fVar234 = auVar315._0_4_;
  fVar249 = auVar315._4_4_;
  auVar34._4_4_ = auVar32._4_4_ * fVar249;
  auVar34._0_4_ = auVar32._0_4_ * fVar234;
  fVar250 = auVar315._8_4_;
  auVar34._8_4_ = auVar32._8_4_ * fVar250;
  fVar251 = auVar315._12_4_;
  auVar34._12_4_ = auVar32._12_4_ * fVar251;
  fVar252 = auVar315._16_4_;
  auVar34._16_4_ = auVar32._16_4_ * fVar252;
  fVar253 = auVar315._20_4_;
  auVar34._20_4_ = auVar32._20_4_ * fVar253;
  fVar254 = auVar315._24_4_;
  auVar34._24_4_ = auVar32._24_4_ * fVar254;
  auVar34._28_4_ = auVar32._28_4_;
  auVar326._8_4_ = 0x3f800000;
  auVar326._0_8_ = &DAT_3f8000003f800000;
  auVar326._12_4_ = 0x3f800000;
  auVar326._16_4_ = 0x3f800000;
  auVar326._20_4_ = 0x3f800000;
  auVar326._24_4_ = 0x3f800000;
  auVar326._28_4_ = 0x3f800000;
  auVar434 = vsubps_avx(auVar326,auVar34);
  fVar234 = fVar234 + fVar234 * auVar434._0_4_;
  fVar249 = fVar249 + fVar249 * auVar434._4_4_;
  fVar250 = fVar250 + fVar250 * auVar434._8_4_;
  fVar251 = fVar251 + fVar251 * auVar434._12_4_;
  fVar252 = fVar252 + fVar252 * auVar434._16_4_;
  fVar253 = fVar253 + fVar253 * auVar434._20_4_;
  fVar254 = fVar254 + fVar254 * auVar434._24_4_;
  auVar34 = vrcpps_avx(auVar33);
  fVar255 = auVar34._0_4_;
  fVar270 = auVar34._4_4_;
  auVar32._4_4_ = fVar270 * auVar33._4_4_;
  auVar32._0_4_ = fVar255 * auVar33._0_4_;
  fVar272 = auVar34._8_4_;
  auVar32._8_4_ = fVar272 * auVar33._8_4_;
  fVar274 = auVar34._12_4_;
  auVar32._12_4_ = fVar274 * auVar33._12_4_;
  fVar275 = auVar34._16_4_;
  auVar32._16_4_ = fVar275 * auVar33._16_4_;
  fVar276 = auVar34._20_4_;
  auVar32._20_4_ = fVar276 * auVar33._20_4_;
  fVar277 = auVar34._24_4_;
  auVar32._24_4_ = fVar277 * auVar33._24_4_;
  auVar32._28_4_ = auVar33._28_4_;
  auVar33 = vsubps_avx(auVar326,auVar32);
  fVar255 = fVar255 + fVar255 * auVar33._0_4_;
  fVar270 = fVar270 + fVar270 * auVar33._4_4_;
  fVar272 = fVar272 + fVar272 * auVar33._8_4_;
  fVar274 = fVar274 + fVar274 * auVar33._12_4_;
  fVar275 = fVar275 + fVar275 * auVar33._16_4_;
  fVar276 = fVar276 + fVar276 * auVar33._20_4_;
  fVar277 = fVar277 + fVar277 * auVar33._24_4_;
  auVar32 = vrcpps_avx(auVar149);
  fVar279 = auVar32._0_4_;
  fVar292 = auVar32._4_4_;
  auVar35._4_4_ = fVar292 * auVar149._4_4_;
  auVar35._0_4_ = fVar279 * auVar149._0_4_;
  fVar294 = auVar32._8_4_;
  auVar35._8_4_ = fVar294 * auVar149._8_4_;
  fVar296 = auVar32._12_4_;
  auVar35._12_4_ = fVar296 * auVar149._12_4_;
  fVar298 = auVar32._16_4_;
  auVar35._16_4_ = fVar298 * auVar149._16_4_;
  fVar300 = auVar32._20_4_;
  auVar35._20_4_ = fVar300 * auVar149._20_4_;
  fVar302 = auVar32._24_4_;
  auVar35._24_4_ = fVar302 * auVar149._24_4_;
  auVar35._28_4_ = auVar149._28_4_;
  auVar149 = vsubps_avx(auVar326,auVar35);
  fVar279 = fVar279 + fVar279 * auVar149._0_4_;
  fVar292 = fVar292 + fVar292 * auVar149._4_4_;
  fVar294 = fVar294 + fVar294 * auVar149._8_4_;
  fVar296 = fVar296 + fVar296 * auVar149._12_4_;
  fVar298 = fVar298 + fVar298 * auVar149._16_4_;
  fVar300 = fVar300 + fVar300 * auVar149._20_4_;
  fVar302 = fVar302 + fVar302 * auVar149._24_4_;
  auVar305 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar121 + 0x16)) *
                           *(float *)(prim + lVar121 + 0x1a)));
  auVar209 = vshufps_avx(auVar305,auVar305,0);
  auVar305._8_8_ = 0;
  auVar305._0_8_ = *(ulong *)(prim + uVar125 * 7 + 6);
  auVar305 = vpmovsxwd_avx(auVar305);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar125 * 7 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar38);
  auVar327._16_16_ = auVar38;
  auVar327._0_16_ = auVar305;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = *(ulong *)(prim + uVar125 * 0xb + 6);
  auVar305 = vpmovsxwd_avx(auVar172);
  auVar149 = vcvtdq2ps_avx(auVar327);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + uVar125 * 0xb + 0xe);
  auVar38 = vpmovsxwd_avx(auVar135);
  auVar348._16_16_ = auVar38;
  auVar348._0_16_ = auVar305;
  auVar32 = vcvtdq2ps_avx(auVar348);
  auVar32 = vsubps_avx(auVar32,auVar149);
  fVar158 = auVar209._0_4_;
  fVar195 = auVar209._4_4_;
  fVar197 = auVar209._8_4_;
  fVar227 = auVar209._12_4_;
  auVar328._0_4_ = auVar32._0_4_ * fVar158 + auVar149._0_4_;
  auVar328._4_4_ = auVar32._4_4_ * fVar195 + auVar149._4_4_;
  auVar328._8_4_ = auVar32._8_4_ * fVar197 + auVar149._8_4_;
  auVar328._12_4_ = auVar32._12_4_ * fVar227 + auVar149._12_4_;
  auVar328._16_4_ = auVar32._16_4_ * fVar158 + auVar149._16_4_;
  auVar328._20_4_ = auVar32._20_4_ * fVar195 + auVar149._20_4_;
  auVar328._24_4_ = auVar32._24_4_ * fVar197 + auVar149._24_4_;
  auVar328._28_4_ = auVar32._28_4_ + auVar149._28_4_;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar125 * 9 + 6);
  auVar305 = vpmovsxwd_avx(auVar209);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar125 * 9 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar168);
  auVar349._16_16_ = auVar38;
  auVar349._0_16_ = auVar305;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *(ulong *)(prim + uVar125 * 0xd + 6);
  auVar305 = vpmovsxwd_avx(auVar171);
  auVar149 = vcvtdq2ps_avx(auVar349);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar125 * 0xd + 0xe);
  auVar38 = vpmovsxwd_avx(auVar10);
  auVar359._16_16_ = auVar38;
  auVar359._0_16_ = auVar305;
  auVar32 = vcvtdq2ps_avx(auVar359);
  auVar32 = vsubps_avx(auVar32,auVar149);
  auVar350._0_4_ = auVar149._0_4_ + auVar32._0_4_ * fVar158;
  auVar350._4_4_ = auVar149._4_4_ + auVar32._4_4_ * fVar195;
  auVar350._8_4_ = auVar149._8_4_ + auVar32._8_4_ * fVar197;
  auVar350._12_4_ = auVar149._12_4_ + auVar32._12_4_ * fVar227;
  auVar350._16_4_ = auVar149._16_4_ + auVar32._16_4_ * fVar158;
  auVar350._20_4_ = auVar149._20_4_ + auVar32._20_4_ * fVar195;
  auVar350._24_4_ = auVar149._24_4_ + auVar32._24_4_ * fVar197;
  auVar350._28_4_ = auVar149._28_4_ + auVar32._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar125 * 0x12 + 6);
  auVar305 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar125 * 0x12 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar12);
  auVar360._16_16_ = auVar38;
  auVar360._0_16_ = auVar305;
  uVar120 = (ulong)(uint)((int)lVar30 << 2);
  lVar121 = uVar125 * 2 + uVar120;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar121 + 6);
  auVar305 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar121 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar14);
  auVar149 = vcvtdq2ps_avx(auVar360);
  auVar380._16_16_ = auVar38;
  auVar380._0_16_ = auVar305;
  auVar32 = vcvtdq2ps_avx(auVar380);
  auVar32 = vsubps_avx(auVar32,auVar149);
  auVar361._0_4_ = auVar149._0_4_ + auVar32._0_4_ * fVar158;
  auVar361._4_4_ = auVar149._4_4_ + auVar32._4_4_ * fVar195;
  auVar361._8_4_ = auVar149._8_4_ + auVar32._8_4_ * fVar197;
  auVar361._12_4_ = auVar149._12_4_ + auVar32._12_4_ * fVar227;
  auVar361._16_4_ = auVar149._16_4_ + auVar32._16_4_ * fVar158;
  auVar361._20_4_ = auVar149._20_4_ + auVar32._20_4_ * fVar195;
  auVar361._24_4_ = auVar149._24_4_ + auVar32._24_4_ * fVar197;
  auVar361._28_4_ = auVar149._28_4_ + auVar32._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar120 + 6);
  auVar305 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar120 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar16);
  auVar381._16_16_ = auVar38;
  auVar381._0_16_ = auVar305;
  auVar149 = vcvtdq2ps_avx(auVar381);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar125 * 0x18 + 6);
  auVar305 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar125 * 0x18 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar18);
  auVar389._16_16_ = auVar38;
  auVar389._0_16_ = auVar305;
  auVar32 = vcvtdq2ps_avx(auVar389);
  auVar32 = vsubps_avx(auVar32,auVar149);
  auVar382._0_4_ = auVar149._0_4_ + auVar32._0_4_ * fVar158;
  auVar382._4_4_ = auVar149._4_4_ + auVar32._4_4_ * fVar195;
  auVar382._8_4_ = auVar149._8_4_ + auVar32._8_4_ * fVar197;
  auVar382._12_4_ = auVar149._12_4_ + auVar32._12_4_ * fVar227;
  auVar382._16_4_ = auVar149._16_4_ + auVar32._16_4_ * fVar158;
  auVar382._20_4_ = auVar149._20_4_ + auVar32._20_4_ * fVar195;
  auVar382._24_4_ = auVar149._24_4_ + auVar32._24_4_ * fVar197;
  auVar382._28_4_ = auVar149._28_4_ + auVar32._28_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar125 * 0x1d + 6);
  auVar305 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar125 * 0x1d + 0xe);
  auVar38 = vpmovsxwd_avx(auVar20);
  auVar390._16_16_ = auVar38;
  auVar390._0_16_ = auVar305;
  lVar121 = uVar125 + (ulong)(byte)PVar27 * 0x20;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + lVar121 + 6);
  auVar305 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + lVar121 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar22);
  auVar407._16_16_ = auVar38;
  auVar407._0_16_ = auVar305;
  auVar149 = vcvtdq2ps_avx(auVar390);
  auVar32 = vcvtdq2ps_avx(auVar407);
  auVar32 = vsubps_avx(auVar32,auVar149);
  auVar391._0_4_ = auVar149._0_4_ + auVar32._0_4_ * fVar158;
  auVar391._4_4_ = auVar149._4_4_ + auVar32._4_4_ * fVar195;
  auVar391._8_4_ = auVar149._8_4_ + auVar32._8_4_ * fVar197;
  auVar391._12_4_ = auVar149._12_4_ + auVar32._12_4_ * fVar227;
  auVar391._16_4_ = auVar149._16_4_ + auVar32._16_4_ * fVar158;
  auVar391._20_4_ = auVar149._20_4_ + auVar32._20_4_ * fVar195;
  auVar391._24_4_ = auVar149._24_4_ + auVar32._24_4_ * fVar197;
  auVar391._28_4_ = auVar149._28_4_ + auVar32._28_4_;
  lVar121 = (ulong)(byte)PVar27 * 0x20 - uVar125;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + lVar121 + 6);
  auVar305 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + lVar121 + 0xe);
  auVar38 = vpmovsxwd_avx(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar125 * 0x23 + 6);
  auVar172 = vpmovsxwd_avx(auVar25);
  auVar408._16_16_ = auVar38;
  auVar408._0_16_ = auVar305;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar125 * 0x23 + 0xe);
  auVar305 = vpmovsxwd_avx(auVar26);
  auVar429._16_16_ = auVar305;
  auVar429._0_16_ = auVar172;
  auVar149 = vcvtdq2ps_avx(auVar408);
  auVar32 = vcvtdq2ps_avx(auVar429);
  auVar32 = vsubps_avx(auVar32,auVar149);
  auVar409._0_4_ = auVar149._0_4_ + auVar32._0_4_ * fVar158;
  auVar409._4_4_ = auVar149._4_4_ + auVar32._4_4_ * fVar195;
  auVar409._8_4_ = auVar149._8_4_ + auVar32._8_4_ * fVar197;
  auVar409._12_4_ = auVar149._12_4_ + auVar32._12_4_ * fVar227;
  auVar409._16_4_ = auVar149._16_4_ + auVar32._16_4_ * fVar158;
  auVar409._20_4_ = auVar149._20_4_ + auVar32._20_4_ * fVar195;
  auVar409._24_4_ = auVar149._24_4_ + auVar32._24_4_ * fVar197;
  auVar409._28_4_ = auVar149._28_4_ + fVar227;
  auVar149 = vsubps_avx(auVar328,auVar216);
  auVar306._0_4_ = fVar234 * auVar149._0_4_;
  auVar306._4_4_ = fVar249 * auVar149._4_4_;
  auVar306._8_4_ = fVar250 * auVar149._8_4_;
  auVar306._12_4_ = fVar251 * auVar149._12_4_;
  auVar36._16_4_ = fVar252 * auVar149._16_4_;
  auVar36._0_16_ = auVar306;
  auVar36._20_4_ = fVar253 * auVar149._20_4_;
  auVar36._24_4_ = fVar254 * auVar149._24_4_;
  auVar36._28_4_ = auVar149._28_4_;
  auVar149 = vsubps_avx(auVar350,auVar216);
  auVar235._0_4_ = fVar234 * auVar149._0_4_;
  auVar235._4_4_ = fVar249 * auVar149._4_4_;
  auVar235._8_4_ = fVar250 * auVar149._8_4_;
  auVar235._12_4_ = fVar251 * auVar149._12_4_;
  auVar37._16_4_ = fVar252 * auVar149._16_4_;
  auVar37._0_16_ = auVar235;
  auVar37._20_4_ = fVar253 * auVar149._20_4_;
  auVar37._24_4_ = fVar254 * auVar149._24_4_;
  auVar37._28_4_ = auVar315._28_4_ + auVar434._28_4_;
  auVar149 = vsubps_avx(auVar361,auVar176);
  auVar202._0_4_ = fVar255 * auVar149._0_4_;
  auVar202._4_4_ = fVar270 * auVar149._4_4_;
  auVar202._8_4_ = fVar272 * auVar149._8_4_;
  auVar202._12_4_ = fVar274 * auVar149._12_4_;
  auVar315._16_4_ = fVar275 * auVar149._16_4_;
  auVar315._0_16_ = auVar202;
  auVar315._20_4_ = fVar276 * auVar149._20_4_;
  auVar315._24_4_ = fVar277 * auVar149._24_4_;
  auVar315._28_4_ = auVar149._28_4_;
  auVar149 = vsubps_avx(auVar382,auVar176);
  auVar256._0_4_ = fVar255 * auVar149._0_4_;
  auVar256._4_4_ = fVar270 * auVar149._4_4_;
  auVar256._8_4_ = fVar272 * auVar149._8_4_;
  auVar256._12_4_ = fVar274 * auVar149._12_4_;
  auVar434._16_4_ = fVar275 * auVar149._16_4_;
  auVar434._0_16_ = auVar256;
  auVar434._20_4_ = fVar276 * auVar149._20_4_;
  auVar434._24_4_ = fVar277 * auVar149._24_4_;
  auVar434._28_4_ = auVar34._28_4_ + auVar33._28_4_;
  auVar149 = vsubps_avx(auVar391,auVar139);
  auVar160._0_4_ = fVar279 * auVar149._0_4_;
  auVar160._4_4_ = fVar292 * auVar149._4_4_;
  auVar160._8_4_ = fVar294 * auVar149._8_4_;
  auVar160._12_4_ = fVar296 * auVar149._12_4_;
  auVar33._16_4_ = fVar298 * auVar149._16_4_;
  auVar33._0_16_ = auVar160;
  auVar33._20_4_ = fVar300 * auVar149._20_4_;
  auVar33._24_4_ = fVar302 * auVar149._24_4_;
  auVar33._28_4_ = auVar149._28_4_;
  auVar149 = vsubps_avx(auVar409,auVar139);
  auVar128._0_4_ = fVar279 * auVar149._0_4_;
  auVar128._4_4_ = fVar292 * auVar149._4_4_;
  auVar128._8_4_ = fVar294 * auVar149._8_4_;
  auVar128._12_4_ = fVar296 * auVar149._12_4_;
  auVar40._16_4_ = fVar298 * auVar149._16_4_;
  auVar40._0_16_ = auVar128;
  auVar40._20_4_ = fVar300 * auVar149._20_4_;
  auVar40._24_4_ = fVar302 * auVar149._24_4_;
  auVar40._28_4_ = auVar149._28_4_;
  auVar305 = vpminsd_avx(auVar36._16_16_,auVar37._16_16_);
  auVar38 = vpminsd_avx(auVar306,auVar235);
  auVar351._16_16_ = auVar305;
  auVar351._0_16_ = auVar38;
  auVar305 = vpminsd_avx(auVar315._16_16_,auVar434._16_16_);
  auVar38 = vpminsd_avx(auVar202,auVar256);
  auVar392._16_16_ = auVar305;
  auVar392._0_16_ = auVar38;
  auVar149 = vmaxps_avx(auVar351,auVar392);
  auVar305 = vpminsd_avx(auVar33._16_16_,auVar40._16_16_);
  auVar38 = vpminsd_avx(auVar160,auVar128);
  auVar430._16_16_ = auVar305;
  auVar430._0_16_ = auVar38;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar452._4_4_ = uVar8;
  auVar452._0_4_ = uVar8;
  auVar452._8_4_ = uVar8;
  auVar452._12_4_ = uVar8;
  auVar452._16_4_ = uVar8;
  auVar452._20_4_ = uVar8;
  auVar452._24_4_ = uVar8;
  auVar452._28_4_ = uVar8;
  auVar32 = vmaxps_avx(auVar430,auVar452);
  auVar149 = vmaxps_avx(auVar149,auVar32);
  local_280._4_4_ = auVar149._4_4_ * 0.99999964;
  local_280._0_4_ = auVar149._0_4_ * 0.99999964;
  local_280._8_4_ = auVar149._8_4_ * 0.99999964;
  local_280._12_4_ = auVar149._12_4_ * 0.99999964;
  local_280._16_4_ = auVar149._16_4_ * 0.99999964;
  local_280._20_4_ = auVar149._20_4_ * 0.99999964;
  local_280._24_4_ = auVar149._24_4_ * 0.99999964;
  local_280._28_4_ = auVar149._28_4_;
  auVar305 = vpmaxsd_avx(auVar36._16_16_,auVar37._16_16_);
  auVar38 = vpmaxsd_avx(auVar306,auVar235);
  auVar244._16_16_ = auVar305;
  auVar244._0_16_ = auVar38;
  auVar305 = vpmaxsd_avx(auVar315._16_16_,auVar434._16_16_);
  auVar38 = vpmaxsd_avx(auVar202,auVar256);
  auVar217._16_16_ = auVar305;
  auVar217._0_16_ = auVar38;
  auVar149 = vminps_avx(auVar244,auVar217);
  auVar305 = vpmaxsd_avx(auVar33._16_16_,auVar40._16_16_);
  auVar38 = vpmaxsd_avx(auVar160,auVar128);
  auVar140._16_16_ = auVar305;
  auVar140._0_16_ = auVar38;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar177._4_4_ = uVar8;
  auVar177._0_4_ = uVar8;
  auVar177._8_4_ = uVar8;
  auVar177._12_4_ = uVar8;
  auVar177._16_4_ = uVar8;
  auVar177._20_4_ = uVar8;
  auVar177._24_4_ = uVar8;
  auVar177._28_4_ = uVar8;
  auVar32 = vminps_avx(auVar140,auVar177);
  auVar149 = vminps_avx(auVar149,auVar32);
  auVar39._4_4_ = auVar149._4_4_ * 1.0000004;
  auVar39._0_4_ = auVar149._0_4_ * 1.0000004;
  auVar39._8_4_ = auVar149._8_4_ * 1.0000004;
  auVar39._12_4_ = auVar149._12_4_ * 1.0000004;
  auVar39._16_4_ = auVar149._16_4_ * 1.0000004;
  auVar39._20_4_ = auVar149._20_4_ * 1.0000004;
  auVar39._24_4_ = auVar149._24_4_ * 1.0000004;
  auVar39._28_4_ = auVar149._28_4_;
  auVar149 = vcmpps_avx(local_280,auVar39,2);
  auVar305 = vpshufd_avx(ZEXT116((byte)PVar27),0);
  auVar178._16_16_ = auVar305;
  auVar178._0_16_ = auVar305;
  auVar32 = vcvtdq2ps_avx(auVar178);
  auVar32 = vcmpps_avx(_DAT_02020f40,auVar32,1);
  auVar149 = vandps_avx(auVar149,auVar32);
  uVar116 = vmovmskps_avx(auVar149);
  local_bd1 = uVar116 != 0;
  if (uVar116 == 0) {
    return local_bd1;
  }
  uVar116 = uVar116 & 0xff;
  auVar141._16_16_ = mm_lookupmask_ps._240_16_;
  auVar141._0_16_ = mm_lookupmask_ps._240_16_;
  local_460 = vblendps_avx(auVar141,ZEXT832(0) << 0x20,0x80);
  local_960 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_810 = prim;
LAB_012806e7:
  local_808 = (ulong)uVar116;
  lVar121 = 0;
  if (local_808 != 0) {
    for (; (uVar116 >> lVar121 & 1) == 0; lVar121 = lVar121 + 1) {
    }
  }
  local_958 = (ulong)*(uint *)(local_810 + 2);
  pGVar28 = (context->scene->geometries).items[local_958].ptr;
  uVar125 = (ulong)*(uint *)(*(long *)&pGVar28->field_0x58 +
                            (ulong)*(uint *)(local_810 + lVar121 * 4 + 6) *
                            pGVar28[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar234 = (pGVar28->time_range).lower;
  fVar234 = pGVar28->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar234) / ((pGVar28->time_range).upper - fVar234));
  auVar305 = vroundss_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar234),9);
  auVar305 = vminss_avx(auVar305,ZEXT416((uint)(pGVar28->fnumTimeSegments + -1.0)));
  auVar305 = vmaxss_avx(ZEXT816(0) << 0x20,auVar305);
  fVar234 = fVar234 - auVar305._0_4_;
  _Var29 = pGVar28[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar124 = (long)(int)auVar305._0_4_ * 0x38;
  lVar30 = *(long *)(_Var29 + lVar124);
  lVar123 = *(long *)(_Var29 + 0x10 + lVar124);
  auVar305 = vshufps_avx(ZEXT416((uint)(1.0 - fVar234)),ZEXT416((uint)(1.0 - fVar234)),0);
  pfVar1 = (float *)(lVar30 + lVar123 * uVar125);
  fVar250 = auVar305._0_4_;
  fVar197 = auVar305._4_4_;
  fVar251 = auVar305._8_4_;
  fVar227 = auVar305._12_4_;
  pfVar2 = (float *)(lVar30 + lVar123 * (uVar125 + 1));
  pfVar3 = (float *)(lVar30 + lVar123 * (uVar125 + 2));
  pfVar4 = (float *)(lVar30 + lVar123 * (uVar125 + 3));
  lVar30 = *(long *)(_Var29 + 0x38 + lVar124);
  lVar123 = *(long *)(_Var29 + 0x48 + lVar124);
  auVar305 = vshufps_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar234),0);
  pfVar5 = (float *)(lVar30 + uVar125 * lVar123);
  fVar252 = auVar305._0_4_;
  fVar253 = auVar305._4_4_;
  fVar254 = auVar305._8_4_;
  fVar255 = auVar305._12_4_;
  pfVar6 = (float *)(lVar30 + (uVar125 + 1) * lVar123);
  pfVar7 = (float *)(lVar30 + (uVar125 + 2) * lVar123);
  auVar236._0_4_ = fVar252 * *pfVar5 + fVar250 * *pfVar1;
  auVar236._4_4_ = fVar253 * pfVar5[1] + fVar197 * pfVar1[1];
  auVar236._8_4_ = fVar254 * pfVar5[2] + fVar251 * pfVar1[2];
  auVar236._12_4_ = fVar255 * pfVar5[3] + fVar227 * pfVar1[3];
  auVar305 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar38 = vinsertps_avx(auVar305,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar234 = *(float *)(ray + k * 4 + 0x40);
  auVar405._4_4_ = fVar234;
  auVar405._0_4_ = fVar234;
  auVar405._8_4_ = fVar234;
  auVar405._12_4_ = fVar234;
  fStack_9f0 = fVar234;
  _local_a00 = auVar405;
  fStack_9ec = fVar234;
  fStack_9e8 = fVar234;
  fStack_9e4 = fVar234;
  fVar158 = *(float *)(ray + k * 4 + 0x50);
  auVar428._4_4_ = fVar158;
  auVar428._0_4_ = fVar158;
  auVar428._8_4_ = fVar158;
  auVar428._12_4_ = fVar158;
  fStack_8b0 = fVar158;
  _local_8c0 = auVar428;
  fStack_8ac = fVar158;
  fStack_8a8 = fVar158;
  fStack_8a4 = fVar158;
  auVar203._0_4_ = fVar250 * *pfVar2 + fVar252 * *pfVar6;
  auVar203._4_4_ = fVar197 * pfVar2[1] + fVar253 * pfVar6[1];
  auVar203._8_4_ = fVar251 * pfVar2[2] + fVar254 * pfVar6[2];
  auVar203._12_4_ = fVar227 * pfVar2[3] + fVar255 * pfVar6[3];
  auVar305 = vunpcklps_avx(auVar405,auVar428);
  fVar249 = *(float *)(ray + k * 4 + 0x60);
  auVar451._4_4_ = fVar249;
  auVar451._0_4_ = fVar249;
  auVar451._8_4_ = fVar249;
  auVar451._12_4_ = fVar249;
  fStack_910 = fVar249;
  _local_920 = auVar451;
  fStack_90c = fVar249;
  fStack_908 = fVar249;
  fStack_904 = fVar249;
  _local_870 = vinsertps_avx(auVar305,auVar451,0x28);
  auVar129._0_4_ = (auVar236._0_4_ + auVar203._0_4_) * 0.5;
  auVar129._4_4_ = (auVar236._4_4_ + auVar203._4_4_) * 0.5;
  auVar129._8_4_ = (auVar236._8_4_ + auVar203._8_4_) * 0.5;
  auVar129._12_4_ = (auVar236._12_4_ + auVar203._12_4_) * 0.5;
  auVar305 = vsubps_avx(auVar129,auVar38);
  auVar305 = vdpps_avx(auVar305,_local_870,0x7f);
  local_880 = vdpps_avx(_local_870,_local_870,0x7f);
  auVar395 = ZEXT1664(local_880);
  auVar161._0_4_ = fVar250 * *pfVar3 + fVar252 * *pfVar7;
  auVar161._4_4_ = fVar197 * pfVar3[1] + fVar253 * pfVar7[1];
  auVar161._8_4_ = fVar251 * pfVar3[2] + fVar254 * pfVar7[2];
  auVar161._12_4_ = fVar227 * pfVar3[3] + fVar255 * pfVar7[3];
  auVar172 = vrcpss_avx(local_880,local_880);
  fVar195 = auVar305._0_4_ * auVar172._0_4_ * (2.0 - local_880._0_4_ * auVar172._0_4_);
  auVar172 = vshufps_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar195),0);
  auVar307._0_4_ = auVar38._0_4_ + local_870._0_4_ * auVar172._0_4_;
  auVar307._4_4_ = auVar38._4_4_ + local_870._4_4_ * auVar172._4_4_;
  auVar307._8_4_ = auVar38._8_4_ + local_870._8_4_ * auVar172._8_4_;
  auVar307._12_4_ = auVar38._12_4_ + local_870._12_4_ * auVar172._12_4_;
  auVar305 = vblendps_avx(auVar307,_DAT_01feba10,8);
  _local_a10 = vsubps_avx(auVar236,auVar305);
  _local_a20 = vsubps_avx(auVar161,auVar305);
  auVar354 = ZEXT1664(_local_a20);
  pfVar1 = (float *)(lVar30 + lVar123 * (uVar125 + 3));
  auVar162._0_4_ = fVar250 * *pfVar4 + fVar252 * *pfVar1;
  auVar162._4_4_ = fVar197 * pfVar4[1] + fVar253 * pfVar1[1];
  auVar162._8_4_ = fVar251 * pfVar4[2] + fVar254 * pfVar1[2];
  auVar162._12_4_ = fVar227 * pfVar4[3] + fVar255 * pfVar1[3];
  _local_a30 = vsubps_avx(auVar203,auVar305);
  _local_a40 = vsubps_avx(auVar162,auVar305);
  auVar305 = vshufps_avx(_local_a10,_local_a10,0);
  register0x00001250 = auVar305;
  _local_340 = auVar305;
  auVar305 = vshufps_avx(_local_a10,_local_a10,0x55);
  register0x00001250 = auVar305;
  _local_1a0 = auVar305;
  auVar305 = vshufps_avx(_local_a10,_local_a10,0xaa);
  register0x00001250 = auVar305;
  _local_1c0 = auVar305;
  auVar305 = vshufps_avx(_local_a10,_local_a10,0xff);
  register0x00001290 = auVar305;
  _local_1e0 = auVar305;
  auVar305 = vshufps_avx(_local_a30,_local_a30,0);
  register0x00001290 = auVar305;
  _local_360 = auVar305;
  auVar305 = vshufps_avx(_local_a30,_local_a30,0x55);
  register0x00001290 = auVar305;
  _local_380 = auVar305;
  auVar305 = vshufps_avx(_local_a30,_local_a30,0xaa);
  register0x00001290 = auVar305;
  _local_3a0 = auVar305;
  auVar305 = vshufps_avx(_local_a30,_local_a30,0xff);
  register0x00001290 = auVar305;
  _local_3c0 = auVar305;
  auVar305 = vshufps_avx(_local_a20,_local_a20,0);
  auVar38 = vshufps_avx(_local_a20,_local_a20,0x55);
  register0x00001290 = auVar38;
  _local_3e0 = auVar38;
  auVar38 = vshufps_avx(_local_a20,_local_a20,0xaa);
  register0x00001290 = auVar38;
  _local_400 = auVar38;
  auVar38 = vshufps_avx(_local_a20,_local_a20,0xff);
  register0x00001290 = auVar38;
  _local_420 = auVar38;
  auVar38 = vshufps_avx(_local_a40,_local_a40,0);
  local_7a0._16_16_ = auVar38;
  local_7a0._0_16_ = auVar38;
  auVar385 = ZEXT3264(local_7a0);
  auVar38 = vshufps_avx(_local_a40,_local_a40,0x55);
  auVar135 = vshufps_avx(_local_a40,_local_a40,0xaa);
  register0x00001290 = auVar135;
  _local_440 = auVar135;
  auVar135 = vshufps_avx(_local_a40,_local_a40,0xff);
  register0x00001290 = auVar135;
  _local_200 = auVar135;
  auVar135 = ZEXT416((uint)(fVar234 * fVar234 + fVar158 * fVar158 + fVar249 * fVar249));
  auVar135 = vshufps_avx(auVar135,auVar135,0);
  local_220._16_16_ = auVar135;
  local_220._0_16_ = auVar135;
  fVar234 = *(float *)(ray + k * 4 + 0x30);
  local_830 = ZEXT416((uint)fVar195);
  auVar135 = vshufps_avx(ZEXT416((uint)(fVar234 - fVar195)),ZEXT416((uint)(fVar234 - fVar195)),0);
  local_260._16_16_ = auVar135;
  local_260._0_16_ = auVar135;
  local_710 = vpshufd_avx(ZEXT416(*(uint *)(local_810 + 2)),0);
  local_720 = vpshufd_avx(ZEXT416(*(uint *)(local_810 + lVar121 * 4 + 6)),0);
  register0x00001210 = auVar172;
  _local_8a0 = auVar172;
  uVar116 = 0;
  uVar120 = 0;
  uVar125 = 1;
  auVar142._8_4_ = 0x7fffffff;
  auVar142._0_8_ = 0x7fffffff7fffffff;
  auVar142._12_4_ = 0x7fffffff;
  auVar142._16_4_ = 0x7fffffff;
  auVar142._20_4_ = 0x7fffffff;
  auVar142._24_4_ = 0x7fffffff;
  auVar142._28_4_ = 0x7fffffff;
  local_480 = vandps_avx(local_220,auVar142);
  auVar172 = vsqrtss_avx(local_880,local_880);
  local_ae4 = auVar172._0_4_;
  auVar172 = vsqrtss_avx(local_880,local_880);
  local_ae8 = auVar172._0_4_;
  local_820 = ZEXT816(0x3f80000000000000);
  auVar269 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar172 = vmovshdup_avx(local_820);
    fVar252 = auVar172._0_4_ - local_820._0_4_;
    auVar172 = vshufps_avx(local_820,local_820,0);
    local_900._16_16_ = auVar172;
    local_900._0_16_ = auVar172;
    auVar135 = vshufps_avx(ZEXT416((uint)fVar252),ZEXT416((uint)fVar252),0);
    local_860._16_16_ = auVar135;
    local_860._0_16_ = auVar135;
    fVar157 = auVar135._0_4_;
    fVar193 = auVar135._4_4_;
    fVar194 = auVar135._8_4_;
    fVar196 = auVar135._12_4_;
    fVar126 = auVar172._0_4_;
    auVar245._0_4_ = fVar126 + fVar157 * 0.0;
    fVar154 = auVar172._4_4_;
    auVar245._4_4_ = fVar154 + fVar193 * 0.14285715;
    fVar155 = auVar172._8_4_;
    auVar245._8_4_ = fVar155 + fVar194 * 0.2857143;
    fStack_b64 = auVar172._12_4_;
    auVar245._12_4_ = fStack_b64 + fVar196 * 0.42857146;
    auVar245._16_4_ = fVar126 + fVar157 * 0.5714286;
    auVar245._20_4_ = fVar154 + fVar193 * 0.71428573;
    auVar245._24_4_ = fVar155 + fVar194 * 0.8571429;
    auVar245._28_4_ = fStack_b64 + fVar196;
    auVar149 = vsubps_avx(auVar269._0_32_,auVar245);
    local_b80._4_4_ = auVar245._4_4_ * auVar245._4_4_;
    local_b80._0_4_ = auVar245._0_4_ * auVar245._0_4_;
    fStack_b78 = auVar245._8_4_ * auVar245._8_4_;
    fStack_b74 = auVar245._12_4_ * auVar245._12_4_;
    fStack_b70 = auVar245._16_4_ * auVar245._16_4_;
    fStack_b6c = auVar245._20_4_ * auVar245._20_4_;
    fStack_b68 = auVar245._24_4_ * auVar245._24_4_;
    fVar254 = auVar245._0_4_ * 3.0;
    fVar255 = auVar245._4_4_ * 3.0;
    fVar270 = auVar245._8_4_ * 3.0;
    fVar272 = auVar245._12_4_ * 3.0;
    fVar274 = auVar245._16_4_ * 3.0;
    fVar275 = auVar245._20_4_ * 3.0;
    fVar276 = auVar245._24_4_ * 3.0;
    fVar302 = auVar269._28_4_ + -5.0;
    fVar158 = auVar149._0_4_;
    auVar355._0_4_ = fVar158 * fVar158;
    fVar249 = auVar149._4_4_;
    auVar355._4_4_ = fVar249 * fVar249;
    fVar195 = auVar149._8_4_;
    auVar355._8_4_ = fVar195 * fVar195;
    fVar250 = auVar149._12_4_;
    auVar355._12_4_ = fVar250 * fVar250;
    fVar197 = auVar149._16_4_;
    auVar355._16_4_ = fVar197 * fVar197;
    fVar251 = auVar149._20_4_;
    auVar355._20_4_ = fVar251 * fVar251;
    fVar227 = auVar149._24_4_;
    auVar355._28_36_ = auVar354._28_36_;
    auVar355._24_4_ = fVar227 * fVar227;
    fVar253 = auVar149._28_4_;
    fVar277 = (auVar355._0_4_ * (fVar158 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar279 = (auVar355._4_4_ * (fVar249 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar292 = (auVar355._8_4_ * (fVar195 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar294 = (auVar355._12_4_ * (fVar250 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar296 = (auVar355._16_4_ * (fVar197 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar298 = (auVar355._20_4_ * (fVar251 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar300 = (auVar355._24_4_ * (fVar227 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar356 = -fVar158 * auVar245._0_4_ * auVar245._0_4_ * 0.5;
    fVar363 = -fVar249 * auVar245._4_4_ * auVar245._4_4_ * 0.5;
    fVar365 = -fVar195 * auVar245._8_4_ * auVar245._8_4_ * 0.5;
    fVar367 = -fVar250 * auVar245._12_4_ * auVar245._12_4_ * 0.5;
    fVar369 = -fVar197 * auVar245._16_4_ * auVar245._16_4_ * 0.5;
    fVar371 = -fVar251 * auVar245._20_4_ * auVar245._20_4_ * 0.5;
    fVar373 = -fVar227 * auVar245._24_4_ * auVar245._24_4_ * 0.5;
    fVar271 = auVar38._0_4_;
    fVar273 = auVar38._4_4_;
    fVar413 = auVar38._8_4_;
    fVar416 = auVar38._12_4_;
    fVar127 = auVar305._0_4_;
    fVar278 = auVar305._4_4_;
    fVar156 = auVar305._8_4_;
    fVar440 = auVar305._12_4_;
    fVar386 = auVar385._28_4_ + fVar440;
    fVar402 = auVar395._28_4_ + fVar440;
    fVar425 = (auVar245._0_4_ * auVar245._0_4_ * (fVar254 + -5.0) + 2.0) * 0.5;
    fVar435 = (auVar245._4_4_ * auVar245._4_4_ * (fVar255 + -5.0) + 2.0) * 0.5;
    fVar438 = (auVar245._8_4_ * auVar245._8_4_ * (fVar270 + -5.0) + 2.0) * 0.5;
    fVar441 = (auVar245._12_4_ * auVar245._12_4_ * (fVar272 + -5.0) + 2.0) * 0.5;
    fVar443 = (auVar245._16_4_ * auVar245._16_4_ * (fVar274 + -5.0) + 2.0) * 0.5;
    fVar445 = (auVar245._20_4_ * auVar245._20_4_ * (fVar275 + -5.0) + 2.0) * 0.5;
    fVar447 = (auVar245._24_4_ * auVar245._24_4_ * (fVar276 + -5.0) + 2.0) * 0.5;
    fVar403 = -auVar245._0_4_ * fVar158 * fVar158 * 0.5;
    fVar411 = -auVar245._4_4_ * fVar249 * fVar249 * 0.5;
    fVar414 = -auVar245._8_4_ * fVar195 * fVar195 * 0.5;
    fVar417 = -auVar245._12_4_ * fVar250 * fVar250 * 0.5;
    fVar419 = -auVar245._16_4_ * fVar197 * fVar197 * 0.5;
    fVar421 = -auVar245._20_4_ * fVar251 * fVar251 * 0.5;
    fVar423 = -auVar245._24_4_ * fVar227 * fVar227 * 0.5;
    local_9c0 = fVar403 * (float)local_340._0_4_ +
                fVar425 * (float)local_360._0_4_ + auVar385._0_4_ * fVar356 + fVar127 * fVar277;
    fStack_9bc = fVar411 * (float)local_340._4_4_ +
                 fVar435 * (float)local_360._4_4_ + auVar385._4_4_ * fVar363 + fVar278 * fVar279;
    fStack_9b8 = fVar414 * fStack_338 +
                 fVar438 * fStack_358 + auVar385._8_4_ * fVar365 + fVar156 * fVar292;
    fStack_9b4 = fVar417 * fStack_334 +
                 fVar441 * fStack_354 + auVar385._12_4_ * fVar367 + fVar440 * fVar294;
    fStack_9b0 = fVar419 * fStack_330 +
                 fVar443 * fStack_350 + auVar385._16_4_ * fVar369 + fVar127 * fVar296;
    fStack_9ac = fVar421 * fStack_32c +
                 fVar445 * fStack_34c + auVar385._20_4_ * fVar371 + fVar278 * fVar298;
    fStack_9a8 = fVar423 * fStack_328 +
                 fVar447 * fStack_348 + auVar385._24_4_ * fVar373 + fVar156 * fVar300;
    fStack_9a4 = fVar440 + 2.0 + -fVar253 + fVar386;
    fVar357 = (float)local_1a0._0_4_ * fVar403 +
              fVar425 * (float)local_380._0_4_ +
              fVar271 * fVar356 + fVar277 * (float)local_3e0._0_4_;
    fVar364 = (float)local_1a0._4_4_ * fVar411 +
              fVar435 * (float)local_380._4_4_ +
              fVar273 * fVar363 + fVar279 * (float)local_3e0._4_4_;
    fVar366 = fStack_198 * fVar414 + fVar438 * fStack_378 + fVar413 * fVar365 + fVar292 * fStack_3d8
    ;
    fVar368 = fStack_194 * fVar417 + fVar441 * fStack_374 + fVar416 * fVar367 + fVar294 * fStack_3d4
    ;
    fVar370 = fStack_190 * fVar419 + fVar443 * fStack_370 + fVar271 * fVar369 + fVar296 * fStack_3d0
    ;
    fVar372 = fStack_18c * fVar421 + fVar445 * fStack_36c + fVar273 * fVar371 + fVar298 * fStack_3cc
    ;
    fVar374 = fStack_188 * fVar423 + fVar447 * fStack_368 + fVar413 * fVar373 + fVar300 * fStack_3c8
    ;
    fVar376 = fStack_9a4 + fVar386 + fVar402;
    fVar201 = (float)local_1c0._0_4_ * fVar403 +
              fVar425 * (float)local_3a0._0_4_ +
              fVar356 * (float)local_440._0_4_ + fVar277 * (float)local_400._0_4_;
    fVar226 = (float)local_1c0._4_4_ * fVar411 +
              fVar435 * (float)local_3a0._4_4_ +
              fVar363 * (float)local_440._4_4_ + fVar279 * (float)local_400._4_4_;
    fVar228 = fStack_1b8 * fVar414 +
              fVar438 * fStack_398 + fVar365 * fStack_438 + fVar292 * fStack_3f8;
    fVar229 = fStack_1b4 * fVar417 +
              fVar441 * fStack_394 + fVar367 * fStack_434 + fVar294 * fStack_3f4;
    fVar230 = fStack_1b0 * fVar419 +
              fVar443 * fStack_390 + fVar369 * fStack_430 + fVar296 * fStack_3f0;
    fVar231 = fStack_1ac * fVar421 +
              fVar445 * fStack_38c + fVar371 * fStack_42c + fVar298 * fStack_3ec;
    fVar232 = fStack_1a8 * fVar423 +
              fVar447 * fStack_388 + fVar373 * fStack_428 + fVar300 * fStack_3e8;
    fVar233 = fVar376 + fVar402 + fVar416 + fVar440;
    local_760._0_4_ =
         (float)local_1e0._0_4_ * fVar403 +
         fVar425 * (float)local_3c0._0_4_ +
         fVar356 * (float)local_200._0_4_ + fVar277 * (float)local_420._0_4_;
    local_760._4_4_ =
         (float)local_1e0._4_4_ * fVar411 +
         fVar435 * (float)local_3c0._4_4_ +
         fVar363 * (float)local_200._4_4_ + fVar279 * (float)local_420._4_4_;
    local_760._8_4_ =
         fStack_1d8 * fVar414 + fVar438 * fStack_3b8 + fVar365 * fStack_1f8 + fVar292 * fStack_418;
    local_760._12_4_ =
         fStack_1d4 * fVar417 + fVar441 * fStack_3b4 + fVar367 * fStack_1f4 + fVar294 * fStack_414;
    local_760._16_4_ =
         fStack_1d0 * fVar419 + fVar443 * fStack_3b0 + fVar369 * fStack_1f0 + fVar296 * fStack_410;
    local_760._20_4_ =
         fStack_1cc * fVar421 + fVar445 * fStack_3ac + fVar371 * fStack_1ec + fVar298 * fStack_40c;
    local_760._24_4_ =
         fStack_1c8 * fVar423 + fVar447 * fStack_3a8 + fVar373 * fStack_1e8 + fVar300 * fStack_408;
    local_760._28_4_ = fVar376 + fVar440 + 2.0 + -fVar253 + -3.0;
    fVar419 = auVar245._28_4_ + auVar245._28_4_;
    auVar41._4_4_ = (fVar249 + fVar249) * auVar245._4_4_;
    auVar41._0_4_ = (fVar158 + fVar158) * auVar245._0_4_;
    auVar41._8_4_ = (fVar195 + fVar195) * auVar245._8_4_;
    auVar41._12_4_ = (fVar250 + fVar250) * auVar245._12_4_;
    auVar41._16_4_ = (fVar197 + fVar197) * auVar245._16_4_;
    auVar41._20_4_ = (fVar251 + fVar251) * auVar245._20_4_;
    auVar41._24_4_ = (fVar227 + fVar227) * auVar245._24_4_;
    auVar41._28_4_ = fVar419;
    auVar149 = vsubps_avx(auVar41,auVar355._0_32_);
    fVar356 = auVar269._28_4_ + 2.0;
    auVar42._4_4_ = (fVar249 + fVar249) * (fVar255 + 2.0);
    auVar42._0_4_ = (fVar158 + fVar158) * (fVar254 + 2.0);
    auVar42._8_4_ = (fVar195 + fVar195) * (fVar270 + 2.0);
    auVar42._12_4_ = (fVar250 + fVar250) * (fVar272 + 2.0);
    auVar42._16_4_ = (fVar197 + fVar197) * (fVar274 + 2.0);
    auVar42._20_4_ = (fVar251 + fVar251) * (fVar275 + 2.0);
    auVar42._24_4_ = (fVar227 + fVar227) * (fVar276 + 2.0);
    auVar42._28_4_ = fVar356;
    auVar43._4_4_ = fVar249 * fVar249 * 3.0;
    auVar43._0_4_ = fVar158 * fVar158 * 3.0;
    auVar43._8_4_ = fVar195 * fVar195 * 3.0;
    auVar43._12_4_ = fVar250 * fVar250 * 3.0;
    auVar43._16_4_ = fVar197 * fVar197 * 3.0;
    auVar43._20_4_ = fVar251 * fVar251 * 3.0;
    auVar43._24_4_ = fVar227 * fVar227 * 3.0;
    auVar43._28_4_ = fVar253;
    auVar32 = vsubps_avx(auVar42,auVar43);
    auVar33 = vsubps_avx(_local_b80,auVar41);
    fVar369 = auVar149._0_4_ * 0.5;
    fVar371 = auVar149._4_4_ * 0.5;
    fVar373 = auVar149._8_4_ * 0.5;
    fVar386 = auVar149._12_4_ * 0.5;
    fVar402 = auVar149._16_4_ * 0.5;
    fVar403 = auVar149._20_4_ * 0.5;
    fVar411 = auVar149._24_4_ * 0.5;
    fVar294 = (auVar245._0_4_ * fVar254 + (auVar245._0_4_ + auVar245._0_4_) * (fVar254 + -5.0)) *
              0.5;
    fVar296 = (auVar245._4_4_ * fVar255 + (auVar245._4_4_ + auVar245._4_4_) * (fVar255 + -5.0)) *
              0.5;
    fVar298 = (auVar245._8_4_ * fVar270 + (auVar245._8_4_ + auVar245._8_4_) * (fVar270 + -5.0)) *
              0.5;
    fVar300 = (auVar245._12_4_ * fVar272 + (auVar245._12_4_ + auVar245._12_4_) * (fVar272 + -5.0)) *
              0.5;
    fVar363 = (auVar245._16_4_ * fVar274 + (auVar245._16_4_ + auVar245._16_4_) * (fVar274 + -5.0)) *
              0.5;
    fVar365 = (auVar245._20_4_ * fVar275 + (auVar245._20_4_ + auVar245._20_4_) * (fVar275 + -5.0)) *
              0.5;
    fVar367 = (auVar245._24_4_ * fVar276 + (auVar245._24_4_ + auVar245._24_4_) * (fVar276 + -5.0)) *
              0.5;
    fVar158 = auVar32._0_4_ * 0.5;
    fVar249 = auVar32._4_4_ * 0.5;
    fVar195 = auVar32._8_4_ * 0.5;
    fVar250 = auVar32._12_4_ * 0.5;
    fVar197 = auVar32._16_4_ * 0.5;
    fVar254 = auVar32._20_4_ * 0.5;
    fVar255 = auVar32._24_4_ * 0.5;
    fVar251 = auVar33._0_4_ * 0.5;
    fVar227 = auVar33._4_4_ * 0.5;
    fVar270 = auVar33._8_4_ * 0.5;
    fVar274 = auVar33._12_4_ * 0.5;
    fVar275 = auVar33._16_4_ * 0.5;
    fVar276 = auVar33._20_4_ * 0.5;
    fVar277 = auVar33._24_4_ * 0.5;
    fVar346 = fVar253 + fVar253 + auVar149._28_4_ + fVar253 + fVar253 + fVar302;
    fVar356 = fVar356 + auVar245._28_4_ + fVar302 + auVar32._28_4_ + auVar33._28_4_;
    auVar172 = vpermilps_avx(ZEXT416((uint)(fVar252 * 0.04761905)),0);
    fVar279 = auVar172._0_4_;
    fVar322 = fVar279 * (fVar369 * (float)local_340._0_4_ +
                        fVar294 * (float)local_360._0_4_ +
                        fVar158 * fVar127 + auVar385._0_4_ * fVar251);
    fVar292 = auVar172._4_4_;
    fVar335 = fVar292 * (fVar371 * (float)local_340._4_4_ +
                        fVar296 * (float)local_360._4_4_ +
                        fVar249 * fVar278 + auVar385._4_4_ * fVar227);
    auVar44._4_4_ = fVar335;
    auVar44._0_4_ = fVar322;
    fVar302 = auVar172._8_4_;
    fVar336 = fVar302 * (fVar373 * fStack_338 +
                        fVar298 * fStack_358 + fVar195 * fVar156 + auVar385._8_4_ * fVar270);
    auVar44._8_4_ = fVar336;
    fVar272 = auVar172._12_4_;
    fVar338 = fVar272 * (fVar386 * fStack_334 +
                        fVar300 * fStack_354 + fVar250 * fVar440 + auVar385._12_4_ * fVar274);
    auVar44._12_4_ = fVar338;
    fVar340 = fVar279 * (fVar402 * fStack_330 +
                        fVar363 * fStack_350 + fVar197 * fVar127 + auVar385._16_4_ * fVar275);
    auVar44._16_4_ = fVar340;
    fVar342 = fVar292 * (fVar403 * fStack_32c +
                        fVar365 * fStack_34c + fVar254 * fVar278 + auVar385._20_4_ * fVar276);
    auVar44._20_4_ = fVar342;
    fVar344 = fVar302 * (fVar411 * fStack_328 +
                        fVar367 * fStack_348 + fVar255 * fVar156 + auVar385._24_4_ * fVar277);
    auVar44._24_4_ = fVar344;
    auVar44._28_4_ = fVar346;
    fVar404 = fVar279 * ((float)local_1a0._0_4_ * fVar369 +
                        fVar294 * (float)local_380._0_4_ +
                        fVar158 * (float)local_3e0._0_4_ + fVar251 * fVar271);
    fVar412 = fVar292 * ((float)local_1a0._4_4_ * fVar371 +
                        fVar296 * (float)local_380._4_4_ +
                        fVar249 * (float)local_3e0._4_4_ + fVar227 * fVar273);
    local_980._4_4_ = fVar412;
    local_980._0_4_ = fVar404;
    fVar415 = fVar302 * (fStack_198 * fVar373 +
                        fVar298 * fStack_378 + fVar195 * fStack_3d8 + fVar270 * fVar413);
    local_980._8_4_ = fVar415;
    fVar418 = fVar272 * (fStack_194 * fVar386 +
                        fVar300 * fStack_374 + fVar250 * fStack_3d4 + fVar274 * fVar416);
    local_980._12_4_ = fVar418;
    fVar420 = fVar279 * (fStack_190 * fVar402 +
                        fVar363 * fStack_370 + fVar197 * fStack_3d0 + fVar275 * fVar271);
    local_980._16_4_ = fVar420;
    fVar422 = fVar292 * (fStack_18c * fVar403 +
                        fVar365 * fStack_36c + fVar254 * fStack_3cc + fVar276 * fVar273);
    local_980._20_4_ = fVar422;
    fVar424 = fVar302 * (fStack_188 * fVar411 +
                        fVar367 * fStack_368 + fVar255 * fStack_3c8 + fVar277 * fVar413);
    local_980._24_4_ = fVar424;
    local_980._28_4_ = -auVar245._28_4_;
    fVar426 = fVar279 * ((float)local_1c0._0_4_ * fVar369 +
                        fVar158 * (float)local_400._0_4_ + fVar251 * (float)local_440._0_4_ +
                        fVar294 * (float)local_3a0._0_4_);
    fVar436 = fVar292 * ((float)local_1c0._4_4_ * fVar371 +
                        fVar249 * (float)local_400._4_4_ + fVar227 * (float)local_440._4_4_ +
                        fVar296 * (float)local_3a0._4_4_);
    auVar45._4_4_ = fVar436;
    auVar45._0_4_ = fVar426;
    fVar439 = fVar302 * (fStack_1b8 * fVar373 +
                        fVar195 * fStack_3f8 + fVar270 * fStack_438 + fVar298 * fStack_398);
    auVar45._8_4_ = fVar439;
    fVar442 = fVar272 * (fStack_1b4 * fVar386 +
                        fVar250 * fStack_3f4 + fVar274 * fStack_434 + fVar300 * fStack_394);
    auVar45._12_4_ = fVar442;
    fVar444 = fVar279 * (fStack_1b0 * fVar402 +
                        fVar197 * fStack_3f0 + fVar275 * fStack_430 + fVar363 * fStack_390);
    auVar45._16_4_ = fVar444;
    fVar446 = fVar292 * (fStack_1ac * fVar403 +
                        fVar254 * fStack_3ec + fVar276 * fStack_42c + fVar365 * fStack_38c);
    auVar45._20_4_ = fVar446;
    fVar448 = fVar302 * (fStack_1a8 * fVar411 +
                        fVar255 * fStack_3e8 + fVar277 * fStack_428 + fVar367 * fStack_388);
    auVar45._24_4_ = fVar448;
    auVar45._28_4_ = uStack_184;
    fVar251 = fVar279 * ((float)local_1e0._0_4_ * fVar369 +
                        fVar294 * (float)local_3c0._0_4_ +
                        fVar158 * (float)local_420._0_4_ + (float)local_200._0_4_ * fVar251);
    fVar227 = fVar292 * ((float)local_1e0._4_4_ * fVar371 +
                        fVar296 * (float)local_3c0._4_4_ +
                        fVar249 * (float)local_420._4_4_ + (float)local_200._4_4_ * fVar227);
    auVar46._4_4_ = fVar227;
    auVar46._0_4_ = fVar251;
    fVar270 = fVar302 * (fStack_1d8 * fVar373 +
                        fVar298 * fStack_3b8 + fVar195 * fStack_418 + fStack_1f8 * fVar270);
    auVar46._8_4_ = fVar270;
    fVar272 = fVar272 * (fStack_1d4 * fVar386 +
                        fVar300 * fStack_3b4 + fVar250 * fStack_414 + fStack_1f4 * fVar274);
    auVar46._12_4_ = fVar272;
    fVar279 = fVar279 * (fStack_1d0 * fVar402 +
                        fVar363 * fStack_3b0 + fVar197 * fStack_410 + fStack_1f0 * fVar275);
    auVar46._16_4_ = fVar279;
    fVar292 = fVar292 * (fStack_1cc * fVar403 +
                        fVar365 * fStack_3ac + fVar254 * fStack_40c + fStack_1ec * fVar276);
    auVar46._20_4_ = fVar292;
    fVar302 = fVar302 * (fStack_1c8 * fVar411 +
                        fVar367 * fStack_3a8 + fVar255 * fStack_408 + fStack_1e8 * fVar277);
    auVar46._24_4_ = fVar302;
    auVar46._28_4_ = fVar356;
    auVar105._4_4_ = fVar364;
    auVar105._0_4_ = fVar357;
    auVar105._8_4_ = fVar366;
    auVar105._12_4_ = fVar368;
    auVar105._16_4_ = fVar370;
    auVar105._20_4_ = fVar372;
    auVar105._24_4_ = fVar374;
    auVar105._28_4_ = fVar376;
    auVar149 = vperm2f128_avx(auVar105,auVar105,1);
    auVar149 = vshufps_avx(auVar149,auVar105,0x30);
    local_a60 = vshufps_avx(auVar105,auVar149,0x29);
    auVar107._4_4_ = fVar226;
    auVar107._0_4_ = fVar201;
    auVar107._8_4_ = fVar228;
    auVar107._12_4_ = fVar229;
    auVar107._16_4_ = fVar230;
    auVar107._20_4_ = fVar231;
    auVar107._24_4_ = fVar232;
    auVar107._28_4_ = fVar233;
    auVar149 = vperm2f128_avx(auVar107,auVar107,1);
    auVar149 = vshufps_avx(auVar149,auVar107,0x30);
    _local_9e0 = vshufps_avx(auVar107,auVar149,0x29);
    auVar32 = vsubps_avx(local_760,auVar46);
    auVar149 = vperm2f128_avx(auVar32,auVar32,1);
    auVar149 = vshufps_avx(auVar149,auVar32,0x30);
    local_780 = vshufps_avx(auVar32,auVar149,0x29);
    auVar33 = vsubps_avx(local_a60,auVar105);
    auVar315 = vsubps_avx(_local_9e0,auVar107);
    fVar249 = auVar33._0_4_;
    fVar252 = auVar33._4_4_;
    auVar47._4_4_ = fVar436 * fVar252;
    auVar47._0_4_ = fVar426 * fVar249;
    fVar274 = auVar33._8_4_;
    auVar47._8_4_ = fVar439 * fVar274;
    fVar294 = auVar33._12_4_;
    auVar47._12_4_ = fVar442 * fVar294;
    fVar363 = auVar33._16_4_;
    auVar47._16_4_ = fVar444 * fVar363;
    fVar386 = auVar33._20_4_;
    auVar47._20_4_ = fVar446 * fVar386;
    fVar413 = auVar33._24_4_;
    auVar47._24_4_ = fVar448 * fVar413;
    auVar47._28_4_ = auVar32._28_4_;
    fVar195 = auVar315._0_4_;
    fVar253 = auVar315._4_4_;
    auVar48._4_4_ = fVar412 * fVar253;
    auVar48._0_4_ = fVar404 * fVar195;
    fVar275 = auVar315._8_4_;
    auVar48._8_4_ = fVar415 * fVar275;
    fVar296 = auVar315._12_4_;
    auVar48._12_4_ = fVar418 * fVar296;
    fVar365 = auVar315._16_4_;
    auVar48._16_4_ = fVar420 * fVar365;
    fVar402 = auVar315._20_4_;
    auVar48._20_4_ = fVar422 * fVar402;
    fVar414 = auVar315._24_4_;
    auVar48._24_4_ = fVar424 * fVar414;
    auVar48._28_4_ = auVar149._28_4_;
    auVar33 = vsubps_avx(auVar48,auVar47);
    auVar113._4_4_ = fStack_9bc;
    auVar113._0_4_ = local_9c0;
    auVar113._8_4_ = fStack_9b8;
    auVar113._12_4_ = fStack_9b4;
    auVar113._16_4_ = fStack_9b0;
    auVar113._20_4_ = fStack_9ac;
    auVar113._24_4_ = fStack_9a8;
    auVar113._28_4_ = fStack_9a4;
    auVar149 = vperm2f128_avx(auVar113,auVar113,1);
    auVar149 = vshufps_avx(auVar149,auVar113,0x30);
    auVar315 = vshufps_avx(auVar113,auVar149,0x29);
    auVar35 = vsubps_avx(auVar315,auVar113);
    auVar49._4_4_ = fVar253 * fVar335;
    auVar49._0_4_ = fVar195 * fVar322;
    auVar49._8_4_ = fVar275 * fVar336;
    auVar49._12_4_ = fVar296 * fVar338;
    auVar49._16_4_ = fVar365 * fVar340;
    auVar49._20_4_ = fVar402 * fVar342;
    auVar49._24_4_ = fVar414 * fVar344;
    auVar49._28_4_ = auVar315._28_4_;
    fVar250 = auVar35._0_4_;
    fVar254 = auVar35._4_4_;
    auVar50._4_4_ = fVar436 * fVar254;
    auVar50._0_4_ = fVar426 * fVar250;
    fVar276 = auVar35._8_4_;
    auVar50._8_4_ = fVar439 * fVar276;
    fVar298 = auVar35._12_4_;
    auVar50._12_4_ = fVar442 * fVar298;
    fVar367 = auVar35._16_4_;
    auVar50._16_4_ = fVar444 * fVar367;
    fVar403 = auVar35._20_4_;
    auVar50._20_4_ = fVar446 * fVar403;
    fVar417 = auVar35._24_4_;
    auVar50._24_4_ = fVar448 * fVar417;
    auVar50._28_4_ = local_9e0._28_4_;
    auVar34 = vsubps_avx(auVar50,auVar49);
    auVar51._4_4_ = fVar412 * fVar254;
    auVar51._0_4_ = fVar404 * fVar250;
    auVar51._8_4_ = fVar415 * fVar276;
    auVar51._12_4_ = fVar418 * fVar298;
    auVar51._16_4_ = fVar420 * fVar367;
    auVar51._20_4_ = fVar422 * fVar403;
    auVar51._24_4_ = fVar424 * fVar417;
    auVar51._28_4_ = local_9e0._28_4_;
    auVar52._4_4_ = fVar335 * fVar252;
    auVar52._0_4_ = fVar322 * fVar249;
    auVar52._8_4_ = fVar336 * fVar274;
    auVar52._12_4_ = fVar338 * fVar294;
    auVar52._16_4_ = fVar340 * fVar363;
    auVar52._20_4_ = fVar342 * fVar386;
    auVar52._24_4_ = fVar344 * fVar413;
    auVar52._28_4_ = fVar419;
    auVar434 = vsubps_avx(auVar52,auVar51);
    fVar158 = auVar434._28_4_;
    fVar371 = auVar34._28_4_ + fVar158;
    auVar246._0_4_ = fVar250 * fVar250 + fVar249 * fVar249 + fVar195 * fVar195;
    auVar246._4_4_ = fVar254 * fVar254 + fVar252 * fVar252 + fVar253 * fVar253;
    auVar246._8_4_ = fVar276 * fVar276 + fVar274 * fVar274 + fVar275 * fVar275;
    auVar246._12_4_ = fVar298 * fVar298 + fVar294 * fVar294 + fVar296 * fVar296;
    auVar246._16_4_ = fVar367 * fVar367 + fVar363 * fVar363 + fVar365 * fVar365;
    auVar246._20_4_ = fVar403 * fVar403 + fVar386 * fVar386 + fVar402 * fVar402;
    auVar246._24_4_ = fVar417 * fVar417 + fVar413 * fVar413 + fVar414 * fVar414;
    auVar246._28_4_ = fVar158 + fVar158 + fVar371;
    auVar149 = vrcpps_avx(auVar246);
    fVar373 = auVar149._0_4_;
    fVar271 = auVar149._4_4_;
    auVar53._4_4_ = fVar271 * auVar246._4_4_;
    auVar53._0_4_ = fVar373 * auVar246._0_4_;
    fVar273 = auVar149._8_4_;
    auVar53._8_4_ = fVar273 * auVar246._8_4_;
    fVar421 = auVar149._12_4_;
    auVar53._12_4_ = fVar421 * auVar246._12_4_;
    fVar423 = auVar149._16_4_;
    auVar53._16_4_ = fVar423 * auVar246._16_4_;
    fVar425 = auVar149._20_4_;
    auVar53._20_4_ = fVar425 * auVar246._20_4_;
    fVar278 = auVar149._24_4_;
    auVar53._24_4_ = fVar278 * auVar246._24_4_;
    auVar53._28_4_ = fVar419;
    auVar393._8_4_ = 0x3f800000;
    auVar393._0_8_ = &DAT_3f8000003f800000;
    auVar393._12_4_ = 0x3f800000;
    auVar393._16_4_ = 0x3f800000;
    auVar393._20_4_ = 0x3f800000;
    auVar393._24_4_ = 0x3f800000;
    auVar393._28_4_ = 0x3f800000;
    auVar36 = vsubps_avx(auVar393,auVar53);
    fVar373 = auVar36._0_4_ * fVar373 + fVar373;
    fVar271 = auVar36._4_4_ * fVar271 + fVar271;
    fVar273 = auVar36._8_4_ * fVar273 + fVar273;
    fVar421 = auVar36._12_4_ * fVar421 + fVar421;
    fVar423 = auVar36._16_4_ * fVar423 + fVar423;
    fVar425 = auVar36._20_4_ * fVar425 + fVar425;
    fVar278 = auVar36._24_4_ * fVar278 + fVar278;
    auVar32 = vperm2f128_avx(local_980,local_980,1);
    auVar32 = vshufps_avx(auVar32,local_980,0x30);
    local_aa0 = vshufps_avx(local_980,auVar32,0x29);
    auVar32 = vperm2f128_avx(auVar45,auVar45,1);
    auVar32 = vshufps_avx(auVar32,auVar45,0x30);
    local_ac0 = vshufps_avx(auVar45,auVar32,0x29);
    fVar387 = local_ac0._0_4_;
    fVar396 = local_ac0._4_4_;
    auVar54._4_4_ = fVar396 * fVar252;
    auVar54._0_4_ = fVar387 * fVar249;
    fVar397 = local_ac0._8_4_;
    auVar54._8_4_ = fVar397 * fVar274;
    fVar398 = local_ac0._12_4_;
    auVar54._12_4_ = fVar398 * fVar294;
    fVar399 = local_ac0._16_4_;
    auVar54._16_4_ = fVar399 * fVar363;
    fVar400 = local_ac0._20_4_;
    auVar54._20_4_ = fVar400 * fVar386;
    fVar401 = local_ac0._24_4_;
    auVar54._24_4_ = fVar401 * fVar413;
    auVar54._28_4_ = auVar32._28_4_;
    fVar449 = local_aa0._0_4_;
    fVar456 = local_aa0._4_4_;
    auVar55._4_4_ = fVar456 * fVar253;
    auVar55._0_4_ = fVar449 * fVar195;
    fVar458 = local_aa0._8_4_;
    auVar55._8_4_ = fVar458 * fVar275;
    fVar460 = local_aa0._12_4_;
    auVar55._12_4_ = fVar460 * fVar296;
    fVar462 = local_aa0._16_4_;
    auVar55._16_4_ = fVar462 * fVar365;
    fVar464 = local_aa0._20_4_;
    auVar55._20_4_ = fVar464 * fVar402;
    fVar466 = local_aa0._24_4_;
    auVar55._24_4_ = fVar466 * fVar414;
    auVar55._28_4_ = -auVar245._28_4_;
    auVar37 = vsubps_avx(auVar55,auVar54);
    auVar32 = vperm2f128_avx(auVar44,auVar44,1);
    auVar32 = vshufps_avx(auVar32,auVar44,0x30);
    local_740 = vshufps_avx(auVar44,auVar32,0x29);
    fVar197 = local_740._0_4_;
    fVar255 = local_740._4_4_;
    auVar56._4_4_ = fVar253 * fVar255;
    auVar56._0_4_ = fVar195 * fVar197;
    fVar277 = local_740._8_4_;
    auVar56._8_4_ = fVar275 * fVar277;
    fVar300 = local_740._12_4_;
    auVar56._12_4_ = fVar296 * fVar300;
    fVar369 = local_740._16_4_;
    auVar56._16_4_ = fVar365 * fVar369;
    fVar411 = local_740._20_4_;
    auVar56._20_4_ = fVar402 * fVar411;
    fVar419 = local_740._24_4_;
    auVar56._24_4_ = fVar414 * fVar419;
    auVar56._28_4_ = auVar32._28_4_;
    auVar57._4_4_ = fVar396 * fVar254;
    auVar57._0_4_ = fVar387 * fVar250;
    auVar57._8_4_ = fVar397 * fVar276;
    auVar57._12_4_ = fVar398 * fVar298;
    auVar57._16_4_ = fVar399 * fVar367;
    auVar57._20_4_ = fVar400 * fVar403;
    auVar57._24_4_ = fVar401 * fVar417;
    auVar57._28_4_ = uStack_184;
    auVar40 = vsubps_avx(auVar57,auVar56);
    auVar58._4_4_ = fVar456 * fVar254;
    auVar58._0_4_ = fVar449 * fVar250;
    auVar58._8_4_ = fVar458 * fVar276;
    auVar58._12_4_ = fVar460 * fVar298;
    auVar58._16_4_ = fVar462 * fVar367;
    auVar58._20_4_ = fVar464 * fVar403;
    auVar58._24_4_ = fVar466 * fVar417;
    auVar58._28_4_ = uStack_184;
    auVar59._4_4_ = fVar255 * fVar252;
    auVar59._0_4_ = fVar197 * fVar249;
    auVar59._8_4_ = fVar277 * fVar274;
    auVar59._12_4_ = fVar300 * fVar294;
    auVar59._16_4_ = fVar369 * fVar363;
    auVar59._20_4_ = fVar411 * fVar386;
    fVar158 = local_aa0._28_4_;
    auVar59._24_4_ = fVar419 * fVar413;
    auVar59._28_4_ = fVar158;
    auVar32 = vsubps_avx(auVar59,auVar58);
    fVar127 = auVar32._28_4_;
    auVar60._4_4_ =
         (auVar33._4_4_ * auVar33._4_4_ +
         auVar34._4_4_ * auVar34._4_4_ + auVar434._4_4_ * auVar434._4_4_) * fVar271;
    auVar60._0_4_ =
         (auVar33._0_4_ * auVar33._0_4_ +
         auVar34._0_4_ * auVar34._0_4_ + auVar434._0_4_ * auVar434._0_4_) * fVar373;
    auVar60._8_4_ =
         (auVar33._8_4_ * auVar33._8_4_ +
         auVar34._8_4_ * auVar34._8_4_ + auVar434._8_4_ * auVar434._8_4_) * fVar273;
    auVar60._12_4_ =
         (auVar33._12_4_ * auVar33._12_4_ +
         auVar34._12_4_ * auVar34._12_4_ + auVar434._12_4_ * auVar434._12_4_) * fVar421;
    auVar60._16_4_ =
         (auVar33._16_4_ * auVar33._16_4_ +
         auVar34._16_4_ * auVar34._16_4_ + auVar434._16_4_ * auVar434._16_4_) * fVar423;
    auVar60._20_4_ =
         (auVar33._20_4_ * auVar33._20_4_ +
         auVar34._20_4_ * auVar34._20_4_ + auVar434._20_4_ * auVar434._20_4_) * fVar425;
    auVar60._24_4_ =
         (auVar33._24_4_ * auVar33._24_4_ +
         auVar34._24_4_ * auVar34._24_4_ + auVar434._24_4_ * auVar434._24_4_) * fVar278;
    auVar60._28_4_ = auVar33._28_4_ + fVar371;
    auVar61._4_4_ =
         (auVar37._4_4_ * auVar37._4_4_ +
         auVar40._4_4_ * auVar40._4_4_ + auVar32._4_4_ * auVar32._4_4_) * fVar271;
    auVar61._0_4_ =
         (auVar37._0_4_ * auVar37._0_4_ +
         auVar40._0_4_ * auVar40._0_4_ + auVar32._0_4_ * auVar32._0_4_) * fVar373;
    auVar61._8_4_ =
         (auVar37._8_4_ * auVar37._8_4_ +
         auVar40._8_4_ * auVar40._8_4_ + auVar32._8_4_ * auVar32._8_4_) * fVar273;
    auVar61._12_4_ =
         (auVar37._12_4_ * auVar37._12_4_ +
         auVar40._12_4_ * auVar40._12_4_ + auVar32._12_4_ * auVar32._12_4_) * fVar421;
    auVar61._16_4_ =
         (auVar37._16_4_ * auVar37._16_4_ +
         auVar40._16_4_ * auVar40._16_4_ + auVar32._16_4_ * auVar32._16_4_) * fVar423;
    auVar61._20_4_ =
         (auVar37._20_4_ * auVar37._20_4_ +
         auVar40._20_4_ * auVar40._20_4_ + auVar32._20_4_ * auVar32._20_4_) * fVar425;
    auVar61._24_4_ =
         (auVar37._24_4_ * auVar37._24_4_ +
         auVar40._24_4_ * auVar40._24_4_ + auVar32._24_4_ * auVar32._24_4_) * fVar278;
    auVar61._28_4_ = auVar36._28_4_ + auVar149._28_4_;
    auVar149 = vmaxps_avx(auVar60,auVar61);
    auVar32 = vperm2f128_avx(local_760,local_760,1);
    auVar32 = vshufps_avx(auVar32,local_760,0x30);
    auVar34 = vshufps_avx(local_760,auVar32,0x29);
    auVar179._0_4_ = (float)local_760._0_4_ + fVar251;
    auVar179._4_4_ = local_760._4_4_ + fVar227;
    auVar179._8_4_ = local_760._8_4_ + fVar270;
    auVar179._12_4_ = local_760._12_4_ + fVar272;
    auVar179._16_4_ = local_760._16_4_ + fVar279;
    auVar179._20_4_ = local_760._20_4_ + fVar292;
    auVar179._24_4_ = local_760._24_4_ + fVar302;
    auVar179._28_4_ = local_760._28_4_ + fVar356;
    auVar32 = vmaxps_avx(local_760,auVar179);
    auVar33 = vmaxps_avx(local_780,auVar34);
    auVar33 = vmaxps_avx(auVar32,auVar33);
    auVar32 = vrsqrtps_avx(auVar246);
    fVar251 = auVar32._0_4_;
    fVar227 = auVar32._4_4_;
    fVar270 = auVar32._8_4_;
    fVar272 = auVar32._12_4_;
    fVar279 = auVar32._16_4_;
    fVar292 = auVar32._20_4_;
    fVar302 = auVar32._24_4_;
    auVar62._4_4_ = fVar227 * fVar227 * fVar227 * auVar246._4_4_ * 0.5;
    auVar62._0_4_ = fVar251 * fVar251 * fVar251 * auVar246._0_4_ * 0.5;
    auVar62._8_4_ = fVar270 * fVar270 * fVar270 * auVar246._8_4_ * 0.5;
    auVar62._12_4_ = fVar272 * fVar272 * fVar272 * auVar246._12_4_ * 0.5;
    auVar62._16_4_ = fVar279 * fVar279 * fVar279 * auVar246._16_4_ * 0.5;
    auVar62._20_4_ = fVar292 * fVar292 * fVar292 * auVar246._20_4_ * 0.5;
    auVar62._24_4_ = fVar302 * fVar302 * fVar302 * auVar246._24_4_ * 0.5;
    auVar62._28_4_ = auVar246._28_4_;
    auVar63._4_4_ = fVar227 * 1.5;
    auVar63._0_4_ = fVar251 * 1.5;
    auVar63._8_4_ = fVar270 * 1.5;
    auVar63._12_4_ = fVar272 * 1.5;
    auVar63._16_4_ = fVar279 * 1.5;
    auVar63._20_4_ = fVar292 * 1.5;
    auVar63._24_4_ = fVar302 * 1.5;
    auVar63._28_4_ = auVar32._28_4_;
    auVar32 = vsubps_avx(auVar63,auVar62);
    auVar395 = ZEXT3264(auVar32);
    auVar106._4_4_ = fVar364;
    auVar106._0_4_ = fVar357;
    auVar106._8_4_ = fVar366;
    auVar106._12_4_ = fVar368;
    auVar106._16_4_ = fVar370;
    auVar106._20_4_ = fVar372;
    auVar106._24_4_ = fVar374;
    auVar106._28_4_ = fVar376;
    local_ae0 = vsubps_avx(ZEXT832(0) << 0x20,auVar106);
    auVar108._4_4_ = fVar226;
    auVar108._0_4_ = fVar201;
    auVar108._8_4_ = fVar228;
    auVar108._12_4_ = fVar229;
    auVar108._16_4_ = fVar230;
    auVar108._20_4_ = fVar231;
    auVar108._24_4_ = fVar232;
    auVar108._28_4_ = fVar233;
    local_9a0 = vsubps_avx(ZEXT832(0) << 0x20,auVar108);
    fVar251 = local_9a0._0_4_;
    fVar270 = local_9a0._4_4_;
    fVar279 = local_9a0._8_4_;
    fVar302 = local_9a0._12_4_;
    fVar371 = local_9a0._16_4_;
    fVar271 = local_9a0._20_4_;
    fVar421 = local_9a0._24_4_;
    fVar227 = local_ae0._0_4_;
    fVar272 = local_ae0._4_4_;
    fVar292 = local_ae0._8_4_;
    fVar356 = local_ae0._12_4_;
    fVar373 = local_ae0._16_4_;
    fVar273 = local_ae0._20_4_;
    fVar423 = local_ae0._24_4_;
    local_8e0 = vsubps_avx(ZEXT832(0) << 0x20,auVar113);
    fVar469 = local_8e0._0_4_;
    fVar471 = local_8e0._4_4_;
    fVar472 = local_8e0._8_4_;
    fVar473 = local_8e0._12_4_;
    fVar474 = local_8e0._16_4_;
    fVar475 = local_8e0._20_4_;
    fVar476 = local_8e0._24_4_;
    auVar410._0_4_ =
         fVar469 * (float)local_a00._0_4_ +
         (float)local_8c0._0_4_ * fVar227 + (float)local_920._0_4_ * fVar251;
    auVar410._4_4_ =
         fVar471 * (float)local_a00._4_4_ +
         (float)local_8c0._4_4_ * fVar272 + (float)local_920._4_4_ * fVar270;
    auVar410._8_4_ = fVar472 * fStack_9f8 + fStack_8b8 * fVar292 + fStack_918 * fVar279;
    auVar410._12_4_ = fVar473 * fStack_9f4 + fStack_8b4 * fVar356 + fStack_914 * fVar302;
    auVar410._16_4_ = fVar474 * fStack_9f0 + fStack_8b0 * fVar373 + fStack_910 * fVar371;
    auVar410._20_4_ = fVar475 * fStack_9ec + fStack_8ac * fVar273 + fStack_90c * fVar271;
    auVar410._24_4_ = fVar476 * fStack_9e8 + fStack_8a8 * fVar423 + fStack_908 * fVar421;
    auVar410._28_4_ = fVar127 + fVar127 + auVar40._28_4_ + fVar127;
    auVar431._0_4_ = fVar469 * fVar469 + fVar227 * fVar227 + fVar251 * fVar251;
    auVar431._4_4_ = fVar471 * fVar471 + fVar272 * fVar272 + fVar270 * fVar270;
    auVar431._8_4_ = fVar472 * fVar472 + fVar292 * fVar292 + fVar279 * fVar279;
    auVar431._12_4_ = fVar473 * fVar473 + fVar356 * fVar356 + fVar302 * fVar302;
    auVar431._16_4_ = fVar474 * fVar474 + fVar373 * fVar373 + fVar371 * fVar371;
    auVar431._20_4_ = fVar475 * fVar475 + fVar273 * fVar273 + fVar271 * fVar271;
    auVar431._24_4_ = fVar476 * fVar476 + fVar423 * fVar423 + fVar421 * fVar421;
    auVar431._28_4_ = fVar158 + fVar158 + fVar127;
    fVar280 = auVar32._0_4_;
    fVar293 = auVar32._4_4_;
    fVar295 = auVar32._8_4_;
    fVar297 = auVar32._12_4_;
    fVar299 = auVar32._16_4_;
    fVar301 = auVar32._20_4_;
    fVar303 = auVar32._24_4_;
    fVar127 = (float)local_a00._0_4_ * fVar250 * fVar280 +
              fVar280 * fVar249 * (float)local_8c0._0_4_ +
              fVar195 * fVar280 * (float)local_920._0_4_;
    fVar425 = (float)local_a00._4_4_ * fVar254 * fVar293 +
              fVar293 * fVar252 * (float)local_8c0._4_4_ +
              fVar253 * fVar293 * (float)local_920._4_4_;
    fVar278 = fStack_9f8 * fVar276 * fVar295 +
              fVar295 * fVar274 * fStack_8b8 + fVar275 * fVar295 * fStack_918;
    fVar435 = fStack_9f4 * fVar298 * fVar297 +
              fVar297 * fVar294 * fStack_8b4 + fVar296 * fVar297 * fStack_914;
    fVar156 = fStack_9f0 * fVar367 * fVar299 +
              fVar299 * fVar363 * fStack_8b0 + fVar365 * fVar299 * fStack_910;
    fVar438 = fStack_9ec * fVar403 * fVar301 +
              fVar301 * fVar386 * fStack_8ac + fVar402 * fVar301 * fStack_90c;
    fVar441 = fStack_9e8 * fVar417 * fVar303 +
              fVar303 * fVar413 * fStack_8a8 + fVar414 * fVar303 * fStack_908;
    fVar158 = fStack_9e4 + fStack_8a4 + fStack_904;
    fVar450 = fVar469 * fVar250 * fVar280 +
              fVar280 * fVar249 * fVar227 + fVar195 * fVar280 * fVar251;
    fVar457 = fVar471 * fVar254 * fVar293 +
              fVar293 * fVar252 * fVar272 + fVar253 * fVar293 * fVar270;
    fVar459 = fVar472 * fVar276 * fVar295 +
              fVar295 * fVar274 * fVar292 + fVar275 * fVar295 * fVar279;
    fVar461 = fVar473 * fVar298 * fVar297 +
              fVar297 * fVar294 * fVar356 + fVar296 * fVar297 * fVar302;
    fVar463 = fVar474 * fVar367 * fVar299 +
              fVar299 * fVar363 * fVar373 + fVar365 * fVar299 * fVar371;
    fVar465 = fVar475 * fVar403 * fVar301 +
              fVar301 * fVar386 * fVar273 + fVar402 * fVar301 * fVar271;
    fVar467 = fVar476 * fVar417 * fVar303 +
              fVar303 * fVar413 * fVar423 + fVar414 * fVar303 * fVar421;
    fVar468 = fStack_8a4 + fVar158;
    auVar64._4_4_ = fVar457 * fVar425;
    auVar64._0_4_ = fVar450 * fVar127;
    auVar64._8_4_ = fVar459 * fVar278;
    auVar64._12_4_ = fVar461 * fVar435;
    auVar64._16_4_ = fVar463 * fVar156;
    auVar64._20_4_ = fVar465 * fVar438;
    auVar64._24_4_ = fVar467 * fVar441;
    auVar64._28_4_ = fVar158;
    auVar36 = vsubps_avx(auVar410,auVar64);
    auVar65._4_4_ = fVar457 * fVar457;
    auVar65._0_4_ = fVar450 * fVar450;
    auVar65._8_4_ = fVar459 * fVar459;
    auVar65._12_4_ = fVar461 * fVar461;
    auVar65._16_4_ = fVar463 * fVar463;
    auVar65._20_4_ = fVar465 * fVar465;
    auVar65._24_4_ = fVar467 * fVar467;
    auVar65._28_4_ = fStack_8a4;
    auVar37 = vsubps_avx(auVar431,auVar65);
    auVar434 = vsqrtps_avx(auVar149);
    fVar158 = (auVar434._0_4_ + auVar33._0_4_) * 1.0000002;
    fVar443 = (auVar434._4_4_ + auVar33._4_4_) * 1.0000002;
    fVar445 = (auVar434._8_4_ + auVar33._8_4_) * 1.0000002;
    fVar447 = (auVar434._12_4_ + auVar33._12_4_) * 1.0000002;
    fVar198 = (auVar434._16_4_ + auVar33._16_4_) * 1.0000002;
    fVar199 = (auVar434._20_4_ + auVar33._20_4_) * 1.0000002;
    fVar200 = (auVar434._24_4_ + auVar33._24_4_) * 1.0000002;
    auVar66._4_4_ = fVar443 * fVar443;
    auVar66._0_4_ = fVar158 * fVar158;
    auVar66._8_4_ = fVar445 * fVar445;
    auVar66._12_4_ = fVar447 * fVar447;
    auVar66._16_4_ = fVar198 * fVar198;
    auVar66._20_4_ = fVar199 * fVar199;
    auVar66._24_4_ = fVar200 * fVar200;
    auVar66._28_4_ = auVar434._28_4_ + auVar33._28_4_;
    fVar427 = auVar36._0_4_ + auVar36._0_4_;
    fVar437 = auVar36._4_4_ + auVar36._4_4_;
    local_240._0_8_ = CONCAT44(fVar437,fVar427);
    local_240._8_4_ = auVar36._8_4_ + auVar36._8_4_;
    local_240._12_4_ = auVar36._12_4_ + auVar36._12_4_;
    local_240._16_4_ = auVar36._16_4_ + auVar36._16_4_;
    local_240._20_4_ = auVar36._20_4_ + auVar36._20_4_;
    local_240._24_4_ = auVar36._24_4_ + auVar36._24_4_;
    local_240._28_4_ = auVar36._28_4_ + auVar36._28_4_;
    auVar33 = vsubps_avx(auVar37,auVar66);
    auVar67._4_4_ = fVar425 * fVar425;
    auVar67._0_4_ = fVar127 * fVar127;
    auVar67._8_4_ = fVar278 * fVar278;
    auVar67._12_4_ = fVar435 * fVar435;
    auVar67._16_4_ = fVar156 * fVar156;
    auVar67._20_4_ = fVar438 * fVar438;
    auVar67._24_4_ = fVar441 * fVar441;
    auVar67._28_4_ = auVar35._28_4_;
    auVar354 = ZEXT3264(auVar67);
    local_4a0 = vsubps_avx(local_220,auVar67);
    auVar68._4_4_ = fVar437 * fVar437;
    auVar68._0_4_ = fVar427 * fVar427;
    auVar68._8_4_ = local_240._8_4_ * local_240._8_4_;
    auVar68._12_4_ = local_240._12_4_ * local_240._12_4_;
    auVar68._16_4_ = local_240._16_4_ * local_240._16_4_;
    auVar68._20_4_ = local_240._20_4_ * local_240._20_4_;
    auVar68._24_4_ = local_240._24_4_ * local_240._24_4_;
    auVar68._28_4_ = local_220._28_4_;
    fVar443 = local_4a0._0_4_;
    fVar445 = local_4a0._4_4_;
    fVar447 = local_4a0._8_4_;
    fVar198 = local_4a0._12_4_;
    fVar199 = local_4a0._16_4_;
    fVar200 = local_4a0._20_4_;
    fVar375 = local_4a0._24_4_;
    auVar69._4_4_ = fVar445 * 4.0 * auVar33._4_4_;
    auVar69._0_4_ = fVar443 * 4.0 * auVar33._0_4_;
    auVar69._8_4_ = fVar447 * 4.0 * auVar33._8_4_;
    auVar69._12_4_ = fVar198 * 4.0 * auVar33._12_4_;
    auVar69._16_4_ = fVar199 * 4.0 * auVar33._16_4_;
    auVar69._20_4_ = fVar200 * 4.0 * auVar33._20_4_;
    auVar69._24_4_ = fVar375 * 4.0 * auVar33._24_4_;
    auVar69._28_4_ = 0x40800000;
    auVar36 = vsubps_avx(auVar68,auVar69);
    auVar149 = vcmpps_avx(auVar36,ZEXT432(0) << 0x20,5);
    fVar158 = local_4a0._28_4_;
    if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar149 >> 0x7f,0) == '\0') &&
          (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar149 >> 0xbf,0) == '\0') &&
        (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar149[0x1f])
    {
      auVar143._8_4_ = 0x7f800000;
      auVar143._0_8_ = 0x7f8000007f800000;
      auVar143._12_4_ = 0x7f800000;
      auVar143._16_4_ = 0x7f800000;
      auVar143._20_4_ = 0x7f800000;
      auVar143._24_4_ = 0x7f800000;
      auVar143._28_4_ = 0x7f800000;
      auVar453._8_4_ = 0xff800000;
      auVar453._0_8_ = 0xff800000ff800000;
      auVar453._12_4_ = 0xff800000;
      auVar453._16_4_ = 0xff800000;
      auVar453._20_4_ = 0xff800000;
      auVar453._24_4_ = 0xff800000;
      auVar453._28_4_ = 0xff800000;
    }
    else {
      auVar139 = vsqrtps_avx(auVar36);
      auVar312._0_4_ = fVar443 + fVar443;
      auVar312._4_4_ = fVar445 + fVar445;
      auVar312._8_4_ = fVar447 + fVar447;
      auVar312._12_4_ = fVar198 + fVar198;
      auVar312._16_4_ = fVar199 + fVar199;
      auVar312._20_4_ = fVar200 + fVar200;
      auVar312._24_4_ = fVar375 + fVar375;
      auVar312._28_4_ = fVar158 + fVar158;
      auVar39 = vrcpps_avx(auVar312);
      auVar40 = vcmpps_avx(auVar36,ZEXT432(0) << 0x20,5);
      fVar304 = auVar39._0_4_;
      fVar316 = auVar39._4_4_;
      auVar70._4_4_ = auVar312._4_4_ * fVar316;
      auVar70._0_4_ = auVar312._0_4_ * fVar304;
      fVar317 = auVar39._8_4_;
      auVar70._8_4_ = auVar312._8_4_ * fVar317;
      fVar318 = auVar39._12_4_;
      auVar70._12_4_ = auVar312._12_4_ * fVar318;
      fVar319 = auVar39._16_4_;
      auVar70._16_4_ = auVar312._16_4_ * fVar319;
      fVar320 = auVar39._20_4_;
      auVar70._20_4_ = auVar312._20_4_ * fVar320;
      fVar321 = auVar39._24_4_;
      auVar70._24_4_ = auVar312._24_4_ * fVar321;
      auVar70._28_4_ = auVar312._28_4_;
      auVar144._8_4_ = 0x3f800000;
      auVar144._0_8_ = &DAT_3f8000003f800000;
      auVar144._12_4_ = 0x3f800000;
      auVar144._16_4_ = 0x3f800000;
      auVar144._20_4_ = 0x3f800000;
      auVar144._24_4_ = 0x3f800000;
      auVar144._28_4_ = 0x3f800000;
      auVar36 = vsubps_avx(auVar144,auVar70);
      fVar304 = fVar304 + fVar304 * auVar36._0_4_;
      fVar316 = fVar316 + fVar316 * auVar36._4_4_;
      fVar317 = fVar317 + fVar317 * auVar36._8_4_;
      fVar318 = fVar318 + fVar318 * auVar36._12_4_;
      fVar319 = fVar319 + fVar319 * auVar36._16_4_;
      fVar320 = fVar320 + fVar320 * auVar36._20_4_;
      fVar321 = fVar321 + fVar321 * auVar36._24_4_;
      auVar329._0_8_ = CONCAT44(fVar437,fVar427) ^ 0x8000000080000000;
      auVar329._8_4_ = -local_240._8_4_;
      auVar329._12_4_ = -local_240._12_4_;
      auVar329._16_4_ = -local_240._16_4_;
      auVar329._20_4_ = -local_240._20_4_;
      auVar329._24_4_ = -local_240._24_4_;
      auVar329._28_4_ = -local_240._28_4_;
      auVar140 = vsubps_avx(auVar329,auVar139);
      fVar427 = auVar140._0_4_ * fVar304;
      fVar437 = auVar140._4_4_ * fVar316;
      auVar71._4_4_ = fVar437;
      auVar71._0_4_ = fVar427;
      fVar337 = auVar140._8_4_ * fVar317;
      auVar71._8_4_ = fVar337;
      fVar339 = auVar140._12_4_ * fVar318;
      auVar71._12_4_ = fVar339;
      fVar341 = auVar140._16_4_ * fVar319;
      auVar71._16_4_ = fVar341;
      fVar343 = auVar140._20_4_ * fVar320;
      auVar71._20_4_ = fVar343;
      fVar345 = auVar140._24_4_ * fVar321;
      auVar71._24_4_ = fVar345;
      auVar71._28_4_ = auVar140._28_4_;
      auVar139 = vsubps_avx(auVar139,local_240);
      fVar304 = auVar139._0_4_ * fVar304;
      fVar316 = auVar139._4_4_ * fVar316;
      auVar72._4_4_ = fVar316;
      auVar72._0_4_ = fVar304;
      fVar317 = auVar139._8_4_ * fVar317;
      auVar72._8_4_ = fVar317;
      fVar318 = auVar139._12_4_ * fVar318;
      auVar72._12_4_ = fVar318;
      fVar319 = auVar139._16_4_ * fVar319;
      auVar72._16_4_ = fVar319;
      fVar320 = auVar139._20_4_ * fVar320;
      auVar72._20_4_ = fVar320;
      fVar321 = auVar139._24_4_ * fVar321;
      auVar72._24_4_ = fVar321;
      auVar72._28_4_ = auVar139._28_4_;
      fStack_4a4 = fVar468 + auVar39._28_4_ + auVar36._28_4_;
      local_4c0[0] = fVar280 * (fVar450 + fVar127 * fVar427);
      local_4c0[1] = fVar293 * (fVar457 + fVar425 * fVar437);
      local_4c0[2] = fVar295 * (fVar459 + fVar278 * fVar337);
      local_4c0[3] = fVar297 * (fVar461 + fVar435 * fVar339);
      fStack_4b0 = fVar299 * (fVar463 + fVar156 * fVar341);
      fStack_4ac = fVar301 * (fVar465 + fVar438 * fVar343);
      fStack_4a8 = fVar303 * (fVar467 + fVar441 * fVar345);
      local_4e0[0] = fVar280 * (fVar450 + fVar127 * fVar304);
      local_4e0[1] = fVar293 * (fVar457 + fVar425 * fVar316);
      local_4e0[2] = fVar295 * (fVar459 + fVar278 * fVar317);
      local_4e0[3] = fVar297 * (fVar461 + fVar435 * fVar318);
      fStack_4d0 = fVar299 * (fVar463 + fVar156 * fVar319);
      fStack_4cc = fVar301 * (fVar465 + fVar438 * fVar320);
      fStack_4c8 = fVar303 * (fVar467 + fVar441 * fVar321);
      fStack_4c4 = fVar468 + fStack_4a4;
      auVar313._8_4_ = 0x7f800000;
      auVar313._0_8_ = 0x7f8000007f800000;
      auVar313._12_4_ = 0x7f800000;
      auVar313._16_4_ = 0x7f800000;
      auVar313._20_4_ = 0x7f800000;
      auVar313._24_4_ = 0x7f800000;
      auVar313._28_4_ = 0x7f800000;
      auVar143 = vblendvps_avx(auVar313,auVar71,auVar40);
      auVar330._8_4_ = 0x7fffffff;
      auVar330._0_8_ = 0x7fffffff7fffffff;
      auVar330._12_4_ = 0x7fffffff;
      auVar330._16_4_ = 0x7fffffff;
      auVar330._20_4_ = 0x7fffffff;
      auVar330._24_4_ = 0x7fffffff;
      auVar330._28_4_ = 0x7fffffff;
      auVar36 = vandps_avx(auVar67,auVar330);
      auVar36 = vmaxps_avx(local_480,auVar36);
      auVar354 = ZEXT3264(CONCAT428(0x36000000,
                                    CONCAT424(0x36000000,
                                              CONCAT420(0x36000000,
                                                        CONCAT416(0x36000000,
                                                                  CONCAT412(0x36000000,
                                                                            CONCAT48(0x36000000,
                                                                                                                                                                          
                                                  0x3600000036000000)))))));
      auVar73._4_4_ = auVar36._4_4_ * 1.9073486e-06;
      auVar73._0_4_ = auVar36._0_4_ * 1.9073486e-06;
      auVar73._8_4_ = auVar36._8_4_ * 1.9073486e-06;
      auVar73._12_4_ = auVar36._12_4_ * 1.9073486e-06;
      auVar73._16_4_ = auVar36._16_4_ * 1.9073486e-06;
      auVar73._20_4_ = auVar36._20_4_ * 1.9073486e-06;
      auVar73._24_4_ = auVar36._24_4_ * 1.9073486e-06;
      auVar73._28_4_ = auVar36._28_4_;
      auVar36 = vandps_avx(local_4a0,auVar330);
      auVar36 = vcmpps_avx(auVar36,auVar73,1);
      auVar314._8_4_ = 0xff800000;
      auVar314._0_8_ = 0xff800000ff800000;
      auVar314._12_4_ = 0xff800000;
      auVar314._16_4_ = 0xff800000;
      auVar314._20_4_ = 0xff800000;
      auVar314._24_4_ = 0xff800000;
      auVar314._28_4_ = 0xff800000;
      auVar453 = vblendvps_avx(auVar314,auVar72,auVar40);
      auVar39 = auVar40 & auVar36;
      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar39 >> 0x7f,0) != '\0') ||
            (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar39 >> 0xbf,0) != '\0') ||
          (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar39[0x1f] < '\0') {
        auVar149 = vandps_avx(auVar36,auVar40);
        auVar172 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
        auVar98 = ZEXT812(0);
        auVar354 = ZEXT1264(auVar98) << 0x20;
        auVar36 = vcmpps_avx(auVar33,ZEXT1232(auVar98) << 0x20,2);
        auVar384._8_4_ = 0xff800000;
        auVar384._0_8_ = 0xff800000ff800000;
        auVar384._12_4_ = 0xff800000;
        auVar384._16_4_ = 0xff800000;
        auVar384._20_4_ = 0xff800000;
        auVar384._24_4_ = 0xff800000;
        auVar384._28_4_ = 0xff800000;
        auVar433._8_4_ = 0x7f800000;
        auVar433._0_8_ = 0x7f8000007f800000;
        auVar433._12_4_ = 0x7f800000;
        auVar433._16_4_ = 0x7f800000;
        auVar433._20_4_ = 0x7f800000;
        auVar433._24_4_ = 0x7f800000;
        auVar433._28_4_ = 0x7f800000;
        auVar33 = vblendvps_avx(auVar433,auVar384,auVar36);
        auVar135 = vpmovsxwd_avx(auVar172);
        auVar172 = vpunpckhwd_avx(auVar172,auVar172);
        auVar291._16_16_ = auVar172;
        auVar291._0_16_ = auVar135;
        auVar143 = vblendvps_avx(auVar143,auVar33,auVar291);
        auVar33 = vblendvps_avx(auVar384,auVar433,auVar36);
        auVar453 = vblendvps_avx(auVar453,auVar33,auVar291);
        auVar33 = vcmpps_avx(ZEXT1232(auVar98) << 0x20,ZEXT1232(auVar98) << 0x20,0xf);
        auVar191._0_4_ = auVar149._0_4_ ^ auVar33._0_4_;
        auVar191._4_4_ = auVar149._4_4_ ^ auVar33._4_4_;
        auVar191._8_4_ = auVar149._8_4_ ^ auVar33._8_4_;
        auVar191._12_4_ = auVar149._12_4_ ^ auVar33._12_4_;
        auVar191._16_4_ = auVar149._16_4_ ^ auVar33._16_4_;
        auVar191._20_4_ = auVar149._20_4_ ^ auVar33._20_4_;
        auVar191._24_4_ = auVar149._24_4_ ^ auVar33._24_4_;
        auVar191._28_4_ = auVar149._28_4_ ^ auVar33._28_4_;
        auVar149 = vorps_avx(auVar36,auVar191);
        auVar149 = vandps_avx(auVar40,auVar149);
      }
    }
    auVar33 = local_460 & auVar149;
    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar33 >> 0x7f,0) == '\0') &&
          (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar33 >> 0xbf,0) == '\0') &&
        (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar33[0x1f]) {
LAB_012812d1:
      auVar385 = ZEXT3264(local_7a0);
      auVar269 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    else {
      local_2a0 = auVar32;
      auVar172 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_830._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_830._0_4_)),0);
      auVar218._16_16_ = auVar172;
      auVar218._0_16_ = auVar172;
      auVar39 = vminps_avx(auVar218,auVar453);
      fVar319 = local_ae0._28_4_;
      auVar145._0_4_ =
           (float)local_a00._0_4_ * fVar322 +
           (float)local_8c0._0_4_ * fVar404 + fVar426 * (float)local_920._0_4_;
      auVar145._4_4_ =
           (float)local_a00._4_4_ * fVar335 +
           (float)local_8c0._4_4_ * fVar412 + fVar436 * (float)local_920._4_4_;
      auVar145._8_4_ = fStack_9f8 * fVar336 + fStack_8b8 * fVar415 + fVar439 * fStack_918;
      auVar145._12_4_ = fStack_9f4 * fVar338 + fStack_8b4 * fVar418 + fVar442 * fStack_914;
      auVar145._16_4_ = fStack_9f0 * fVar340 + fStack_8b0 * fVar420 + fVar444 * fStack_910;
      auVar145._20_4_ = fStack_9ec * fVar342 + fStack_8ac * fVar422 + fVar446 * fStack_90c;
      auVar145._24_4_ = fStack_9e8 * fVar344 + fStack_8a8 * fVar424 + fVar448 * fStack_908;
      auVar145._28_4_ = fVar346 + local_460._28_4_ + fVar319;
      auVar33 = vrcpps_avx(auVar145);
      fVar346 = auVar33._0_4_;
      fVar427 = auVar33._4_4_;
      auVar74._4_4_ = auVar145._4_4_ * fVar427;
      auVar74._0_4_ = auVar145._0_4_ * fVar346;
      fVar437 = auVar33._8_4_;
      auVar74._8_4_ = auVar145._8_4_ * fVar437;
      fVar304 = auVar33._12_4_;
      auVar74._12_4_ = auVar145._12_4_ * fVar304;
      fVar316 = auVar33._16_4_;
      auVar74._16_4_ = auVar145._16_4_ * fVar316;
      fVar317 = auVar33._20_4_;
      auVar74._20_4_ = auVar145._20_4_ * fVar317;
      fVar318 = auVar33._24_4_;
      auVar74._24_4_ = auVar145._24_4_ * fVar318;
      auVar74._28_4_ = local_460._28_4_;
      auVar383._8_4_ = 0x3f800000;
      auVar383._0_8_ = &DAT_3f8000003f800000;
      auVar383._12_4_ = 0x3f800000;
      auVar383._16_4_ = 0x3f800000;
      auVar383._20_4_ = 0x3f800000;
      auVar383._24_4_ = 0x3f800000;
      auVar383._28_4_ = 0x3f800000;
      auVar40 = vsubps_avx(auVar383,auVar74);
      auVar331._8_4_ = 0x7fffffff;
      auVar331._0_8_ = 0x7fffffff7fffffff;
      auVar331._12_4_ = 0x7fffffff;
      auVar331._16_4_ = 0x7fffffff;
      auVar331._20_4_ = 0x7fffffff;
      auVar331._24_4_ = 0x7fffffff;
      auVar331._28_4_ = 0x7fffffff;
      auVar33 = vandps_avx(auVar145,auVar331);
      auVar362._8_4_ = 0x219392ef;
      auVar362._0_8_ = 0x219392ef219392ef;
      auVar362._12_4_ = 0x219392ef;
      auVar362._16_4_ = 0x219392ef;
      auVar362._20_4_ = 0x219392ef;
      auVar362._24_4_ = 0x219392ef;
      auVar362._28_4_ = 0x219392ef;
      auVar36 = vcmpps_avx(auVar33,auVar362,1);
      auVar75._4_4_ =
           (fVar427 + fVar427 * auVar40._4_4_) *
           -(fVar335 * fVar471 + fVar412 * fVar272 + fVar436 * fVar270);
      auVar75._0_4_ =
           (fVar346 + fVar346 * auVar40._0_4_) *
           -(fVar322 * fVar469 + fVar404 * fVar227 + fVar426 * fVar251);
      auVar75._8_4_ =
           (fVar437 + fVar437 * auVar40._8_4_) *
           -(fVar336 * fVar472 + fVar415 * fVar292 + fVar439 * fVar279);
      auVar75._12_4_ =
           (fVar304 + fVar304 * auVar40._12_4_) *
           -(fVar338 * fVar473 + fVar418 * fVar356 + fVar442 * fVar302);
      auVar75._16_4_ =
           (fVar316 + fVar316 * auVar40._16_4_) *
           -(fVar340 * fVar474 + fVar420 * fVar373 + fVar444 * fVar371);
      auVar75._20_4_ =
           (fVar317 + fVar317 * auVar40._20_4_) *
           -(fVar342 * fVar475 + fVar422 * fVar273 + fVar446 * fVar271);
      auVar75._24_4_ =
           (fVar318 + fVar318 * auVar40._24_4_) *
           -(fVar344 * fVar476 + fVar424 * fVar423 + fVar448 * fVar421);
      auVar75._28_4_ = -(fVar319 + local_9a0._28_4_ + fVar319);
      auVar172 = ZEXT816(0) << 0x40;
      auVar354 = ZEXT1664(auVar172);
      auVar33 = vcmpps_avx(auVar145,ZEXT1632(auVar172),1);
      auVar33 = vorps_avx(auVar36,auVar33);
      auVar432._8_4_ = 0xff800000;
      auVar432._0_8_ = 0xff800000ff800000;
      auVar432._12_4_ = 0xff800000;
      auVar432._16_4_ = 0xff800000;
      auVar432._20_4_ = 0xff800000;
      auVar432._24_4_ = 0xff800000;
      auVar432._28_4_ = 0xff800000;
      auVar33 = vblendvps_avx(auVar75,auVar432,auVar33);
      auVar40 = vcmpps_avx(auVar145,ZEXT1632(auVar172),6);
      auVar36 = vorps_avx(auVar36,auVar40);
      auVar454._8_4_ = 0x7f800000;
      auVar454._0_8_ = 0x7f8000007f800000;
      auVar454._12_4_ = 0x7f800000;
      auVar454._16_4_ = 0x7f800000;
      auVar454._20_4_ = 0x7f800000;
      auVar454._24_4_ = 0x7f800000;
      auVar454._28_4_ = 0x7f800000;
      auVar36 = vblendvps_avx(auVar75,auVar454,auVar36);
      auVar40 = vmaxps_avx(local_260,auVar143);
      auVar40 = vmaxps_avx(auVar40,auVar33);
      auVar36 = vminps_avx(auVar39,auVar36);
      auVar176 = ZEXT1632(auVar172);
      auVar33 = vsubps_avx(auVar176,local_a60);
      auVar39 = vsubps_avx(auVar176,_local_9e0);
      auVar76._4_4_ = auVar39._4_4_ * -fVar396;
      auVar76._0_4_ = auVar39._0_4_ * -fVar387;
      auVar76._8_4_ = auVar39._8_4_ * -fVar397;
      auVar76._12_4_ = auVar39._12_4_ * -fVar398;
      auVar76._16_4_ = auVar39._16_4_ * -fVar399;
      auVar76._20_4_ = auVar39._20_4_ * -fVar400;
      auVar76._24_4_ = auVar39._24_4_ * -fVar401;
      auVar76._28_4_ = auVar39._28_4_;
      auVar77._4_4_ = fVar456 * auVar33._4_4_;
      auVar77._0_4_ = fVar449 * auVar33._0_4_;
      auVar77._8_4_ = fVar458 * auVar33._8_4_;
      auVar77._12_4_ = fVar460 * auVar33._12_4_;
      auVar77._16_4_ = fVar462 * auVar33._16_4_;
      auVar77._20_4_ = fVar464 * auVar33._20_4_;
      auVar77._24_4_ = fVar466 * auVar33._24_4_;
      auVar77._28_4_ = auVar33._28_4_;
      auVar33 = vsubps_avx(auVar76,auVar77);
      auVar315 = vsubps_avx(auVar176,auVar315);
      auVar78._4_4_ = fVar255 * auVar315._4_4_;
      auVar78._0_4_ = fVar197 * auVar315._0_4_;
      auVar78._8_4_ = fVar277 * auVar315._8_4_;
      auVar78._12_4_ = fVar300 * auVar315._12_4_;
      auVar78._16_4_ = fVar369 * auVar315._16_4_;
      auVar78._20_4_ = fVar411 * auVar315._20_4_;
      uVar8 = auVar315._28_4_;
      auVar78._24_4_ = fVar419 * auVar315._24_4_;
      auVar78._28_4_ = uVar8;
      auVar39 = vsubps_avx(auVar33,auVar78);
      auVar79._4_4_ = -fVar396 * (float)local_920._4_4_;
      auVar79._0_4_ = -fVar387 * (float)local_920._0_4_;
      auVar79._8_4_ = -fVar397 * fStack_918;
      auVar79._12_4_ = -fVar398 * fStack_914;
      auVar79._16_4_ = -fVar399 * fStack_910;
      auVar79._20_4_ = -fVar400 * fStack_90c;
      auVar79._24_4_ = -fVar401 * fStack_908;
      auVar79._28_4_ = local_ac0._28_4_ ^ 0x80000000;
      auVar80._4_4_ = (float)local_8c0._4_4_ * fVar456;
      auVar80._0_4_ = (float)local_8c0._0_4_ * fVar449;
      auVar80._8_4_ = fStack_8b8 * fVar458;
      auVar80._12_4_ = fStack_8b4 * fVar460;
      auVar80._16_4_ = fStack_8b0 * fVar462;
      auVar80._20_4_ = fStack_8ac * fVar464;
      auVar80._24_4_ = fStack_8a8 * fVar466;
      auVar80._28_4_ = uVar8;
      auVar394._8_4_ = 0x3f800000;
      auVar394._0_8_ = &DAT_3f8000003f800000;
      auVar394._12_4_ = 0x3f800000;
      auVar394._16_4_ = 0x3f800000;
      auVar394._20_4_ = 0x3f800000;
      auVar394._24_4_ = 0x3f800000;
      auVar394._28_4_ = 0x3f800000;
      auVar395 = ZEXT3264(auVar394);
      auVar33 = vsubps_avx(auVar79,auVar80);
      auVar81._4_4_ = (float)local_a00._4_4_ * fVar255;
      auVar81._0_4_ = (float)local_a00._0_4_ * fVar197;
      auVar81._8_4_ = fStack_9f8 * fVar277;
      auVar81._12_4_ = fStack_9f4 * fVar300;
      auVar81._16_4_ = fStack_9f0 * fVar369;
      auVar81._20_4_ = fStack_9ec * fVar411;
      auVar81._24_4_ = fStack_9e8 * fVar419;
      auVar81._28_4_ = uVar8;
      auVar139 = vsubps_avx(auVar33,auVar81);
      auVar33 = vrcpps_avx(auVar139);
      fVar197 = auVar33._0_4_;
      fVar251 = auVar33._4_4_;
      auVar82._4_4_ = auVar139._4_4_ * fVar251;
      auVar82._0_4_ = auVar139._0_4_ * fVar197;
      fVar227 = auVar33._8_4_;
      auVar82._8_4_ = auVar139._8_4_ * fVar227;
      fVar255 = auVar33._12_4_;
      auVar82._12_4_ = auVar139._12_4_ * fVar255;
      fVar270 = auVar33._16_4_;
      auVar82._16_4_ = auVar139._16_4_ * fVar270;
      fVar272 = auVar33._20_4_;
      auVar82._20_4_ = auVar139._20_4_ * fVar272;
      fVar277 = auVar33._24_4_;
      auVar82._24_4_ = auVar139._24_4_ * fVar277;
      auVar82._28_4_ = fStack_9e4;
      auVar140 = vsubps_avx(auVar394,auVar82);
      auVar146._8_4_ = 0x7fffffff;
      auVar146._0_8_ = 0x7fffffff7fffffff;
      auVar146._12_4_ = 0x7fffffff;
      auVar146._16_4_ = 0x7fffffff;
      auVar146._20_4_ = 0x7fffffff;
      auVar146._24_4_ = 0x7fffffff;
      auVar146._28_4_ = 0x7fffffff;
      auVar33 = vandps_avx(auVar139,auVar146);
      auVar315 = vcmpps_avx(auVar33,auVar362,1);
      auVar83._4_4_ = (fVar251 + fVar251 * auVar140._4_4_) * -auVar39._4_4_;
      auVar83._0_4_ = (fVar197 + fVar197 * auVar140._0_4_) * -auVar39._0_4_;
      auVar83._8_4_ = (fVar227 + fVar227 * auVar140._8_4_) * -auVar39._8_4_;
      auVar83._12_4_ = (fVar255 + fVar255 * auVar140._12_4_) * -auVar39._12_4_;
      auVar83._16_4_ = (fVar270 + fVar270 * auVar140._16_4_) * -auVar39._16_4_;
      auVar83._20_4_ = (fVar272 + fVar272 * auVar140._20_4_) * -auVar39._20_4_;
      auVar83._24_4_ = (fVar277 + fVar277 * auVar140._24_4_) * -auVar39._24_4_;
      auVar83._28_4_ = auVar39._28_4_ ^ 0x80000000;
      auVar33 = vcmpps_avx(auVar139,auVar176,1);
      auVar33 = vorps_avx(auVar315,auVar33);
      auVar33 = vblendvps_avx(auVar83,auVar432,auVar33);
      _local_580 = vmaxps_avx(auVar40,auVar33);
      auVar33 = vcmpps_avx(auVar139,ZEXT832(0) << 0x20,6);
      auVar33 = vorps_avx(auVar315,auVar33);
      auVar33 = vblendvps_avx(auVar83,auVar454,auVar33);
      auVar149 = vandps_avx(auVar149,local_460);
      local_2c0 = vminps_avx(auVar36,auVar33);
      auVar33 = vcmpps_avx(_local_580,local_2c0,2);
      auVar315 = auVar149 & auVar33;
      if ((((((((auVar315 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar315 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar315 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar315 >> 0x7f,0) == '\0') &&
            (auVar315 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar315 >> 0xbf,0) == '\0') &&
          (auVar315 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar315[0x1f]) {
        auVar269 = ZEXT3264(auVar394);
        auVar385 = ZEXT3264(local_7a0);
      }
      else {
        auVar315 = vminps_avx(local_760,auVar179);
        auVar36 = vminps_avx(local_780,auVar34);
        auVar315 = vminps_avx(auVar315,auVar36);
        auVar315 = vsubps_avx(auVar315,auVar434);
        auVar149 = vandps_avx(auVar33,auVar149);
        auVar115._4_4_ = local_4c0[1];
        auVar115._0_4_ = local_4c0[0];
        auVar115._8_4_ = local_4c0[2];
        auVar115._12_4_ = local_4c0[3];
        auVar115._16_4_ = fStack_4b0;
        auVar115._20_4_ = fStack_4ac;
        auVar115._24_4_ = fStack_4a8;
        auVar115._28_4_ = fStack_4a4;
        auVar33 = vminps_avx(auVar115,auVar394);
        auVar33 = vmaxps_avx(auVar33,ZEXT832(0) << 0x20);
        local_4c0[0] = fVar126 + fVar157 * (auVar33._0_4_ + 0.0) * 0.125;
        local_4c0[1] = fVar154 + fVar193 * (auVar33._4_4_ + 1.0) * 0.125;
        local_4c0[2] = fVar155 + fVar194 * (auVar33._8_4_ + 2.0) * 0.125;
        local_4c0[3] = fStack_b64 + fVar196 * (auVar33._12_4_ + 3.0) * 0.125;
        fStack_4b0 = fVar126 + fVar157 * (auVar33._16_4_ + 4.0) * 0.125;
        fStack_4ac = fVar154 + fVar193 * (auVar33._20_4_ + 5.0) * 0.125;
        fStack_4a8 = fVar155 + fVar194 * (auVar33._24_4_ + 6.0) * 0.125;
        fStack_4a4 = fStack_b64 + auVar33._28_4_ + 7.0;
        auVar114._4_4_ = local_4e0[1];
        auVar114._0_4_ = local_4e0[0];
        auVar114._8_4_ = local_4e0[2];
        auVar114._12_4_ = local_4e0[3];
        auVar114._16_4_ = fStack_4d0;
        auVar114._20_4_ = fStack_4cc;
        auVar114._24_4_ = fStack_4c8;
        auVar114._28_4_ = fStack_4c4;
        auVar33 = vminps_avx(auVar114,auVar394);
        auVar33 = vmaxps_avx(auVar33,ZEXT832(0) << 0x20);
        local_4e0[0] = fVar126 + fVar157 * (auVar33._0_4_ + 0.0) * 0.125;
        local_4e0[1] = fVar154 + fVar193 * (auVar33._4_4_ + 1.0) * 0.125;
        local_4e0[2] = fVar155 + fVar194 * (auVar33._8_4_ + 2.0) * 0.125;
        local_4e0[3] = fStack_b64 + fVar196 * (auVar33._12_4_ + 3.0) * 0.125;
        fStack_4d0 = fVar126 + fVar157 * (auVar33._16_4_ + 4.0) * 0.125;
        fStack_4cc = fVar154 + fVar193 * (auVar33._20_4_ + 5.0) * 0.125;
        fStack_4c8 = fVar155 + fVar194 * (auVar33._24_4_ + 6.0) * 0.125;
        fStack_4c4 = fStack_b64 + auVar33._28_4_ + 7.0;
        auVar85._4_4_ = auVar315._4_4_ * 0.99999976;
        auVar85._0_4_ = auVar315._0_4_ * 0.99999976;
        auVar85._8_4_ = auVar315._8_4_ * 0.99999976;
        auVar85._12_4_ = auVar315._12_4_ * 0.99999976;
        auVar85._16_4_ = auVar315._16_4_ * 0.99999976;
        auVar85._20_4_ = auVar315._20_4_ * 0.99999976;
        auVar85._24_4_ = auVar315._24_4_ * 0.99999976;
        auVar85._28_4_ = 0x3f7ffffc;
        auVar33 = vmaxps_avx(ZEXT832(0) << 0x20,auVar85);
        auVar86._4_4_ = auVar33._4_4_ * auVar33._4_4_;
        auVar86._0_4_ = auVar33._0_4_ * auVar33._0_4_;
        auVar86._8_4_ = auVar33._8_4_ * auVar33._8_4_;
        auVar86._12_4_ = auVar33._12_4_ * auVar33._12_4_;
        auVar86._16_4_ = auVar33._16_4_ * auVar33._16_4_;
        auVar86._20_4_ = auVar33._20_4_ * auVar33._20_4_;
        auVar86._24_4_ = auVar33._24_4_ * auVar33._24_4_;
        auVar86._28_4_ = auVar33._28_4_;
        auVar315 = vsubps_avx(auVar37,auVar86);
        auVar87._4_4_ = auVar315._4_4_ * fVar445 * 4.0;
        auVar87._0_4_ = auVar315._0_4_ * fVar443 * 4.0;
        auVar87._8_4_ = auVar315._8_4_ * fVar447 * 4.0;
        auVar87._12_4_ = auVar315._12_4_ * fVar198 * 4.0;
        auVar87._16_4_ = auVar315._16_4_ * fVar199 * 4.0;
        auVar87._20_4_ = auVar315._20_4_ * fVar200 * 4.0;
        auVar87._24_4_ = auVar315._24_4_ * fVar375 * 4.0;
        auVar87._28_4_ = auVar33._28_4_;
        auVar434 = vsubps_avx(auVar68,auVar87);
        local_a80 = vcmpps_avx(auVar434,ZEXT832(0) << 0x20,5);
        auVar33 = local_a80;
        if ((((((((local_a80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_a80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_a80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_a80 >> 0x7f,0) == '\0') &&
              (local_a80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_a80 >> 0xbf,0) == '\0') &&
            (local_a80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_a80[0x1f]) {
          _local_800 = ZEXT832(0) << 0x20;
          _local_600 = ZEXT832(0) << 0x20;
          auVar241 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar265 = ZEXT828(0) << 0x20;
          auVar354 = ZEXT864(0) << 0x20;
          auVar220._8_4_ = 0x7f800000;
          auVar220._0_8_ = 0x7f8000007f800000;
          auVar220._12_4_ = 0x7f800000;
          auVar220._16_4_ = 0x7f800000;
          auVar220._20_4_ = 0x7f800000;
          auVar220._24_4_ = 0x7f800000;
          auVar220._28_4_ = 0x7f800000;
          auVar285._8_4_ = 0xff800000;
          auVar285._0_8_ = 0xff800000ff800000;
          auVar285._12_4_ = 0xff800000;
          auVar285._16_4_ = 0xff800000;
          auVar285._20_4_ = 0xff800000;
          auVar285._24_4_ = 0xff800000;
          auVar285._28_4_ = 0xff800000;
          local_a80 = auVar45;
          _local_7e0 = _local_800;
        }
        else {
          auVar37 = vsqrtps_avx(auVar434);
          auVar266._0_4_ = fVar443 + fVar443;
          auVar266._4_4_ = fVar445 + fVar445;
          auVar266._8_4_ = fVar447 + fVar447;
          auVar266._12_4_ = fVar198 + fVar198;
          auVar266._16_4_ = fVar199 + fVar199;
          auVar266._20_4_ = fVar200 + fVar200;
          auVar266._24_4_ = fVar375 + fVar375;
          auVar266._28_4_ = fVar158 + fVar158;
          auVar36 = vrcpps_avx(auVar266);
          fVar158 = auVar36._0_4_;
          fVar197 = auVar36._4_4_;
          auVar88._4_4_ = auVar266._4_4_ * fVar197;
          auVar88._0_4_ = auVar266._0_4_ * fVar158;
          fVar251 = auVar36._8_4_;
          auVar88._8_4_ = auVar266._8_4_ * fVar251;
          fVar227 = auVar36._12_4_;
          auVar88._12_4_ = auVar266._12_4_ * fVar227;
          fVar255 = auVar36._16_4_;
          auVar88._16_4_ = auVar266._16_4_ * fVar255;
          fVar270 = auVar36._20_4_;
          auVar88._20_4_ = auVar266._20_4_ * fVar270;
          fVar272 = auVar36._24_4_;
          auVar88._24_4_ = auVar266._24_4_ * fVar272;
          auVar88._28_4_ = auVar266._28_4_;
          auVar40 = vsubps_avx(auVar394,auVar88);
          fVar158 = fVar158 + fVar158 * auVar40._0_4_;
          fVar197 = fVar197 + fVar197 * auVar40._4_4_;
          fVar251 = fVar251 + fVar251 * auVar40._8_4_;
          fVar227 = fVar227 + fVar227 * auVar40._12_4_;
          fVar255 = fVar255 + fVar255 * auVar40._16_4_;
          fVar270 = fVar270 + fVar270 * auVar40._20_4_;
          fVar272 = fVar272 + fVar272 * auVar40._24_4_;
          fVar277 = auVar36._28_4_ + auVar40._28_4_;
          auVar286._0_8_ = local_240._0_8_ ^ 0x8000000080000000;
          auVar286._8_4_ = -local_240._8_4_;
          auVar286._12_4_ = -local_240._12_4_;
          auVar286._16_4_ = -local_240._16_4_;
          auVar286._20_4_ = -local_240._20_4_;
          auVar286._24_4_ = -local_240._24_4_;
          auVar286._28_4_ = -local_240._28_4_;
          auVar36 = vsubps_avx(auVar286,auVar37);
          fVar373 = auVar36._0_4_ * fVar158;
          fVar411 = auVar36._4_4_ * fVar197;
          auVar89._4_4_ = fVar411;
          auVar89._0_4_ = fVar373;
          fVar271 = auVar36._8_4_ * fVar251;
          auVar89._8_4_ = fVar271;
          fVar273 = auVar36._12_4_ * fVar227;
          auVar89._12_4_ = fVar273;
          fVar419 = auVar36._16_4_ * fVar255;
          auVar89._16_4_ = fVar419;
          fVar421 = auVar36._20_4_ * fVar270;
          auVar89._20_4_ = fVar421;
          fVar423 = auVar36._24_4_ * fVar272;
          auVar89._24_4_ = fVar423;
          auVar89._28_4_ = fVar440;
          auVar37 = vsubps_avx(auVar37,local_240);
          fVar158 = auVar37._0_4_ * fVar158;
          fVar197 = auVar37._4_4_ * fVar197;
          auVar90._4_4_ = fVar197;
          auVar90._0_4_ = fVar158;
          fVar251 = auVar37._8_4_ * fVar251;
          auVar90._8_4_ = fVar251;
          fVar227 = auVar37._12_4_ * fVar227;
          auVar90._12_4_ = fVar227;
          fVar255 = auVar37._16_4_ * fVar255;
          auVar90._16_4_ = fVar255;
          fVar270 = auVar37._20_4_ * fVar270;
          auVar90._20_4_ = fVar270;
          fVar272 = auVar37._24_4_ * fVar272;
          auVar90._24_4_ = fVar272;
          auVar90._28_4_ = fVar416;
          fVar279 = fVar280 * (fVar373 * fVar127 + fVar450);
          fVar292 = fVar293 * (fVar411 * fVar425 + fVar457);
          fVar300 = fVar295 * (fVar271 * fVar278 + fVar459);
          fVar302 = fVar297 * (fVar273 * fVar435 + fVar461);
          fVar356 = fVar299 * (fVar419 * fVar156 + fVar463);
          fVar369 = fVar301 * (fVar421 * fVar438 + fVar465);
          fVar371 = fVar303 * (fVar423 * fVar441 + fVar467);
          auVar248._0_4_ = local_9c0 + fVar250 * fVar279;
          auVar248._4_4_ = fStack_9bc + fVar254 * fVar292;
          auVar248._8_4_ = fStack_9b8 + fVar276 * fVar300;
          auVar248._12_4_ = fStack_9b4 + fVar298 * fVar302;
          auVar248._16_4_ = fStack_9b0 + fVar367 * fVar356;
          auVar248._20_4_ = fStack_9ac + fVar403 * fVar369;
          auVar248._24_4_ = fStack_9a8 + fVar417 * fVar371;
          auVar248._28_4_ = fStack_9a4 + auVar37._28_4_ + fVar468;
          auVar91._4_4_ = (float)local_a00._4_4_ * fVar411;
          auVar91._0_4_ = (float)local_a00._0_4_ * fVar373;
          auVar91._8_4_ = fStack_9f8 * fVar271;
          auVar91._12_4_ = fStack_9f4 * fVar273;
          auVar91._16_4_ = fStack_9f0 * fVar419;
          auVar91._20_4_ = fStack_9ec * fVar421;
          auVar91._24_4_ = fStack_9e8 * fVar423;
          auVar91._28_4_ = fVar277;
          _local_9e0 = vsubps_avx(auVar91,auVar248);
          auVar267._0_4_ = fVar357 + fVar249 * fVar279;
          auVar267._4_4_ = fVar364 + fVar252 * fVar292;
          auVar267._8_4_ = fVar366 + fVar274 * fVar300;
          auVar267._12_4_ = fVar368 + fVar294 * fVar302;
          auVar267._16_4_ = fVar370 + fVar363 * fVar356;
          auVar267._20_4_ = fVar372 + fVar386 * fVar369;
          auVar267._24_4_ = fVar374 + fVar413 * fVar371;
          auVar267._28_4_ = fVar376 + fVar277;
          auVar332._0_4_ = (float)local_8c0._0_4_ * fVar373;
          auVar332._4_4_ = (float)local_8c0._4_4_ * fVar411;
          auVar332._8_4_ = fStack_8b8 * fVar271;
          auVar332._12_4_ = fStack_8b4 * fVar273;
          auVar332._16_4_ = fStack_8b0 * fVar419;
          auVar332._20_4_ = fStack_8ac * fVar421;
          auVar332._24_4_ = fStack_8a8 * fVar423;
          auVar332._28_4_ = 0;
          auVar37 = vsubps_avx(auVar332,auVar267);
          auVar287._0_4_ = fVar201 + fVar195 * fVar279;
          auVar287._4_4_ = fVar226 + fVar253 * fVar292;
          auVar287._8_4_ = fVar228 + fVar275 * fVar300;
          auVar287._12_4_ = fVar229 + fVar296 * fVar302;
          auVar287._16_4_ = fVar230 + fVar365 * fVar356;
          auVar287._20_4_ = fVar231 + fVar402 * fVar369;
          auVar287._24_4_ = fVar232 + fVar414 * fVar371;
          auVar287._28_4_ = fVar233 + auVar36._28_4_;
          auVar92._4_4_ = (float)local_920._4_4_ * fVar411;
          auVar92._0_4_ = (float)local_920._0_4_ * fVar373;
          auVar92._8_4_ = fStack_918 * fVar271;
          auVar92._12_4_ = fStack_914 * fVar273;
          auVar92._16_4_ = fStack_910 * fVar419;
          auVar92._20_4_ = fStack_90c * fVar421;
          auVar92._24_4_ = fStack_908 * fVar423;
          auVar92._28_4_ = 0;
          local_980 = vsubps_avx(auVar92,auVar287);
          fVar280 = fVar280 * (fVar158 * fVar127 + fVar450);
          fVar293 = fVar293 * (fVar197 * fVar425 + fVar457);
          fVar295 = fVar295 * (fVar251 * fVar278 + fVar459);
          fVar297 = fVar297 * (fVar227 * fVar435 + fVar461);
          fVar299 = fVar299 * (fVar255 * fVar156 + fVar463);
          fVar301 = fVar301 * (fVar270 * fVar438 + fVar465);
          fVar303 = fVar303 * (fVar272 * fVar441 + fVar467);
          auVar333._0_4_ = local_9c0 + fVar250 * fVar280;
          auVar333._4_4_ = fStack_9bc + fVar254 * fVar293;
          auVar333._8_4_ = fStack_9b8 + fVar276 * fVar295;
          auVar333._12_4_ = fStack_9b4 + fVar298 * fVar297;
          auVar333._16_4_ = fStack_9b0 + fVar367 * fVar299;
          auVar333._20_4_ = fStack_9ac + fVar403 * fVar301;
          auVar333._24_4_ = fStack_9a8 + fVar417 * fVar303;
          auVar333._28_4_ = fStack_9a4 + 0.0;
          auVar93._4_4_ = (float)local_a00._4_4_ * fVar197;
          auVar93._0_4_ = (float)local_a00._0_4_ * fVar158;
          auVar93._8_4_ = fStack_9f8 * fVar251;
          auVar93._12_4_ = fStack_9f4 * fVar227;
          auVar93._16_4_ = fStack_9f0 * fVar255;
          auVar93._20_4_ = fStack_9ec * fVar270;
          auVar93._24_4_ = fStack_9e8 * fVar272;
          auVar93._28_4_ = fStack_9e4;
          _local_7e0 = vsubps_avx(auVar93,auVar333);
          auVar334._0_4_ = fVar357 + fVar249 * fVar280;
          auVar334._4_4_ = fVar364 + fVar252 * fVar293;
          auVar334._8_4_ = fVar366 + fVar274 * fVar295;
          auVar334._12_4_ = fVar368 + fVar294 * fVar297;
          auVar334._16_4_ = fVar370 + fVar363 * fVar299;
          auVar334._20_4_ = fVar372 + fVar386 * fVar301;
          auVar334._24_4_ = fVar374 + fVar413 * fVar303;
          auVar334._28_4_ = fVar376 + local_7e0._28_4_;
          auVar94._4_4_ = (float)local_8c0._4_4_ * fVar197;
          auVar94._0_4_ = (float)local_8c0._0_4_ * fVar158;
          auVar94._8_4_ = fStack_8b8 * fVar251;
          auVar94._12_4_ = fStack_8b4 * fVar227;
          auVar94._16_4_ = fStack_8b0 * fVar255;
          auVar94._20_4_ = fStack_8ac * fVar270;
          auVar94._24_4_ = fStack_8a8 * fVar272;
          auVar94._28_4_ = fStack_9e4;
          _local_800 = vsubps_avx(auVar94,auVar334);
          auVar288._0_4_ = fVar201 + fVar195 * fVar280;
          auVar288._4_4_ = fVar226 + fVar253 * fVar293;
          auVar288._8_4_ = fVar228 + fVar275 * fVar295;
          auVar288._12_4_ = fVar229 + fVar296 * fVar297;
          auVar288._16_4_ = fVar230 + fVar365 * fVar299;
          auVar288._20_4_ = fVar231 + fVar402 * fVar301;
          auVar288._24_4_ = fVar232 + fVar414 * fVar303;
          auVar288._28_4_ = fVar233 + local_980._28_4_ + fVar468;
          auVar95._4_4_ = (float)local_920._4_4_ * fVar197;
          auVar95._0_4_ = (float)local_920._0_4_ * fVar158;
          auVar95._8_4_ = fStack_918 * fVar251;
          auVar95._12_4_ = fStack_914 * fVar227;
          auVar95._16_4_ = fStack_910 * fVar255;
          auVar95._20_4_ = fStack_90c * fVar270;
          auVar95._24_4_ = fStack_908 * fVar272;
          auVar95._28_4_ = local_800._28_4_;
          _local_600 = vsubps_avx(auVar95,auVar288);
          auVar36 = vcmpps_avx(auVar434,_DAT_02020f00,5);
          auVar221._8_4_ = 0x7f800000;
          auVar221._0_8_ = 0x7f8000007f800000;
          auVar221._12_4_ = 0x7f800000;
          auVar221._16_4_ = 0x7f800000;
          auVar221._20_4_ = 0x7f800000;
          auVar221._24_4_ = 0x7f800000;
          auVar221._28_4_ = 0x7f800000;
          auVar220 = vblendvps_avx(auVar221,auVar89,auVar36);
          auVar352._8_4_ = 0x7fffffff;
          auVar352._0_8_ = 0x7fffffff7fffffff;
          auVar352._12_4_ = 0x7fffffff;
          auVar352._16_4_ = 0x7fffffff;
          auVar352._20_4_ = 0x7fffffff;
          auVar352._24_4_ = 0x7fffffff;
          auVar352._28_4_ = 0x7fffffff;
          auVar434 = vandps_avx(auVar352,auVar67);
          auVar434 = vmaxps_avx(local_480,auVar434);
          auVar96._4_4_ = auVar434._4_4_ * 1.9073486e-06;
          auVar96._0_4_ = auVar434._0_4_ * 1.9073486e-06;
          auVar96._8_4_ = auVar434._8_4_ * 1.9073486e-06;
          auVar96._12_4_ = auVar434._12_4_ * 1.9073486e-06;
          auVar96._16_4_ = auVar434._16_4_ * 1.9073486e-06;
          auVar96._20_4_ = auVar434._20_4_ * 1.9073486e-06;
          auVar96._24_4_ = auVar434._24_4_ * 1.9073486e-06;
          auVar96._28_4_ = auVar434._28_4_;
          auVar434 = vandps_avx(auVar352,local_4a0);
          auVar434 = vcmpps_avx(auVar434,auVar96,1);
          auVar289._8_4_ = 0xff800000;
          auVar289._0_8_ = 0xff800000ff800000;
          auVar289._12_4_ = 0xff800000;
          auVar289._16_4_ = 0xff800000;
          auVar289._20_4_ = 0xff800000;
          auVar289._24_4_ = 0xff800000;
          auVar289._28_4_ = 0xff800000;
          auVar285 = vblendvps_avx(auVar289,auVar90,auVar36);
          auVar40 = auVar36 & auVar434;
          if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar40 >> 0x7f,0) != '\0') ||
                (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar40 >> 0xbf,0) != '\0') ||
              (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar40[0x1f] < '\0') {
            auVar33 = vandps_avx(auVar434,auVar36);
            auVar172 = vpackssdw_avx(auVar33._0_16_,auVar33._16_16_);
            auVar434 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar315 = vcmpps_avx(auVar315,auVar434,2);
            auVar455._8_4_ = 0xff800000;
            auVar455._0_8_ = 0xff800000ff800000;
            auVar455._12_4_ = 0xff800000;
            auVar455._16_4_ = 0xff800000;
            auVar455._20_4_ = 0xff800000;
            auVar455._24_4_ = 0xff800000;
            auVar455._28_4_ = 0xff800000;
            auVar470._8_4_ = 0x7f800000;
            auVar470._0_8_ = 0x7f8000007f800000;
            auVar470._12_4_ = 0x7f800000;
            auVar470._16_4_ = 0x7f800000;
            auVar470._20_4_ = 0x7f800000;
            auVar470._24_4_ = 0x7f800000;
            auVar470._28_4_ = 0x7f800000;
            auVar32 = vblendvps_avx(auVar470,auVar455,auVar315);
            auVar135 = vpmovsxwd_avx(auVar172);
            auVar172 = vpunpckhwd_avx(auVar172,auVar172);
            auVar353._16_16_ = auVar172;
            auVar353._0_16_ = auVar135;
            auVar220 = vblendvps_avx(auVar220,auVar32,auVar353);
            auVar32 = vblendvps_avx(auVar455,auVar470,auVar315);
            auVar285 = vblendvps_avx(auVar285,auVar32,auVar353);
            auVar434 = vcmpps_avx(auVar434,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar192._0_4_ = auVar434._0_4_ ^ auVar33._0_4_;
            auVar192._4_4_ = auVar434._4_4_ ^ auVar33._4_4_;
            auVar192._8_4_ = auVar434._8_4_ ^ auVar33._8_4_;
            auVar192._12_4_ = auVar434._12_4_ ^ auVar33._12_4_;
            auVar192._16_4_ = auVar434._16_4_ ^ auVar33._16_4_;
            auVar192._20_4_ = auVar434._20_4_ ^ auVar33._20_4_;
            auVar192._24_4_ = auVar434._24_4_ ^ auVar33._24_4_;
            auVar192._28_4_ = auVar434._28_4_ ^ auVar33._28_4_;
            auVar33 = vorps_avx(auVar315,auVar192);
            auVar33 = vandps_avx(auVar36,auVar33);
          }
          auVar395 = ZEXT3264(auVar32);
          auVar241 = local_9e0._0_28_;
          auVar265 = auVar37._0_28_;
          auVar354 = ZEXT3264(local_980);
          local_a60 = auVar149;
        }
        _local_320 = _local_580;
        local_300 = vminps_avx(local_2c0,auVar220);
        _local_640 = vmaxps_avx(_local_580,auVar285);
        _local_2e0 = _local_640;
        auVar32 = vcmpps_avx(_local_580,local_300,2);
        local_500 = vandps_avx(auVar32,auVar149);
        auVar32 = vcmpps_avx(_local_640,local_2c0,2);
        local_5c0 = vandps_avx(auVar32,auVar149);
        auVar149 = vorps_avx(local_5c0,local_500);
        if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar149 >> 0x7f,0) == '\0') &&
              (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar149 >> 0xbf,0) == '\0') &&
            (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar149[0x1f]) goto LAB_012812d1;
        local_660 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        local_540._0_4_ = auVar33._0_4_ ^ local_660._0_4_;
        local_540._4_4_ = auVar33._4_4_ ^ local_660._4_4_;
        local_540._8_4_ = auVar33._8_4_ ^ local_660._8_4_;
        local_540._12_4_ = auVar33._12_4_ ^ local_660._12_4_;
        local_540._16_4_ = auVar33._16_4_ ^ local_660._16_4_;
        local_540._20_4_ = auVar33._20_4_ ^ local_660._20_4_;
        local_540._24_4_ = auVar33._24_4_ ^ local_660._24_4_;
        local_540._28_4_ = auVar33._28_4_ ^ (uint)local_660._28_4_;
        auVar148._0_4_ =
             (float)local_a00._0_4_ * auVar241._0_4_ +
             (float)local_8c0._0_4_ * auVar265._0_4_ + (float)local_920._0_4_ * auVar354._0_4_;
        auVar148._4_4_ =
             (float)local_a00._4_4_ * auVar241._4_4_ +
             (float)local_8c0._4_4_ * auVar265._4_4_ + (float)local_920._4_4_ * auVar354._4_4_;
        auVar148._8_4_ =
             fStack_9f8 * auVar241._8_4_ + fStack_8b8 * auVar265._8_4_ + fStack_918 * auVar354._8_4_
        ;
        auVar148._12_4_ =
             fStack_9f4 * auVar241._12_4_ +
             fStack_8b4 * auVar265._12_4_ + fStack_914 * auVar354._12_4_;
        auVar148._16_4_ =
             fStack_9f0 * auVar241._16_4_ +
             fStack_8b0 * auVar265._16_4_ + fStack_910 * auVar354._16_4_;
        auVar148._20_4_ =
             fStack_9ec * auVar241._20_4_ +
             fStack_8ac * auVar265._20_4_ + fStack_90c * auVar354._20_4_;
        auVar148._24_4_ =
             fStack_9e8 * auVar241._24_4_ +
             fStack_8a8 * auVar265._24_4_ + fStack_908 * auVar354._24_4_;
        auVar148._28_4_ = local_660._28_4_ + fStack_9e4 + local_500._28_4_;
        auVar180._8_4_ = 0x7fffffff;
        auVar180._0_8_ = 0x7fffffff7fffffff;
        auVar180._12_4_ = 0x7fffffff;
        auVar180._16_4_ = 0x7fffffff;
        auVar180._20_4_ = 0x7fffffff;
        auVar180._24_4_ = 0x7fffffff;
        auVar180._28_4_ = 0x7fffffff;
        auVar149 = vandps_avx(auVar148,auVar180);
        auVar181._8_4_ = 0x3e99999a;
        auVar181._0_8_ = 0x3e99999a3e99999a;
        auVar181._12_4_ = 0x3e99999a;
        auVar181._16_4_ = 0x3e99999a;
        auVar181._20_4_ = 0x3e99999a;
        auVar181._24_4_ = 0x3e99999a;
        auVar181._28_4_ = 0x3e99999a;
        auVar149 = vcmpps_avx(auVar149,auVar181,1);
        auVar149 = vorps_avx(auVar149,local_540);
        auVar182._8_4_ = 3;
        auVar182._0_8_ = 0x300000003;
        auVar182._12_4_ = 3;
        auVar182._16_4_ = 3;
        auVar182._20_4_ = 3;
        auVar182._24_4_ = 3;
        auVar182._28_4_ = 3;
        auVar222._8_4_ = 2;
        auVar222._0_8_ = 0x200000002;
        auVar222._12_4_ = 2;
        auVar222._16_4_ = 2;
        auVar222._20_4_ = 2;
        auVar222._24_4_ = 2;
        auVar222._28_4_ = 2;
        auVar149 = vblendvps_avx(auVar222,auVar182,auVar149);
        local_520 = ZEXT432((uint)uVar125);
        local_560 = vpshufd_avx(ZEXT416((uint)uVar125),0);
        auVar172 = vpcmpgtd_avx(auVar149._16_16_,local_560);
        auStack_550 = auVar35._16_16_;
        auVar135 = vpcmpgtd_avx(auVar149._0_16_,local_560);
        auVar183._16_16_ = auVar172;
        auVar183._0_16_ = auVar135;
        auVar149 = vblendps_avx(ZEXT1632(auVar135),auVar183,0xf0);
        local_5a0 = vandnps_avx(auVar149,local_500);
        auVar269 = ZEXT3264(local_5a0);
        auVar32 = local_500 & ~auVar149;
        auStack_5d8 = auVar34._8_24_;
        local_5e0 = uVar125;
        local_620 = auVar149;
        if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar32 >> 0x7f,0) == '\0') &&
              (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar32 >> 0xbf,0) == '\0') &&
            (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar32[0x1f]) {
          auVar385 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar315 = local_5c0;
          fVar249 = (float)local_920._0_4_;
          fVar195 = (float)local_920._4_4_;
          fVar250 = fStack_918;
          fVar251 = fStack_914;
          fVar227 = fStack_910;
          fVar252 = fStack_90c;
          fVar253 = fStack_908;
          fVar277 = (float)local_a00._0_4_;
          fVar279 = (float)local_a00._4_4_;
          fVar292 = fStack_9f8;
          fVar294 = fStack_9f4;
          fVar296 = fStack_9f0;
          fVar298 = fStack_9ec;
          fVar300 = fStack_9e8;
          fVar254 = (float)local_8c0._0_4_;
          fVar255 = (float)local_8c0._4_4_;
          fVar270 = fStack_8b8;
          fVar272 = fStack_8b4;
          fVar274 = fStack_8b0;
          fVar275 = fStack_8ac;
          fVar276 = fStack_8a8;
        }
        else {
          local_7c0._4_4_ = (float)local_580._4_4_ + (float)local_8a0._4_4_;
          local_7c0._0_4_ = (float)local_580._0_4_ + (float)local_8a0._0_4_;
          fStack_7b8 = fStack_578 + fStack_898;
          fStack_7b4 = fStack_574 + fStack_894;
          fStack_7b0 = fStack_570 + fStack_890;
          fStack_7ac = fStack_56c + fStack_88c;
          fStack_7a8 = fStack_568 + fStack_888;
          fStack_7a4 = fStack_564 + fStack_884;
          auVar385 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_ac0 = local_5c0;
          do {
            auVar257 = auVar385._0_16_;
            auVar184._8_4_ = 0x7f800000;
            auVar184._0_8_ = 0x7f8000007f800000;
            auVar184._12_4_ = 0x7f800000;
            auVar184._16_4_ = 0x7f800000;
            auVar184._20_4_ = 0x7f800000;
            auVar184._24_4_ = 0x7f800000;
            auVar184._28_4_ = 0x7f800000;
            auVar149 = auVar269._0_32_;
            auVar32 = vblendvps_avx(auVar184,_local_580,auVar149);
            auVar33 = vshufps_avx(auVar32,auVar32,0xb1);
            auVar33 = vminps_avx(auVar32,auVar33);
            auVar315 = vshufpd_avx(auVar33,auVar33,5);
            auVar33 = vminps_avx(auVar33,auVar315);
            auVar315 = vperm2f128_avx(auVar33,auVar33,1);
            auVar33 = vminps_avx(auVar33,auVar315);
            auVar32 = vcmpps_avx(auVar32,auVar33,0);
            auVar33 = auVar149 & auVar32;
            if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar33 >> 0x7f,0) != '\0') ||
                  (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar33 >> 0xbf,0) != '\0') ||
                (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar33[0x1f] < '\0') {
              auVar149 = vandps_avx(auVar32,auVar149);
            }
            local_780._0_8_ = uVar120;
            uVar118 = vmovmskps_avx(auVar149);
            uVar117 = 0;
            if (uVar118 != 0) {
              for (; (uVar118 >> uVar117 & 1) == 0; uVar117 = uVar117 + 1) {
              }
            }
            uVar125 = (ulong)uVar117;
            *(undefined4 *)(local_5a0 + uVar125 * 4) = 0;
            fVar158 = local_4c0[uVar125];
            uVar117 = *(uint *)(local_320 + uVar125 * 4);
            fVar249 = local_ae4;
            if ((float)local_880._0_4_ < 0.0) {
              fVar249 = sqrtf((float)local_880._0_4_);
              auVar257._8_4_ = 0x7fffffff;
              auVar257._0_8_ = 0x7fffffff7fffffff;
              auVar257._12_4_ = 0x7fffffff;
            }
            auVar269 = ZEXT464(uVar117);
            auVar395 = ZEXT464((uint)fVar158);
            auVar135 = vminps_avx(_local_a10,_local_a30);
            auVar172 = vmaxps_avx(_local_a10,_local_a30);
            auVar209 = vminps_avx(_local_a20,_local_a40);
            auVar168 = vminps_avx(auVar135,auVar209);
            auVar135 = vmaxps_avx(_local_a20,_local_a40);
            auVar209 = vmaxps_avx(auVar172,auVar135);
            auVar172 = vandps_avx(auVar168,auVar257);
            auVar135 = vandps_avx(auVar209,auVar257);
            auVar172 = vmaxps_avx(auVar172,auVar135);
            auVar135 = vmovshdup_avx(auVar172);
            auVar135 = vmaxss_avx(auVar135,auVar172);
            auVar172 = vshufpd_avx(auVar172,auVar172,1);
            auVar172 = vmaxss_avx(auVar172,auVar135);
            local_9c0 = auVar172._0_4_ * 1.9073486e-06;
            local_740._0_4_ = fVar249 * 1.9073486e-06;
            local_760._0_16_ = vshufps_avx(auVar209,auVar209,0xff);
            lVar121 = 5;
            do {
              auVar172 = vshufps_avx(auVar269._0_16_,auVar269._0_16_,0);
              auVar130._0_4_ = auVar172._0_4_ * (float)local_870._0_4_ + 0.0;
              auVar130._4_4_ = auVar172._4_4_ * (float)local_870._4_4_ + 0.0;
              auVar130._8_4_ = auVar172._8_4_ * fStack_868 + 0.0;
              auVar130._12_4_ = auVar172._12_4_ * fStack_864 + 0.0;
              fVar197 = auVar395._0_4_;
              fVar250 = 1.0 - fVar197;
              fVar249 = fVar197 * fVar197;
              fVar195 = fVar197 * 3.0;
              fVar158 = fVar195 + -5.0;
              auVar172 = ZEXT416((uint)(fVar197 * fVar197 * -fVar250 * 0.5));
              auVar172 = vshufps_avx(auVar172,auVar172,0);
              auVar135 = ZEXT416((uint)((fVar250 * fVar250 * (fVar250 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar135 = vshufps_avx(auVar135,auVar135,0);
              auVar209 = ZEXT416((uint)((fVar249 * fVar158 + 2.0) * 0.5));
              auVar209 = vshufps_avx(auVar209,auVar209,0);
              auVar168 = ZEXT416((uint)(fVar250 * fVar250 * -fVar197 * 0.5));
              auVar168 = vshufps_avx(auVar168,auVar168,0);
              auVar204._0_4_ =
                   auVar168._0_4_ * (float)local_a10._0_4_ +
                   auVar209._0_4_ * (float)local_a30._0_4_ +
                   auVar135._0_4_ * (float)local_a20._0_4_ + auVar172._0_4_ * (float)local_a40._0_4_
              ;
              auVar204._4_4_ =
                   auVar168._4_4_ * (float)local_a10._4_4_ +
                   auVar209._4_4_ * (float)local_a30._4_4_ +
                   auVar135._4_4_ * (float)local_a20._4_4_ + auVar172._4_4_ * (float)local_a40._4_4_
              ;
              auVar204._8_4_ =
                   auVar168._8_4_ * fStack_a08 +
                   auVar209._8_4_ * fStack_a28 +
                   auVar135._8_4_ * fStack_a18 + auVar172._8_4_ * fStack_a38;
              auVar204._12_4_ =
                   auVar168._12_4_ * fStack_a04 +
                   auVar209._12_4_ * fStack_a24 +
                   auVar135._12_4_ * fStack_a14 + auVar172._12_4_ * fStack_a34;
              local_980._0_16_ = auVar204;
              auVar172 = vsubps_avx(auVar130,auVar204);
              _local_9e0 = auVar172;
              auVar172 = vdpps_avx(auVar172,auVar172,0x7f);
              local_a80._0_16_ = ZEXT416((uint)(fVar195 + -1.0));
              local_bc0 = auVar269._0_4_;
              local_a60._0_16_ = auVar172;
              if (auVar172._0_4_ < 0.0) {
                local_aa0._0_4_ = fVar249;
                local_ae0._0_16_ = ZEXT416((uint)fVar250);
                local_9a0._0_4_ = fVar195;
                local_8e0._0_4_ = fVar197 * 9.0;
                local_900._0_4_ = fVar158;
                local_860._0_4_ = fVar250 * -2.0;
                fVar251 = sqrtf(auVar172._0_4_);
                fVar158 = (float)local_900._0_4_;
                fVar252 = (float)local_8e0._0_4_;
                fVar227 = (float)local_860._0_4_;
                fVar195 = (float)local_9a0._0_4_;
                fVar249 = (float)local_ae0._0_4_;
              }
              else {
                auVar172 = vsqrtss_avx(auVar172,auVar172);
                fVar251 = auVar172._0_4_;
                fVar252 = fVar197 * 9.0;
                fVar227 = fVar250 * -2.0;
                local_aa0._0_4_ = fVar249;
                fVar249 = fVar250;
              }
              auVar172 = ZEXT416((uint)(((float)local_aa0._0_4_ + fVar197 * fVar227) * 0.5));
              auVar172 = vshufps_avx(auVar172,auVar172,0);
              auVar135 = ZEXT416((uint)(((fVar249 + fVar249) * (fVar195 + 2.0) +
                                        fVar249 * fVar249 * -3.0) * 0.5));
              auVar135 = vshufps_avx(auVar135,auVar135,0);
              auVar209 = ZEXT416((uint)((fVar158 * (fVar197 + fVar197) + fVar197 * fVar195) * 0.5));
              auVar209 = vshufps_avx(auVar209,auVar209,0);
              auVar168 = ZEXT416((uint)((fVar197 * (fVar249 + fVar249) - fVar250 * fVar250) * 0.5));
              auVar168 = vshufps_avx(auVar168,auVar168,0);
              auVar377._0_4_ =
                   (float)local_a10._0_4_ * auVar168._0_4_ +
                   (float)local_a30._0_4_ * auVar209._0_4_ +
                   (float)local_a40._0_4_ * auVar172._0_4_ + (float)local_a20._0_4_ * auVar135._0_4_
              ;
              auVar377._4_4_ =
                   (float)local_a10._4_4_ * auVar168._4_4_ +
                   (float)local_a30._4_4_ * auVar209._4_4_ +
                   (float)local_a40._4_4_ * auVar172._4_4_ + (float)local_a20._4_4_ * auVar135._4_4_
              ;
              auVar377._8_4_ =
                   fStack_a08 * auVar168._8_4_ +
                   fStack_a28 * auVar209._8_4_ +
                   fStack_a38 * auVar172._8_4_ + fStack_a18 * auVar135._8_4_;
              auVar377._12_4_ =
                   fStack_a04 * auVar168._12_4_ +
                   fStack_a24 * auVar209._12_4_ +
                   fStack_a34 * auVar172._12_4_ + fStack_a14 * auVar135._12_4_;
              auVar168 = vpermilps_avx(local_a80._0_16_,0);
              auVar171 = vpermilps_avx(ZEXT416((uint)(fVar197 * -9.0 + 4.0)),0);
              auVar172 = vshufps_avx(ZEXT416((uint)(fVar252 + -5.0)),ZEXT416((uint)(fVar252 + -5.0))
                                     ,0);
              auVar135 = ZEXT416((uint)(fVar197 * -3.0 + 2.0));
              auVar209 = vshufps_avx(auVar135,auVar135,0);
              auVar135 = vdpps_avx(auVar377,auVar377,0x7f);
              auVar163._0_4_ =
                   (float)local_a10._0_4_ * auVar209._0_4_ +
                   (float)local_a30._0_4_ * auVar172._0_4_ +
                   (float)local_a20._0_4_ * auVar171._0_4_ + (float)local_a40._0_4_ * auVar168._0_4_
              ;
              auVar163._4_4_ =
                   (float)local_a10._4_4_ * auVar209._4_4_ +
                   (float)local_a30._4_4_ * auVar172._4_4_ +
                   (float)local_a20._4_4_ * auVar171._4_4_ + (float)local_a40._4_4_ * auVar168._4_4_
              ;
              auVar163._8_4_ =
                   fStack_a08 * auVar209._8_4_ +
                   fStack_a28 * auVar172._8_4_ +
                   fStack_a18 * auVar171._8_4_ + fStack_a38 * auVar168._8_4_;
              auVar163._12_4_ =
                   fStack_a04 * auVar209._12_4_ +
                   fStack_a24 * auVar172._12_4_ +
                   fStack_a14 * auVar171._12_4_ + fStack_a34 * auVar168._12_4_;
              auVar172 = vblendps_avx(auVar135,_DAT_01feba10,0xe);
              auVar209 = vrsqrtss_avx(auVar172,auVar172);
              fVar249 = auVar209._0_4_;
              fVar158 = auVar135._0_4_;
              auVar209 = vdpps_avx(auVar377,auVar163,0x7f);
              auVar168 = vshufps_avx(auVar135,auVar135,0);
              auVar164._0_4_ = auVar163._0_4_ * auVar168._0_4_;
              auVar164._4_4_ = auVar163._4_4_ * auVar168._4_4_;
              auVar164._8_4_ = auVar163._8_4_ * auVar168._8_4_;
              auVar164._12_4_ = auVar163._12_4_ * auVar168._12_4_;
              auVar209 = vshufps_avx(auVar209,auVar209,0);
              auVar258._0_4_ = auVar377._0_4_ * auVar209._0_4_;
              auVar258._4_4_ = auVar377._4_4_ * auVar209._4_4_;
              auVar258._8_4_ = auVar377._8_4_ * auVar209._8_4_;
              auVar258._12_4_ = auVar377._12_4_ * auVar209._12_4_;
              auVar171 = vsubps_avx(auVar164,auVar258);
              auVar209 = vrcpss_avx(auVar172,auVar172);
              auVar172 = vmaxss_avx(ZEXT416((uint)local_9c0),
                                    ZEXT416((uint)(local_bc0 * (float)local_740._0_4_)));
              auVar354 = ZEXT1664(auVar172);
              auVar209 = ZEXT416((uint)(auVar209._0_4_ * (2.0 - fVar158 * auVar209._0_4_)));
              auVar209 = vshufps_avx(auVar209,auVar209,0);
              uVar125 = CONCAT44(auVar377._4_4_,auVar377._0_4_);
              local_aa0._0_8_ = uVar125 ^ 0x8000000080000000;
              local_aa0._8_4_ = -auVar377._8_4_;
              local_aa0._12_4_ = -auVar377._12_4_;
              auVar168 = ZEXT416((uint)(fVar249 * 1.5 + fVar158 * -0.5 * fVar249 * fVar249 * fVar249
                                       ));
              auVar168 = vshufps_avx(auVar168,auVar168,0);
              auVar237._0_4_ = auVar168._0_4_ * auVar171._0_4_ * auVar209._0_4_;
              auVar237._4_4_ = auVar168._4_4_ * auVar171._4_4_ * auVar209._4_4_;
              auVar237._8_4_ = auVar168._8_4_ * auVar171._8_4_ * auVar209._8_4_;
              auVar237._12_4_ = auVar168._12_4_ * auVar171._12_4_ * auVar209._12_4_;
              auVar308._0_4_ = auVar377._0_4_ * auVar168._0_4_;
              auVar308._4_4_ = auVar377._4_4_ * auVar168._4_4_;
              auVar308._8_4_ = auVar377._8_4_ * auVar168._8_4_;
              auVar308._12_4_ = auVar377._12_4_ * auVar168._12_4_;
              local_a80._0_4_ = auVar172._0_4_;
              if (fVar158 < 0.0) {
                local_ae0._0_16_ = auVar308;
                local_9a0._0_16_ = auVar237;
                fVar158 = sqrtf(fVar158);
                auVar354 = ZEXT464((uint)local_a80._0_4_);
                auVar237 = local_9a0._0_16_;
                auVar308 = local_ae0._0_16_;
              }
              else {
                auVar172 = vsqrtss_avx(auVar135,auVar135);
                fVar158 = auVar172._0_4_;
              }
              auVar172 = vdpps_avx(_local_9e0,auVar308,0x7f);
              fVar158 = (local_9c0 / fVar158) * (fVar251 + 1.0) +
                        auVar354._0_4_ + fVar251 * local_9c0;
              auVar135 = vdpps_avx(local_aa0._0_16_,auVar308,0x7f);
              auVar209 = vdpps_avx(_local_9e0,auVar237,0x7f);
              auVar168 = vdpps_avx(_local_870,auVar308,0x7f);
              auVar171 = vdpps_avx(_local_9e0,local_aa0._0_16_,0x7f);
              fVar249 = auVar135._0_4_ + auVar209._0_4_;
              fVar195 = auVar172._0_4_;
              auVar131._0_4_ = fVar195 * fVar195;
              auVar131._4_4_ = auVar172._4_4_ * auVar172._4_4_;
              auVar131._8_4_ = auVar172._8_4_ * auVar172._8_4_;
              auVar131._12_4_ = auVar172._12_4_ * auVar172._12_4_;
              auVar209 = vsubps_avx(local_a60._0_16_,auVar131);
              local_aa0._0_16_ = ZEXT416((uint)fVar249);
              auVar135 = vdpps_avx(_local_9e0,_local_870,0x7f);
              fVar250 = auVar171._0_4_ - fVar195 * fVar249;
              fVar195 = auVar135._0_4_ - fVar195 * auVar168._0_4_;
              auVar135 = vrsqrtss_avx(auVar209,auVar209);
              fVar251 = auVar209._0_4_;
              fVar249 = auVar135._0_4_;
              fVar249 = fVar249 * 1.5 + fVar251 * -0.5 * fVar249 * fVar249 * fVar249;
              if (fVar251 < 0.0) {
                local_ae0._0_16_ = auVar172;
                local_9a0._0_16_ = auVar168;
                local_8e0._0_4_ = fVar250;
                local_900._0_4_ = fVar195;
                local_860._0_4_ = fVar249;
                fVar251 = sqrtf(fVar251);
                auVar354 = ZEXT464((uint)local_a80._0_4_);
                fVar249 = (float)local_860._0_4_;
                fVar250 = (float)local_8e0._0_4_;
                auVar168 = local_9a0._0_16_;
                auVar172 = local_ae0._0_16_;
                fVar195 = (float)local_900._0_4_;
              }
              else {
                auVar135 = vsqrtss_avx(auVar209,auVar209);
                fVar251 = auVar135._0_4_;
              }
              auVar171 = vpermilps_avx(local_980._0_16_,0xff);
              auVar10 = vpermilps_avx(auVar377,0xff);
              fVar250 = fVar250 * fVar249 - auVar10._0_4_;
              auVar259._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
              auVar259._8_4_ = auVar168._8_4_ ^ 0x80000000;
              auVar259._12_4_ = auVar168._12_4_ ^ 0x80000000;
              auVar282._0_4_ = -fVar250;
              auVar282._4_4_ = 0x80000000;
              auVar282._8_4_ = 0x80000000;
              auVar282._12_4_ = 0x80000000;
              auVar135 = vinsertps_avx(ZEXT416((uint)(fVar195 * fVar249)),auVar259,0x10);
              auVar209 = vmovsldup_avx(ZEXT416((uint)(local_aa0._0_4_ * fVar195 * fVar249 -
                                                     auVar168._0_4_ * fVar250)));
              auVar135 = vdivps_avx(auVar135,auVar209);
              auVar171 = ZEXT416((uint)(fVar251 - auVar171._0_4_));
              auVar168 = vinsertps_avx(auVar172,auVar171,0x10);
              auVar238._0_4_ = auVar168._0_4_ * auVar135._0_4_;
              auVar238._4_4_ = auVar168._4_4_ * auVar135._4_4_;
              auVar238._8_4_ = auVar168._8_4_ * auVar135._8_4_;
              auVar238._12_4_ = auVar168._12_4_ * auVar135._12_4_;
              auVar135 = vinsertps_avx(auVar282,local_aa0._0_16_,0x1c);
              auVar135 = vdivps_avx(auVar135,auVar209);
              auVar209 = vhaddps_avx(auVar238,auVar238);
              auVar205._0_4_ = auVar168._0_4_ * auVar135._0_4_;
              auVar205._4_4_ = auVar168._4_4_ * auVar135._4_4_;
              auVar205._8_4_ = auVar168._8_4_ * auVar135._8_4_;
              auVar205._12_4_ = auVar168._12_4_ * auVar135._12_4_;
              auVar135 = vhaddps_avx(auVar205,auVar205);
              fVar197 = fVar197 - auVar209._0_4_;
              local_bc0 = local_bc0 - auVar135._0_4_;
              auVar260._8_4_ = 0x7fffffff;
              auVar260._0_8_ = 0x7fffffff7fffffff;
              auVar260._12_4_ = 0x7fffffff;
              auVar385 = ZEXT1664(auVar260);
              auVar172 = vandps_avx(auVar172,auVar260);
              bVar84 = true;
              fVar249 = (float)local_920._0_4_;
              fVar195 = (float)local_920._4_4_;
              fVar250 = fStack_918;
              fVar251 = fStack_914;
              fVar227 = fStack_910;
              fVar252 = fStack_90c;
              fVar253 = fStack_908;
              fVar277 = (float)local_a00._0_4_;
              fVar279 = (float)local_a00._4_4_;
              fVar292 = fStack_9f8;
              fVar294 = fStack_9f4;
              fVar296 = fStack_9f0;
              fVar298 = fStack_9ec;
              fVar300 = fStack_9e8;
              fVar254 = (float)local_8c0._0_4_;
              fVar255 = (float)local_8c0._4_4_;
              fVar270 = fStack_8b8;
              fVar272 = fStack_8b4;
              fVar274 = fStack_8b0;
              fVar275 = fStack_8ac;
              fVar276 = fStack_8a8;
              if (fVar158 <= auVar172._0_4_) {
LAB_01282347:
                auVar269 = ZEXT464((uint)local_bc0);
              }
              else {
                auVar172 = vandps_avx(auVar171,auVar260);
                if ((float)local_760._0_4_ * 1.9073486e-06 + auVar354._0_4_ + fVar158 <=
                    auVar172._0_4_) goto LAB_01282347;
                local_bc0 = local_bc0 + (float)local_830._0_4_;
                if (local_bc0 < fVar234) {
                  bVar84 = false;
                  unaff_R13B = 0;
                  goto LAB_01282347;
                }
                fVar158 = *(float *)(ray + k * 4 + 0x80);
                auVar354 = ZEXT464((uint)fVar158);
                if (((fVar158 < local_bc0) || (fVar197 < 0.0)) || (1.0 < fVar197)) {
                  bVar84 = false;
                  unaff_R13B = 0;
                  auVar269 = ZEXT1664(ZEXT416((uint)local_bc0));
                }
                else {
                  auVar172 = vrsqrtss_avx(local_a60._0_16_,local_a60._0_16_);
                  fVar302 = auVar172._0_4_;
                  pGVar28 = (context->scene->geometries).items[local_958].ptr;
                  auVar269 = ZEXT1664(ZEXT416((uint)local_bc0));
                  if ((pGVar28->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    unaff_R13B = 0;
                  }
                  else {
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar28->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar172 = ZEXT416((uint)(fVar302 * 1.5 +
                                               local_a60._0_4_ * -0.5 * fVar302 * fVar302 * fVar302)
                                        );
                      auVar172 = vshufps_avx(auVar172,auVar172,0);
                      auVar165._0_4_ = auVar172._0_4_ * (float)local_9e0._0_4_;
                      auVar165._4_4_ = auVar172._4_4_ * (float)local_9e0._4_4_;
                      auVar165._8_4_ = auVar172._8_4_ * fStack_9d8;
                      auVar165._12_4_ = auVar172._12_4_ * fStack_9d4;
                      auVar132._0_4_ = auVar377._0_4_ + auVar10._0_4_ * auVar165._0_4_;
                      auVar132._4_4_ = auVar377._4_4_ + auVar10._4_4_ * auVar165._4_4_;
                      auVar132._8_4_ = auVar377._8_4_ + auVar10._8_4_ * auVar165._8_4_;
                      auVar132._12_4_ = auVar377._12_4_ + auVar10._12_4_ * auVar165._12_4_;
                      auVar172 = vshufps_avx(auVar165,auVar165,0xc9);
                      auVar135 = vshufps_avx(auVar377,auVar377,0xc9);
                      auVar166._0_4_ = auVar135._0_4_ * auVar165._0_4_;
                      auVar166._4_4_ = auVar135._4_4_ * auVar165._4_4_;
                      auVar166._8_4_ = auVar135._8_4_ * auVar165._8_4_;
                      auVar166._12_4_ = auVar135._12_4_ * auVar165._12_4_;
                      auVar206._0_4_ = auVar377._0_4_ * auVar172._0_4_;
                      auVar206._4_4_ = auVar377._4_4_ * auVar172._4_4_;
                      auVar206._8_4_ = auVar377._8_4_ * auVar172._8_4_;
                      auVar206._12_4_ = auVar377._12_4_ * auVar172._12_4_;
                      auVar209 = vsubps_avx(auVar206,auVar166);
                      auVar172 = vshufps_avx(auVar209,auVar209,0xc9);
                      auVar135 = vshufps_avx(auVar132,auVar132,0xc9);
                      auVar207._0_4_ = auVar135._0_4_ * auVar172._0_4_;
                      auVar207._4_4_ = auVar135._4_4_ * auVar172._4_4_;
                      auVar207._8_4_ = auVar135._8_4_ * auVar172._8_4_;
                      auVar207._12_4_ = auVar135._12_4_ * auVar172._12_4_;
                      auVar172 = vshufps_avx(auVar209,auVar209,0xd2);
                      auVar133._0_4_ = auVar132._0_4_ * auVar172._0_4_;
                      auVar133._4_4_ = auVar132._4_4_ * auVar172._4_4_;
                      auVar133._8_4_ = auVar132._8_4_ * auVar172._8_4_;
                      auVar133._12_4_ = auVar132._12_4_ * auVar172._12_4_;
                      auVar172 = vsubps_avx(auVar207,auVar133);
                      local_6d0 = vshufps_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar197),0);
                      local_700 = (RTCHitN  [16])vshufps_avx(auVar172,auVar172,0x55);
                      auStack_6f0 = vshufps_avx(auVar172,auVar172,0xaa);
                      local_6e0 = vshufps_avx(auVar172,auVar172,0);
                      local_6c0 = ZEXT816(0) << 0x20;
                      local_6b0 = local_720._0_8_;
                      uStack_6a8 = local_720._8_8_;
                      local_6a0 = local_710._0_8_;
                      uStack_698 = local_710._8_8_;
                      uVar117 = context->user->instID[0];
                      _local_690 = CONCAT44(uVar117,uVar117);
                      _uStack_688 = CONCAT44(uVar117,uVar117);
                      uVar117 = context->user->instPrimID[0];
                      _uStack_680 = CONCAT44(uVar117,uVar117);
                      _uStack_678 = CONCAT44(uVar117,uVar117);
                      *(float *)(ray + k * 4 + 0x80) = local_bc0;
                      local_b00 = *local_960;
                      uStack_af8 = local_960[1];
                      local_950.valid = (int *)&local_b00;
                      local_950.geometryUserPtr = pGVar28->userPtr;
                      local_950.context = context->user;
                      local_950.hit = local_700;
                      local_950.N = 4;
                      local_980._0_4_ = fVar158;
                      local_950.ray = (RTCRayN *)ray;
                      if (pGVar28->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar28->occlusionFilterN)(&local_950);
                        auVar354 = ZEXT464((uint)local_980._0_4_);
                        auVar269 = ZEXT464((uint)local_bc0);
                        auVar385 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        fVar249 = (float)local_920._0_4_;
                        fVar195 = (float)local_920._4_4_;
                        fVar250 = fStack_918;
                        fVar251 = fStack_914;
                        fVar227 = fStack_910;
                        fVar252 = fStack_90c;
                        fVar253 = fStack_908;
                        fVar254 = (float)local_8c0._0_4_;
                        fVar255 = (float)local_8c0._4_4_;
                        fVar270 = fStack_8b8;
                        fVar272 = fStack_8b4;
                        fVar274 = fStack_8b0;
                        fVar275 = fStack_8ac;
                        fVar276 = fStack_8a8;
                      }
                      auVar109._8_8_ = uStack_af8;
                      auVar109._0_8_ = local_b00;
                      if (auVar109 == (undefined1  [16])0x0) {
                        auVar172 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar172 = auVar172 ^ _DAT_01febe20;
                        fVar277 = (float)local_a00._0_4_;
                        fVar279 = (float)local_a00._4_4_;
                        fVar292 = fStack_9f8;
                        fVar294 = fStack_9f4;
                        fVar296 = fStack_9f0;
                        fVar298 = fStack_9ec;
                        fVar300 = fStack_9e8;
                      }
                      else {
                        p_Var31 = context->args->filter;
                        if ((p_Var31 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar28->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var31)(&local_950);
                          auVar354 = ZEXT464((uint)local_980._0_4_);
                          auVar269 = ZEXT464((uint)local_bc0);
                          auVar385 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          fVar249 = (float)local_920._0_4_;
                          fVar195 = (float)local_920._4_4_;
                          fVar250 = fStack_918;
                          fVar251 = fStack_914;
                          fVar227 = fStack_910;
                          fVar252 = fStack_90c;
                          fVar253 = fStack_908;
                          fVar254 = (float)local_8c0._0_4_;
                          fVar255 = (float)local_8c0._4_4_;
                          fVar270 = fStack_8b8;
                          fVar272 = fStack_8b4;
                          fVar274 = fStack_8b0;
                          fVar275 = fStack_8ac;
                          fVar276 = fStack_8a8;
                        }
                        auVar110._8_8_ = uStack_af8;
                        auVar110._0_8_ = local_b00;
                        auVar135 = vpcmpeqd_avx((undefined1  [16])0x0,auVar110);
                        auVar172 = auVar135 ^ _DAT_01febe20;
                        auVar208._8_4_ = 0xff800000;
                        auVar208._0_8_ = 0xff800000ff800000;
                        auVar208._12_4_ = 0xff800000;
                        auVar135 = vblendvps_avx(auVar208,*(undefined1 (*) [16])
                                                           (local_950.ray + 0x80),auVar135);
                        *(undefined1 (*) [16])(local_950.ray + 0x80) = auVar135;
                        fVar277 = (float)local_a00._0_4_;
                        fVar279 = (float)local_a00._4_4_;
                        fVar292 = fStack_9f8;
                        fVar294 = fStack_9f4;
                        fVar296 = fStack_9f0;
                        fVar298 = fStack_9ec;
                        fVar300 = fStack_9e8;
                      }
                      auVar167._8_8_ = 0x100000001;
                      auVar167._0_8_ = 0x100000001;
                      unaff_R13B = (auVar167 & auVar172) != (undefined1  [16])0x0;
                      if (!(bool)unaff_R13B) {
                        *(int *)(ray + k * 4 + 0x80) = auVar354._0_4_;
                      }
                      bVar84 = false;
                      goto LAB_01282355;
                    }
                    unaff_R13B = 1;
                  }
                  bVar84 = false;
                }
              }
LAB_01282355:
              auVar395 = ZEXT464((uint)fVar197);
              if (!bVar84) goto LAB_01282741;
              lVar121 = lVar121 + -1;
            } while (lVar121 != 0);
            unaff_R13B = 0;
            fVar277 = (float)local_a00._0_4_;
            fVar279 = (float)local_a00._4_4_;
            fVar292 = fStack_9f8;
            fVar294 = fStack_9f4;
            fVar296 = fStack_9f0;
            fVar298 = fStack_9ec;
            fVar300 = fStack_9e8;
            fVar254 = (float)local_8c0._0_4_;
            fVar255 = (float)local_8c0._4_4_;
            fVar270 = fStack_8b8;
            fVar272 = fStack_8b4;
            fVar274 = fStack_8b0;
            fVar275 = fStack_8ac;
            fVar276 = fStack_8a8;
LAB_01282741:
            unaff_R13B = unaff_R13B & 1;
            uVar120 = CONCAT71(local_780._1_7_,local_780[0] | unaff_R13B);
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar150._4_4_ = uVar8;
            auVar150._0_4_ = uVar8;
            auVar150._8_4_ = uVar8;
            auVar150._12_4_ = uVar8;
            auVar150._16_4_ = uVar8;
            auVar150._20_4_ = uVar8;
            auVar150._24_4_ = uVar8;
            auVar150._28_4_ = uVar8;
            auVar149 = vcmpps_avx(_local_7c0,auVar150,2);
            auVar32 = vandps_avx(auVar149,local_5a0);
            auVar269 = ZEXT3264(auVar32);
            auVar33 = local_5a0 & auVar149;
            uVar125 = local_5e0;
            auVar315 = local_ac0;
            local_5a0 = auVar32;
          } while ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar33 >> 0x7f,0) != '\0') ||
                     (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar33 >> 0xbf,0) != '\0') ||
                   (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar33[0x1f] < '\0');
        }
        auVar151._0_4_ =
             fVar277 * (float)local_7e0._0_4_ +
             fVar254 * (float)local_800._0_4_ + fVar249 * (float)local_600._0_4_;
        auVar151._4_4_ =
             fVar279 * (float)local_7e0._4_4_ +
             fVar255 * (float)local_800._4_4_ + fVar195 * (float)local_600._4_4_;
        auVar151._8_4_ = fVar292 * fStack_7d8 + fVar270 * fStack_7f8 + fVar250 * fStack_5f8;
        auVar151._12_4_ = fVar294 * fStack_7d4 + fVar272 * fStack_7f4 + fVar251 * fStack_5f4;
        auVar151._16_4_ = fVar296 * fStack_7d0 + fVar274 * fStack_7f0 + fVar227 * fStack_5f0;
        auVar151._20_4_ = fVar298 * fStack_7cc + fVar275 * fStack_7ec + fVar252 * fStack_5ec;
        auVar151._24_4_ = fVar300 * fStack_7c8 + fVar276 * fStack_7e8 + fVar253 * fStack_5e8;
        auVar151._28_4_ = auVar149._28_4_ + auVar149._28_4_ + auVar269._28_4_;
        auVar185._8_4_ = 0x7fffffff;
        auVar185._0_8_ = 0x7fffffff7fffffff;
        auVar185._12_4_ = 0x7fffffff;
        auVar185._16_4_ = 0x7fffffff;
        auVar185._20_4_ = 0x7fffffff;
        auVar185._24_4_ = 0x7fffffff;
        auVar185._28_4_ = 0x7fffffff;
        auVar149 = vandps_avx(auVar151,auVar185);
        auVar186._8_4_ = 0x3e99999a;
        auVar186._0_8_ = 0x3e99999a3e99999a;
        auVar186._12_4_ = 0x3e99999a;
        auVar186._16_4_ = 0x3e99999a;
        auVar186._20_4_ = 0x3e99999a;
        auVar186._24_4_ = 0x3e99999a;
        auVar186._28_4_ = 0x3e99999a;
        auVar149 = vcmpps_avx(auVar149,auVar186,1);
        auVar32 = vorps_avx(auVar149,local_540);
        auVar187._0_4_ = (float)local_8a0._0_4_ + (float)local_640._0_4_;
        auVar187._4_4_ = (float)local_8a0._4_4_ + (float)local_640._4_4_;
        auVar187._8_4_ = fStack_898 + fStack_638;
        auVar187._12_4_ = fStack_894 + fStack_634;
        auVar187._16_4_ = fStack_890 + fStack_630;
        auVar187._20_4_ = fStack_88c + fStack_62c;
        auVar187._24_4_ = fStack_888 + fStack_628;
        auVar187._28_4_ = fStack_884 + fStack_624;
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar223._4_4_ = uVar8;
        auVar223._0_4_ = uVar8;
        auVar223._8_4_ = uVar8;
        auVar223._12_4_ = uVar8;
        auVar223._16_4_ = uVar8;
        auVar223._20_4_ = uVar8;
        auVar223._24_4_ = uVar8;
        auVar223._28_4_ = uVar8;
        auVar149 = vcmpps_avx(auVar187,auVar223,2);
        _local_7e0 = vandps_avx(auVar149,auVar315);
        auVar188._8_4_ = 3;
        auVar188._0_8_ = 0x300000003;
        auVar188._12_4_ = 3;
        auVar188._16_4_ = 3;
        auVar188._20_4_ = 3;
        auVar188._24_4_ = 3;
        auVar188._28_4_ = 3;
        auVar224._8_4_ = 2;
        auVar224._0_8_ = 0x200000002;
        auVar224._12_4_ = 2;
        auVar224._16_4_ = 2;
        auVar224._20_4_ = 2;
        auVar224._24_4_ = 2;
        auVar224._28_4_ = 2;
        auVar149 = vblendvps_avx(auVar224,auVar188,auVar32);
        auVar172 = vpcmpgtd_avx(auVar149._16_16_,local_560);
        auVar135 = vpshufd_avx(local_520._0_16_,0);
        auVar135 = vpcmpgtd_avx(auVar149._0_16_,auVar135);
        auVar189._16_16_ = auVar172;
        auVar189._0_16_ = auVar135;
        _local_800 = vblendps_avx(ZEXT1632(auVar135),auVar189,0xf0);
        auVar149 = vandnps_avx(_local_800,_local_7e0);
        auVar32 = _local_7e0 & ~_local_800;
        if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar32 >> 0x7f,0) != '\0') ||
              (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar32 >> 0xbf,0) != '\0') ||
            (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar32[0x1f] < '\0') {
          local_760 = _local_2e0;
          local_7c0._4_4_ = (float)local_8a0._4_4_ + (float)local_2e0._4_4_;
          local_7c0._0_4_ = (float)local_8a0._0_4_ + (float)local_2e0._0_4_;
          fStack_7b8 = fStack_898 + fStack_2d8;
          fStack_7b4 = fStack_894 + fStack_2d4;
          fStack_7b0 = fStack_890 + fStack_2d0;
          fStack_7ac = fStack_88c + fStack_2cc;
          fStack_7a8 = fStack_888 + fStack_2c8;
          fStack_7a4 = fStack_884 + fStack_2c4;
          do {
            auVar261 = auVar385._0_16_;
            auVar190._8_4_ = 0x7f800000;
            auVar190._0_8_ = 0x7f8000007f800000;
            auVar190._12_4_ = 0x7f800000;
            auVar190._16_4_ = 0x7f800000;
            auVar190._20_4_ = 0x7f800000;
            auVar190._24_4_ = 0x7f800000;
            auVar190._28_4_ = 0x7f800000;
            auVar32 = vblendvps_avx(auVar190,local_760,auVar149);
            auVar33 = vshufps_avx(auVar32,auVar32,0xb1);
            auVar33 = vminps_avx(auVar32,auVar33);
            auVar315 = vshufpd_avx(auVar33,auVar33,5);
            auVar33 = vminps_avx(auVar33,auVar315);
            auVar315 = vperm2f128_avx(auVar33,auVar33,1);
            auVar33 = vminps_avx(auVar33,auVar315);
            auVar33 = vcmpps_avx(auVar32,auVar33,0);
            auVar315 = auVar149 & auVar33;
            auVar32 = auVar149;
            if ((((((((auVar315 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar315 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar315 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar315 >> 0x7f,0) != '\0') ||
                  (auVar315 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar315 >> 0xbf,0) != '\0') ||
                (auVar315 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar315[0x1f] < '\0') {
              auVar32 = vandps_avx(auVar33,auVar149);
            }
            local_780._0_8_ = uVar120;
            uVar118 = vmovmskps_avx(auVar32);
            uVar117 = 0;
            if (uVar118 != 0) {
              for (; (uVar118 >> uVar117 & 1) == 0; uVar117 = uVar117 + 1) {
              }
            }
            uVar125 = (ulong)uVar117;
            local_5c0 = auVar149;
            *(undefined4 *)(local_5c0 + uVar125 * 4) = 0;
            fVar158 = local_4e0[uVar125];
            uVar117 = *(uint *)(local_2c0 + uVar125 * 4);
            fVar249 = local_ae8;
            if ((float)local_880._0_4_ < 0.0) {
              fVar249 = sqrtf((float)local_880._0_4_);
              auVar261._8_4_ = 0x7fffffff;
              auVar261._0_8_ = 0x7fffffff7fffffff;
              auVar261._12_4_ = 0x7fffffff;
            }
            auVar269 = ZEXT464(uVar117);
            auVar395 = ZEXT464((uint)fVar158);
            auVar135 = vminps_avx(_local_a10,_local_a30);
            auVar172 = vmaxps_avx(_local_a10,_local_a30);
            auVar209 = vminps_avx(_local_a20,_local_a40);
            auVar168 = vminps_avx(auVar135,auVar209);
            auVar135 = vmaxps_avx(_local_a20,_local_a40);
            auVar209 = vmaxps_avx(auVar172,auVar135);
            auVar172 = vandps_avx(auVar168,auVar261);
            auVar135 = vandps_avx(auVar209,auVar261);
            auVar172 = vmaxps_avx(auVar172,auVar135);
            auVar135 = vmovshdup_avx(auVar172);
            auVar135 = vmaxss_avx(auVar135,auVar172);
            auVar172 = vshufpd_avx(auVar172,auVar172,1);
            auVar172 = vmaxss_avx(auVar172,auVar135);
            local_a60._0_4_ = auVar172._0_4_ * 1.9073486e-06;
            local_740._0_4_ = fVar249 * 1.9073486e-06;
            local_860._0_16_ = vshufps_avx(auVar209,auVar209,0xff);
            lVar121 = 5;
            do {
              auVar172 = vshufps_avx(auVar269._0_16_,auVar269._0_16_,0);
              auVar134._0_4_ = auVar172._0_4_ * (float)local_870._0_4_ + 0.0;
              auVar134._4_4_ = auVar172._4_4_ * (float)local_870._4_4_ + 0.0;
              auVar134._8_4_ = auVar172._8_4_ * fStack_868 + 0.0;
              auVar134._12_4_ = auVar172._12_4_ * fStack_864 + 0.0;
              fVar197 = auVar395._0_4_;
              fVar250 = 1.0 - fVar197;
              fVar249 = fVar197 * fVar197;
              fVar195 = fVar197 * 3.0;
              fVar158 = fVar195 + -5.0;
              auVar172 = ZEXT416((uint)(fVar197 * fVar197 * -fVar250 * 0.5));
              auVar172 = vshufps_avx(auVar172,auVar172,0);
              auVar135 = ZEXT416((uint)((fVar250 * fVar250 * (fVar250 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar135 = vshufps_avx(auVar135,auVar135,0);
              auVar209 = ZEXT416((uint)((fVar249 * fVar158 + 2.0) * 0.5));
              auVar209 = vshufps_avx(auVar209,auVar209,0);
              auVar168 = ZEXT416((uint)(fVar250 * fVar250 * -fVar197 * 0.5));
              auVar168 = vshufps_avx(auVar168,auVar168,0);
              auVar210._0_4_ =
                   auVar168._0_4_ * (float)local_a10._0_4_ +
                   auVar209._0_4_ * (float)local_a30._0_4_ +
                   auVar135._0_4_ * (float)local_a20._0_4_ + auVar172._0_4_ * (float)local_a40._0_4_
              ;
              auVar210._4_4_ =
                   auVar168._4_4_ * (float)local_a10._4_4_ +
                   auVar209._4_4_ * (float)local_a30._4_4_ +
                   auVar135._4_4_ * (float)local_a20._4_4_ + auVar172._4_4_ * (float)local_a40._4_4_
              ;
              auVar210._8_4_ =
                   auVar168._8_4_ * fStack_a08 +
                   auVar209._8_4_ * fStack_a28 +
                   auVar135._8_4_ * fStack_a18 + auVar172._8_4_ * fStack_a38;
              auVar210._12_4_ =
                   auVar168._12_4_ * fStack_a04 +
                   auVar209._12_4_ * fStack_a24 +
                   auVar135._12_4_ * fStack_a14 + auVar172._12_4_ * fStack_a34;
              local_980._0_16_ = auVar210;
              auVar172 = vsubps_avx(auVar134,auVar210);
              _local_9e0 = auVar172;
              auVar172 = vdpps_avx(auVar172,auVar172,0x7f);
              local_a80._0_16_ = ZEXT416((uint)(fVar195 + -1.0));
              local_9c0 = auVar172._0_4_;
              local_bc0 = auVar269._0_4_;
              fStack_9bc = auVar172._4_4_;
              fStack_9b8 = auVar172._8_4_;
              fStack_9b4 = auVar172._12_4_;
              if (local_9c0 < 0.0) {
                local_aa0._0_4_ = fVar249;
                local_ac0._0_16_ = ZEXT416((uint)fVar250);
                local_ae0._0_4_ = fVar195;
                local_9a0._0_4_ = fVar197 * 9.0;
                local_8e0._0_4_ = fVar158;
                local_900._0_4_ = fVar250 * -2.0;
                fVar251 = sqrtf(local_9c0);
                fVar158 = (float)local_8e0._0_4_;
                fVar227 = (float)local_900._0_4_;
                fVar195 = (float)local_ae0._0_4_;
                fVar249 = (float)local_9a0._0_4_;
                fVar252 = (float)local_ac0._0_4_;
              }
              else {
                auVar172 = vsqrtss_avx(auVar172,auVar172);
                fVar251 = auVar172._0_4_;
                fVar227 = fVar250 * -2.0;
                local_aa0._0_4_ = fVar249;
                fVar249 = fVar197 * 9.0;
                fVar252 = fVar250;
              }
              auVar172 = ZEXT416((uint)(((float)local_aa0._0_4_ + fVar197 * fVar227) * 0.5));
              auVar172 = vshufps_avx(auVar172,auVar172,0);
              auVar135 = ZEXT416((uint)(((fVar252 + fVar252) * (fVar195 + 2.0) +
                                        fVar252 * fVar252 * -3.0) * 0.5));
              auVar135 = vshufps_avx(auVar135,auVar135,0);
              auVar209 = ZEXT416((uint)((fVar158 * (fVar197 + fVar197) + fVar197 * fVar195) * 0.5));
              auVar209 = vshufps_avx(auVar209,auVar209,0);
              auVar168 = ZEXT416((uint)((fVar197 * (fVar252 + fVar252) - fVar250 * fVar250) * 0.5));
              auVar168 = vshufps_avx(auVar168,auVar168,0);
              auVar378._0_4_ =
                   (float)local_a10._0_4_ * auVar168._0_4_ +
                   (float)local_a30._0_4_ * auVar209._0_4_ +
                   (float)local_a40._0_4_ * auVar172._0_4_ + (float)local_a20._0_4_ * auVar135._0_4_
              ;
              auVar378._4_4_ =
                   (float)local_a10._4_4_ * auVar168._4_4_ +
                   (float)local_a30._4_4_ * auVar209._4_4_ +
                   (float)local_a40._4_4_ * auVar172._4_4_ + (float)local_a20._4_4_ * auVar135._4_4_
              ;
              auVar378._8_4_ =
                   fStack_a08 * auVar168._8_4_ +
                   fStack_a28 * auVar209._8_4_ +
                   fStack_a38 * auVar172._8_4_ + fStack_a18 * auVar135._8_4_;
              auVar378._12_4_ =
                   fStack_a04 * auVar168._12_4_ +
                   fStack_a24 * auVar209._12_4_ +
                   fStack_a34 * auVar172._12_4_ + fStack_a14 * auVar135._12_4_;
              auVar168 = vpermilps_avx(local_a80._0_16_,0);
              auVar171 = vpermilps_avx(ZEXT416((uint)(fVar197 * -9.0 + 4.0)),0);
              auVar172 = vshufps_avx(ZEXT416((uint)(fVar249 + -5.0)),ZEXT416((uint)(fVar249 + -5.0))
                                     ,0);
              auVar135 = ZEXT416((uint)(fVar197 * -3.0 + 2.0));
              auVar209 = vshufps_avx(auVar135,auVar135,0);
              auVar135 = vdpps_avx(auVar378,auVar378,0x7f);
              auVar169._0_4_ =
                   (float)local_a10._0_4_ * auVar209._0_4_ +
                   (float)local_a30._0_4_ * auVar172._0_4_ +
                   (float)local_a20._0_4_ * auVar171._0_4_ + (float)local_a40._0_4_ * auVar168._0_4_
              ;
              auVar169._4_4_ =
                   (float)local_a10._4_4_ * auVar209._4_4_ +
                   (float)local_a30._4_4_ * auVar172._4_4_ +
                   (float)local_a20._4_4_ * auVar171._4_4_ + (float)local_a40._4_4_ * auVar168._4_4_
              ;
              auVar169._8_4_ =
                   fStack_a08 * auVar209._8_4_ +
                   fStack_a28 * auVar172._8_4_ +
                   fStack_a18 * auVar171._8_4_ + fStack_a38 * auVar168._8_4_;
              auVar169._12_4_ =
                   fStack_a04 * auVar209._12_4_ +
                   fStack_a24 * auVar172._12_4_ +
                   fStack_a14 * auVar171._12_4_ + fStack_a34 * auVar168._12_4_;
              auVar172 = vblendps_avx(auVar135,_DAT_01feba10,0xe);
              auVar209 = vrsqrtss_avx(auVar172,auVar172);
              fVar249 = auVar209._0_4_;
              fVar158 = auVar135._0_4_;
              auVar209 = vdpps_avx(auVar378,auVar169,0x7f);
              auVar168 = vshufps_avx(auVar135,auVar135,0);
              auVar170._0_4_ = auVar169._0_4_ * auVar168._0_4_;
              auVar170._4_4_ = auVar169._4_4_ * auVar168._4_4_;
              auVar170._8_4_ = auVar169._8_4_ * auVar168._8_4_;
              auVar170._12_4_ = auVar169._12_4_ * auVar168._12_4_;
              auVar209 = vshufps_avx(auVar209,auVar209,0);
              auVar262._0_4_ = auVar378._0_4_ * auVar209._0_4_;
              auVar262._4_4_ = auVar378._4_4_ * auVar209._4_4_;
              auVar262._8_4_ = auVar378._8_4_ * auVar209._8_4_;
              auVar262._12_4_ = auVar378._12_4_ * auVar209._12_4_;
              auVar171 = vsubps_avx(auVar170,auVar262);
              auVar209 = vrcpss_avx(auVar172,auVar172);
              auVar172 = vmaxss_avx(ZEXT416((uint)local_a60._0_4_),
                                    ZEXT416((uint)(local_bc0 * (float)local_740._0_4_)));
              auVar354 = ZEXT1664(auVar172);
              auVar209 = ZEXT416((uint)(auVar209._0_4_ * (2.0 - fVar158 * auVar209._0_4_)));
              auVar209 = vshufps_avx(auVar209,auVar209,0);
              uVar125 = CONCAT44(auVar378._4_4_,auVar378._0_4_);
              local_aa0._0_8_ = uVar125 ^ 0x8000000080000000;
              local_aa0._8_4_ = -auVar378._8_4_;
              local_aa0._12_4_ = -auVar378._12_4_;
              auVar168 = ZEXT416((uint)(fVar249 * 1.5 + fVar158 * -0.5 * fVar249 * fVar249 * fVar249
                                       ));
              auVar168 = vshufps_avx(auVar168,auVar168,0);
              auVar239._0_4_ = auVar168._0_4_ * auVar171._0_4_ * auVar209._0_4_;
              auVar239._4_4_ = auVar168._4_4_ * auVar171._4_4_ * auVar209._4_4_;
              auVar239._8_4_ = auVar168._8_4_ * auVar171._8_4_ * auVar209._8_4_;
              auVar239._12_4_ = auVar168._12_4_ * auVar171._12_4_ * auVar209._12_4_;
              auVar309._0_4_ = auVar378._0_4_ * auVar168._0_4_;
              auVar309._4_4_ = auVar378._4_4_ * auVar168._4_4_;
              auVar309._8_4_ = auVar378._8_4_ * auVar168._8_4_;
              auVar309._12_4_ = auVar378._12_4_ * auVar168._12_4_;
              local_a80._0_4_ = auVar172._0_4_;
              if (fVar158 < 0.0) {
                local_ac0._0_16_ = auVar309;
                local_ae0._0_16_ = auVar239;
                fVar158 = sqrtf(fVar158);
                auVar354 = ZEXT464((uint)local_a80._0_4_);
                auVar239 = local_ae0._0_16_;
                auVar309 = local_ac0._0_16_;
              }
              else {
                auVar172 = vsqrtss_avx(auVar135,auVar135);
                fVar158 = auVar172._0_4_;
              }
              auVar323._4_4_ = fStack_9bc;
              auVar323._0_4_ = local_9c0;
              auVar323._8_4_ = fStack_9b8;
              auVar323._12_4_ = fStack_9b4;
              auVar172 = vdpps_avx(_local_9e0,auVar309,0x7f);
              fVar158 = ((float)local_a60._0_4_ / fVar158) * (fVar251 + 1.0) +
                        auVar354._0_4_ + fVar251 * (float)local_a60._0_4_;
              auVar135 = vdpps_avx(local_aa0._0_16_,auVar309,0x7f);
              auVar209 = vdpps_avx(_local_9e0,auVar239,0x7f);
              auVar168 = vdpps_avx(_local_870,auVar309,0x7f);
              auVar171 = vdpps_avx(_local_9e0,local_aa0._0_16_,0x7f);
              fVar249 = auVar135._0_4_ + auVar209._0_4_;
              fVar195 = auVar172._0_4_;
              auVar136._0_4_ = fVar195 * fVar195;
              auVar136._4_4_ = auVar172._4_4_ * auVar172._4_4_;
              auVar136._8_4_ = auVar172._8_4_ * auVar172._8_4_;
              auVar136._12_4_ = auVar172._12_4_ * auVar172._12_4_;
              auVar209 = vsubps_avx(auVar323,auVar136);
              local_aa0._0_16_ = ZEXT416((uint)fVar249);
              auVar135 = vdpps_avx(_local_9e0,_local_870,0x7f);
              fVar250 = auVar171._0_4_ - fVar195 * fVar249;
              fVar195 = auVar135._0_4_ - fVar195 * auVar168._0_4_;
              auVar135 = vrsqrtss_avx(auVar209,auVar209);
              fVar251 = auVar209._0_4_;
              fVar249 = auVar135._0_4_;
              fVar249 = fVar249 * 1.5 + fVar251 * -0.5 * fVar249 * fVar249 * fVar249;
              if (fVar251 < 0.0) {
                local_ac0._0_16_ = auVar172;
                local_ae0._0_16_ = auVar168;
                local_9a0._0_4_ = fVar250;
                local_8e0._0_4_ = fVar195;
                local_900._0_4_ = fVar249;
                fVar251 = sqrtf(fVar251);
                auVar354 = ZEXT464((uint)local_a80._0_4_);
                auVar323._4_4_ = fStack_9bc;
                auVar323._0_4_ = local_9c0;
                auVar323._8_4_ = fStack_9b8;
                auVar323._12_4_ = fStack_9b4;
                fVar249 = (float)local_900._0_4_;
                fVar250 = (float)local_9a0._0_4_;
                fVar195 = (float)local_8e0._0_4_;
                auVar168 = local_ae0._0_16_;
                auVar172 = local_ac0._0_16_;
              }
              else {
                auVar135 = vsqrtss_avx(auVar209,auVar209);
                fVar251 = auVar135._0_4_;
              }
              auVar171 = vpermilps_avx(local_980._0_16_,0xff);
              auVar10 = vpermilps_avx(auVar378,0xff);
              fVar250 = fVar250 * fVar249 - auVar10._0_4_;
              auVar263._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
              auVar263._8_4_ = auVar168._8_4_ ^ 0x80000000;
              auVar263._12_4_ = auVar168._12_4_ ^ 0x80000000;
              auVar283._0_4_ = -fVar250;
              auVar283._4_4_ = 0x80000000;
              auVar283._8_4_ = 0x80000000;
              auVar283._12_4_ = 0x80000000;
              auVar135 = vinsertps_avx(ZEXT416((uint)(fVar195 * fVar249)),auVar263,0x10);
              auVar209 = vmovsldup_avx(ZEXT416((uint)(local_aa0._0_4_ * fVar195 * fVar249 -
                                                     auVar168._0_4_ * fVar250)));
              auVar135 = vdivps_avx(auVar135,auVar209);
              auVar171 = ZEXT416((uint)(fVar251 - auVar171._0_4_));
              auVar168 = vinsertps_avx(auVar172,auVar171,0x10);
              auVar240._0_4_ = auVar168._0_4_ * auVar135._0_4_;
              auVar240._4_4_ = auVar168._4_4_ * auVar135._4_4_;
              auVar240._8_4_ = auVar168._8_4_ * auVar135._8_4_;
              auVar240._12_4_ = auVar168._12_4_ * auVar135._12_4_;
              auVar135 = vinsertps_avx(auVar283,local_aa0._0_16_,0x1c);
              auVar135 = vdivps_avx(auVar135,auVar209);
              auVar209 = vhaddps_avx(auVar240,auVar240);
              auVar211._0_4_ = auVar168._0_4_ * auVar135._0_4_;
              auVar211._4_4_ = auVar168._4_4_ * auVar135._4_4_;
              auVar211._8_4_ = auVar168._8_4_ * auVar135._8_4_;
              auVar211._12_4_ = auVar168._12_4_ * auVar135._12_4_;
              auVar135 = vhaddps_avx(auVar211,auVar211);
              fVar197 = fVar197 - auVar209._0_4_;
              local_bc0 = local_bc0 - auVar135._0_4_;
              auVar269 = ZEXT464((uint)local_bc0);
              auVar264._8_4_ = 0x7fffffff;
              auVar264._0_8_ = 0x7fffffff7fffffff;
              auVar264._12_4_ = 0x7fffffff;
              auVar385 = ZEXT1664(auVar264);
              auVar172 = vandps_avx(auVar172,auVar264);
              bVar84 = true;
              if (auVar172._0_4_ < fVar158) {
                auVar172 = vandps_avx(auVar171,auVar264);
                if (auVar172._0_4_ <
                    (float)local_860._0_4_ * 1.9073486e-06 + auVar354._0_4_ + fVar158) {
                  local_bc0 = local_bc0 + (float)local_830._0_4_;
                  auVar269 = ZEXT464((uint)local_bc0);
                  if ((((fVar234 <= local_bc0) &&
                       (fVar158 = *(float *)(ray + k * 4 + 0x80), local_bc0 <= fVar158)) &&
                      (0.0 <= fVar197)) && (fVar197 <= 1.0)) {
                    auVar172 = vrsqrtss_avx(auVar323,auVar323);
                    fVar249 = auVar172._0_4_;
                    pGVar28 = (context->scene->geometries).items[local_958].ptr;
                    if ((pGVar28->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar28->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_R13B = true;
                      }
                      else {
                        auVar172 = ZEXT416((uint)(fVar249 * 1.5 +
                                                 auVar323._0_4_ * -0.5 * fVar249 * fVar249 * fVar249
                                                 ));
                        auVar172 = vshufps_avx(auVar172,auVar172,0);
                        auVar173._0_4_ = auVar172._0_4_ * (float)local_9e0._0_4_;
                        auVar173._4_4_ = auVar172._4_4_ * (float)local_9e0._4_4_;
                        auVar173._8_4_ = auVar172._8_4_ * fStack_9d8;
                        auVar173._12_4_ = auVar172._12_4_ * fStack_9d4;
                        auVar137._0_4_ = auVar378._0_4_ + auVar10._0_4_ * auVar173._0_4_;
                        auVar137._4_4_ = auVar378._4_4_ + auVar10._4_4_ * auVar173._4_4_;
                        auVar137._8_4_ = auVar378._8_4_ + auVar10._8_4_ * auVar173._8_4_;
                        auVar137._12_4_ = auVar378._12_4_ + auVar10._12_4_ * auVar173._12_4_;
                        auVar172 = vshufps_avx(auVar173,auVar173,0xc9);
                        auVar135 = vshufps_avx(auVar378,auVar378,0xc9);
                        auVar174._0_4_ = auVar135._0_4_ * auVar173._0_4_;
                        auVar174._4_4_ = auVar135._4_4_ * auVar173._4_4_;
                        auVar174._8_4_ = auVar135._8_4_ * auVar173._8_4_;
                        auVar174._12_4_ = auVar135._12_4_ * auVar173._12_4_;
                        auVar212._0_4_ = auVar378._0_4_ * auVar172._0_4_;
                        auVar212._4_4_ = auVar378._4_4_ * auVar172._4_4_;
                        auVar212._8_4_ = auVar378._8_4_ * auVar172._8_4_;
                        auVar212._12_4_ = auVar378._12_4_ * auVar172._12_4_;
                        auVar209 = vsubps_avx(auVar212,auVar174);
                        auVar172 = vshufps_avx(auVar209,auVar209,0xc9);
                        auVar135 = vshufps_avx(auVar137,auVar137,0xc9);
                        auVar213._0_4_ = auVar135._0_4_ * auVar172._0_4_;
                        auVar213._4_4_ = auVar135._4_4_ * auVar172._4_4_;
                        auVar213._8_4_ = auVar135._8_4_ * auVar172._8_4_;
                        auVar213._12_4_ = auVar135._12_4_ * auVar172._12_4_;
                        auVar172 = vshufps_avx(auVar209,auVar209,0xd2);
                        auVar138._0_4_ = auVar137._0_4_ * auVar172._0_4_;
                        auVar138._4_4_ = auVar137._4_4_ * auVar172._4_4_;
                        auVar138._8_4_ = auVar137._8_4_ * auVar172._8_4_;
                        auVar138._12_4_ = auVar137._12_4_ * auVar172._12_4_;
                        auVar172 = vsubps_avx(auVar213,auVar138);
                        local_6d0 = vshufps_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar197),0);
                        local_700 = (RTCHitN  [16])vshufps_avx(auVar172,auVar172,0x55);
                        auStack_6f0 = vshufps_avx(auVar172,auVar172,0xaa);
                        local_6e0 = vshufps_avx(auVar172,auVar172,0);
                        local_6c0 = ZEXT816(0) << 0x20;
                        local_6b0 = local_720._0_8_;
                        uStack_6a8 = local_720._8_8_;
                        local_6a0 = local_710._0_8_;
                        uStack_698 = local_710._8_8_;
                        uVar117 = context->user->instID[0];
                        _local_690 = CONCAT44(uVar117,uVar117);
                        _uStack_688 = CONCAT44(uVar117,uVar117);
                        uVar117 = context->user->instPrimID[0];
                        _uStack_680 = CONCAT44(uVar117,uVar117);
                        _uStack_678 = CONCAT44(uVar117,uVar117);
                        *(float *)(ray + k * 4 + 0x80) = local_bc0;
                        local_b00 = *local_960;
                        uStack_af8 = local_960[1];
                        local_950.valid = (int *)&local_b00;
                        local_950.geometryUserPtr = pGVar28->userPtr;
                        local_950.context = context->user;
                        local_950.hit = local_700;
                        local_950.N = 4;
                        local_9c0 = fVar158;
                        local_950.ray = (RTCRayN *)ray;
                        if (pGVar28->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar354 = ZEXT1664(auVar354._0_16_);
                          (*pGVar28->occlusionFilterN)(&local_950);
                          auVar385 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar111._8_8_ = uStack_af8;
                        auVar111._0_8_ = local_b00;
                        if (auVar111 == (undefined1  [16])0x0) {
                          auVar172 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar172 = auVar172 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var31 = context->args->filter;
                          if ((p_Var31 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar28->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar354 = ZEXT1664(auVar354._0_16_);
                            (*p_Var31)(&local_950);
                            auVar385 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar112._8_8_ = uStack_af8;
                          auVar112._0_8_ = local_b00;
                          auVar135 = vpcmpeqd_avx((undefined1  [16])0x0,auVar112);
                          auVar172 = auVar135 ^ _DAT_01febe20;
                          auVar214._8_4_ = 0xff800000;
                          auVar214._0_8_ = 0xff800000ff800000;
                          auVar214._12_4_ = 0xff800000;
                          auVar135 = vblendvps_avx(auVar214,*(undefined1 (*) [16])
                                                             (local_950.ray + 0x80),auVar135);
                          *(undefined1 (*) [16])(local_950.ray + 0x80) = auVar135;
                        }
                        auVar175._8_8_ = 0x100000001;
                        auVar175._0_8_ = 0x100000001;
                        unaff_R13B = (auVar175 & auVar172) != (undefined1  [16])0x0;
                        if (!(bool)unaff_R13B) {
                          *(float *)(ray + k * 4 + 0x80) = local_9c0;
                        }
                      }
                      auVar269 = ZEXT464((uint)local_bc0);
                      bVar84 = false;
                      goto LAB_01283026;
                    }
                  }
                  bVar84 = false;
                  unaff_R13B = 0;
                }
              }
LAB_01283026:
              auVar395 = ZEXT464((uint)fVar197);
              if (!bVar84) goto LAB_01283359;
              lVar121 = lVar121 + -1;
            } while (lVar121 != 0);
            unaff_R13B = 0;
LAB_01283359:
            unaff_R13B = unaff_R13B & 1;
            uVar120 = CONCAT71(local_780._1_7_,local_780[0] | unaff_R13B);
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar152._4_4_ = uVar8;
            auVar152._0_4_ = uVar8;
            auVar152._8_4_ = uVar8;
            auVar152._12_4_ = uVar8;
            auVar152._16_4_ = uVar8;
            auVar152._20_4_ = uVar8;
            auVar152._24_4_ = uVar8;
            auVar152._28_4_ = uVar8;
            auVar32 = vcmpps_avx(_local_7c0,auVar152,2);
            auVar149 = vandps_avx(auVar32,local_5c0);
            local_5c0 = local_5c0 & auVar32;
            uVar125 = local_5e0;
          } while ((((((((local_5c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (local_5c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_5c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(local_5c0 >> 0x7f,0) != '\0') ||
                     (local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(local_5c0 >> 0xbf,0) != '\0') ||
                   (local_5c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   local_5c0[0x1f] < '\0');
        }
        auVar149 = vandps_avx(local_620,local_500);
        auVar32 = vandps_avx(_local_800,_local_7e0);
        auVar225._0_4_ = (float)local_8a0._0_4_ + local_320._0_4_;
        auVar225._4_4_ = (float)local_8a0._4_4_ + local_320._4_4_;
        auVar225._8_4_ = fStack_898 + local_320._8_4_;
        auVar225._12_4_ = fStack_894 + local_320._12_4_;
        auVar225._16_4_ = fStack_890 + local_320._16_4_;
        auVar225._20_4_ = fStack_88c + local_320._20_4_;
        auVar225._24_4_ = fStack_888 + local_320._24_4_;
        auVar225._28_4_ = fStack_884 + local_320._28_4_;
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar268._4_4_ = uVar8;
        auVar268._0_4_ = uVar8;
        auVar268._8_4_ = uVar8;
        auVar268._12_4_ = uVar8;
        auVar268._16_4_ = uVar8;
        auVar268._20_4_ = uVar8;
        auVar268._24_4_ = uVar8;
        auVar268._28_4_ = uVar8;
        auVar33 = vcmpps_avx(auVar225,auVar268,2);
        auVar149 = vandps_avx(auVar33,auVar149);
        auVar290._0_4_ = (float)local_8a0._0_4_ + local_2e0._0_4_;
        auVar290._4_4_ = (float)local_8a0._4_4_ + local_2e0._4_4_;
        auVar290._8_4_ = fStack_898 + local_2e0._8_4_;
        auVar290._12_4_ = fStack_894 + local_2e0._12_4_;
        auVar290._16_4_ = fStack_890 + local_2e0._16_4_;
        auVar290._20_4_ = fStack_88c + local_2e0._20_4_;
        auVar290._24_4_ = fStack_888 + local_2e0._24_4_;
        auVar290._28_4_ = fStack_884 + local_2e0._28_4_;
        auVar33 = vcmpps_avx(auVar290,auVar268,2);
        auVar32 = vandps_avx(auVar33,auVar32);
        auVar32 = vorps_avx(auVar149,auVar32);
        if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar32 >> 0x7f,0) != '\0') ||
              (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar32 >> 0xbf,0) != '\0') ||
            (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar32[0x1f] < '\0') {
          uVar119 = (ulong)uVar116;
          *(undefined1 (*) [32])(auStack_180 + uVar119 * 0x60) = auVar32;
          auVar149 = vblendvps_avx(_local_2e0,_local_320,auVar149);
          *(undefined1 (*) [32])(auStack_160 + uVar119 * 0x60) = auVar149;
          uVar9 = vmovlps_avx(local_820);
          *(undefined8 *)(afStack_140 + uVar119 * 0x18) = uVar9;
          auStack_138[uVar119 * 0x18] = (int)uVar125 + 1;
          uVar116 = uVar116 + 1;
        }
        auVar269 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar385 = ZEXT3264(local_7a0);
      }
    }
    do {
      if (uVar116 == 0) {
        if ((uVar120 & 1) != 0) {
          return local_bd1;
        }
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar153._4_4_ = uVar8;
        auVar153._0_4_ = uVar8;
        auVar153._8_4_ = uVar8;
        auVar153._12_4_ = uVar8;
        auVar153._16_4_ = uVar8;
        auVar153._20_4_ = uVar8;
        auVar153._24_4_ = uVar8;
        auVar153._28_4_ = uVar8;
        auVar149 = vcmpps_avx(local_280,auVar153,2);
        uVar116 = vmovmskps_avx(auVar149);
        uVar116 = (uint)local_808 - 1 & (uint)local_808 & uVar116;
        local_bd1 = uVar116 != 0;
        if (!local_bd1) {
          return local_bd1;
        }
        goto LAB_012806e7;
      }
      uVar117 = uVar116 - 1;
      uVar119 = (ulong)uVar117;
      lVar121 = uVar119 * 0x60;
      auVar149 = *(undefined1 (*) [32])(auStack_160 + lVar121);
      auVar147._0_4_ = (float)local_8a0._0_4_ + auVar149._0_4_;
      auVar147._4_4_ = (float)local_8a0._4_4_ + auVar149._4_4_;
      auVar147._8_4_ = fStack_898 + auVar149._8_4_;
      auVar147._12_4_ = fStack_894 + auVar149._12_4_;
      auVar147._16_4_ = fStack_890 + auVar149._16_4_;
      auVar147._20_4_ = fStack_88c + auVar149._20_4_;
      auVar147._24_4_ = fStack_888 + auVar149._24_4_;
      auVar147._28_4_ = fStack_884 + auVar149._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar247._4_4_ = uVar8;
      auVar247._0_4_ = uVar8;
      auVar247._8_4_ = uVar8;
      auVar247._12_4_ = uVar8;
      auVar247._16_4_ = uVar8;
      auVar247._20_4_ = uVar8;
      auVar247._24_4_ = uVar8;
      auVar247._28_4_ = uVar8;
      auVar32 = vcmpps_avx(auVar147,auVar247,2);
      _local_700 = vandps_avx(auVar32,*(undefined1 (*) [32])(auStack_180 + lVar121));
      auVar32 = *(undefined1 (*) [32])(auStack_180 + lVar121) & auVar32;
      bVar103 = (auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar104 = (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar102 = (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar101 = SUB321(auVar32 >> 0x7f,0) == '\0';
      bVar100 = (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar99 = SUB321(auVar32 >> 0xbf,0) == '\0';
      bVar97 = (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar84 = -1 < auVar32[0x1f];
      if (((((((!bVar103 || !bVar104) || !bVar102) || !bVar101) || !bVar100) || !bVar99) || !bVar97)
          || !bVar84) {
        auVar219._8_4_ = 0x7f800000;
        auVar219._0_8_ = 0x7f8000007f800000;
        auVar219._12_4_ = 0x7f800000;
        auVar219._16_4_ = 0x7f800000;
        auVar219._20_4_ = 0x7f800000;
        auVar219._24_4_ = 0x7f800000;
        auVar219._28_4_ = 0x7f800000;
        auVar149 = vblendvps_avx(auVar219,auVar149,_local_700);
        auVar32 = vshufps_avx(auVar149,auVar149,0xb1);
        auVar32 = vminps_avx(auVar149,auVar32);
        auVar33 = vshufpd_avx(auVar32,auVar32,5);
        auVar32 = vminps_avx(auVar32,auVar33);
        auVar33 = vperm2f128_avx(auVar32,auVar32,1);
        auVar32 = vminps_avx(auVar32,auVar33);
        auVar32 = vcmpps_avx(auVar149,auVar32,0);
        auVar33 = _local_700 & auVar32;
        auVar149 = _local_700;
        if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar33 >> 0x7f,0) != '\0') ||
              (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar33 >> 0xbf,0) != '\0') ||
            (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar33[0x1f] < '\0') {
          auVar149 = vandps_avx(auVar32,_local_700);
        }
        fVar158 = afStack_140[uVar119 * 0x18 + 1];
        uVar125 = (ulong)auStack_138[uVar119 * 0x18];
        uVar122 = vmovmskps_avx(auVar149);
        uVar118 = 0;
        if (uVar122 != 0) {
          for (; (uVar122 >> uVar118 & 1) == 0; uVar118 = uVar118 + 1) {
          }
        }
        fVar249 = afStack_140[uVar119 * 0x18];
        *(undefined4 *)(local_700 + (ulong)uVar118 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar121) = _local_700;
        if ((((((((_local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_700 >> 0x7f,0) != '\0') ||
              (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_700 >> 0xbf,0) != '\0') ||
            (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_700[0x1f] < '\0') {
          uVar117 = uVar116;
        }
        auVar172 = vshufps_avx(ZEXT416((uint)(fVar158 - fVar249)),ZEXT416((uint)(fVar158 - fVar249))
                               ,0);
        local_320._4_4_ = fVar249 + auVar172._4_4_ * 0.14285715;
        local_320._0_4_ = fVar249 + auVar172._0_4_ * 0.0;
        fStack_318 = fVar249 + auVar172._8_4_ * 0.2857143;
        fStack_314 = fVar249 + auVar172._12_4_ * 0.42857146;
        fStack_310 = fVar249 + auVar172._0_4_ * 0.5714286;
        fStack_30c = fVar249 + auVar172._4_4_ * 0.71428573;
        fStack_308 = fVar249 + auVar172._8_4_ * 0.8571429;
        fStack_304 = fVar249 + auVar172._12_4_;
        local_820._8_8_ = 0;
        local_820._0_8_ = *(ulong *)(local_320 + (ulong)uVar118 * 4);
      }
      uVar116 = uVar117;
    } while (((((((bVar103 && bVar104) && bVar102) && bVar101) && bVar100) && bVar99) && bVar97) &&
             bVar84);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }